

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bnll_x86_avx512.cpp
# Opt level: O0

int __thiscall
ncnn::BNLL_x86_avx512::forward_inplace(BNLL_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  byte bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined8 uVar23;
  undefined8 uVar24;
  ulong uVar25;
  undefined8 uVar26;
  undefined8 uVar27;
  undefined8 uVar28;
  undefined8 uVar29;
  undefined8 uVar30;
  undefined8 uVar31;
  undefined8 uVar32;
  undefined8 uVar33;
  undefined8 uVar34;
  undefined8 uVar35;
  undefined8 uVar36;
  undefined8 uVar37;
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [64];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined1 auVar75 [64];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar78 [64];
  undefined1 auVar79 [64];
  undefined1 auVar80 [64];
  undefined1 auVar81 [64];
  undefined1 auVar82 [64];
  undefined1 auVar83 [64];
  undefined1 auVar84 [64];
  undefined1 auVar85 [64];
  undefined1 auVar86 [64];
  undefined1 auVar87 [64];
  undefined1 auVar88 [64];
  undefined1 auVar89 [64];
  undefined1 auVar90 [64];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [32];
  undefined1 auVar150 [16];
  undefined1 auVar151 [40];
  undefined1 auVar152 [48];
  undefined1 auVar153 [56];
  undefined1 auVar154 [24];
  undefined1 auVar155 [40];
  undefined1 auVar156 [48];
  undefined1 auVar157 [56];
  long *in_RSI;
  undefined1 auVar158 [64];
  undefined1 auVar159 [64];
  undefined1 auVar160 [64];
  undefined1 auVar161 [32];
  undefined1 auVar162 [16];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  float fVar168;
  float fVar169;
  undefined1 auVar165 [16];
  float fVar170;
  float fVar171;
  float fVar172;
  undefined1 auVar173 [16];
  __m128 _x_1;
  __m128 _tmp_2;
  __m128 _abs_p_2;
  __m128 mask_6;
  __m128 _p_2;
  __m128 _zero;
  __m128 _one;
  __m256 _x;
  __m256 _tmp_1;
  __m256 _abs_p_1;
  __m256 mask_3;
  __m256 _p_1;
  __m256 _zero_avx;
  __m256 _one_avx;
  __m512 _tmp;
  __m512 _abs_p;
  __mmask16 mask;
  __m512 _p;
  __m512 _zero_avx512;
  __m512 _one_avx512;
  int i;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  Mat *m;
  __m512 y_1;
  __m512 z;
  __m512 tmp_1;
  __mmask16 mask_2;
  __m512 e;
  __mmask16 invalid_mask;
  __m512 one_1;
  __m512i imm0_1;
  __m512 pow2n;
  __m512 y;
  __mmask16 mask_1;
  __m512 one;
  __m512i imm0;
  __m512 fx;
  __m512 tmp;
  __m256 y_3;
  __m256 z_1;
  __m256 tmp_3;
  __m256 mask_5;
  __m256 e_1;
  __m256 invalid_mask_1;
  __m256 one_3;
  __m256i imm0_3;
  __m256 pow2n_1;
  __m256 y_2;
  __m256 mask_4;
  __m256 one_2;
  __m256i imm0_2;
  __m256 fx_1;
  __m256 tmp_2;
  v4sf y_5;
  v4sf z_2;
  v4sf tmp_5;
  v4sf mask_8;
  v4sf e_2;
  v4sf invalid_mask_2;
  v4sf one_5;
  v4si emm0_1;
  v4sf pow2n_2;
  v4sf y_4;
  v4sf mask_7;
  v4sf one_4;
  v4si emm0;
  v4sf fx_2;
  v4sf tmp_4;
  undefined8 local_4f50;
  undefined8 uStack_4f48;
  undefined8 local_4f30;
  undefined8 uStack_4f28;
  undefined8 local_4f20;
  undefined8 uStack_4f18;
  undefined8 local_4f10;
  undefined8 uStack_4f08;
  undefined8 local_4ee0;
  undefined8 uStack_4ed8;
  undefined8 uStack_4ed0;
  undefined8 uStack_4ec8;
  undefined8 local_4ea0;
  undefined8 uStack_4e98;
  undefined8 uStack_4e90;
  undefined8 uStack_4e88;
  undefined8 local_4e80;
  undefined8 uStack_4e78;
  undefined8 uStack_4e70;
  undefined8 uStack_4e68;
  undefined4 uStack_4e54;
  undefined4 uStack_4e50;
  undefined4 uStack_4e4c;
  undefined4 uStack_4e48;
  undefined4 uStack_4e44;
  undefined8 local_4dc0;
  undefined8 uStack_4db8;
  undefined8 uStack_4db0;
  undefined8 uStack_4da8;
  undefined8 uStack_4da0;
  undefined8 uStack_4d98;
  undefined8 uStack_4d90;
  undefined8 uStack_4d88;
  undefined4 uStack_4d34;
  undefined4 uStack_4d30;
  undefined4 uStack_4d2c;
  undefined4 uStack_4d28;
  undefined4 uStack_4d24;
  undefined4 uStack_4d20;
  undefined4 uStack_4d1c;
  undefined4 uStack_4d18;
  undefined4 uStack_4d14;
  undefined4 uStack_4d10;
  undefined4 uStack_4d0c;
  undefined4 uStack_4d08;
  undefined4 uStack_4d04;
  int local_4c50;
  undefined8 local_4c40;
  undefined8 local_4c38;
  undefined8 local_4c30;
  undefined4 local_4c28;
  long local_4c20;
  undefined4 local_4c18;
  undefined4 local_4c14;
  undefined4 local_4c10;
  undefined4 local_4c0c;
  undefined4 local_4c08;
  undefined8 local_4c00;
  undefined1 (*local_4bf8) [64];
  int local_4bec;
  int local_4be8;
  int local_4be4;
  int local_4be0;
  int local_4bdc;
  int local_4bd8;
  int local_4bd4;
  long *local_4bc8;
  undefined1 local_4bb5;
  int local_4bb4;
  undefined8 *local_4ba8;
  undefined8 *local_4ba0;
  undefined8 *local_4b90;
  undefined1 local_4b80 [64];
  undefined4 local_4b04;
  undefined8 local_4b00;
  undefined8 uStack_4af8;
  undefined8 uStack_4af0;
  undefined8 uStack_4ae8;
  undefined8 uStack_4ae0;
  undefined8 uStack_4ad8;
  undefined8 uStack_4ad0;
  undefined8 uStack_4ac8;
  undefined1 (*local_4a88) [64];
  undefined1 local_4a80 [64];
  undefined1 local_4a40 [64];
  undefined8 local_4a00;
  undefined8 uStack_49f8;
  undefined8 uStack_49f0;
  undefined8 uStack_49e8;
  undefined8 uStack_49e0;
  undefined8 uStack_49d8;
  undefined8 uStack_49d0;
  undefined8 uStack_49c8;
  undefined8 local_49c0;
  undefined8 uStack_49b8;
  undefined8 uStack_49b0;
  undefined8 uStack_49a8;
  undefined8 uStack_49a0;
  undefined8 uStack_4998;
  undefined8 uStack_4990;
  undefined8 uStack_4988;
  undefined1 local_4980 [64];
  undefined4 local_4904;
  undefined1 local_4900 [8];
  undefined8 uStack_48f8;
  undefined8 uStack_48f0;
  undefined8 uStack_48e8;
  undefined8 uStack_48e0;
  undefined8 uStack_48d8;
  undefined8 uStack_48d0;
  undefined8 uStack_48c8;
  undefined1 local_48c0 [64];
  undefined1 local_4880 [64];
  ushort local_4802;
  undefined1 local_4800 [16];
  undefined8 uStack_47f0;
  undefined8 uStack_47e8;
  undefined8 uStack_47e0;
  undefined8 uStack_47d8;
  undefined8 uStack_47d0;
  undefined8 uStack_47c8;
  undefined2 local_4782;
  float local_4780 [2];
  float afStack_4778 [2];
  float afStack_4770 [2];
  float afStack_4768 [2];
  float afStack_4760 [2];
  float afStack_4758 [2];
  float afStack_4750 [2];
  float afStack_4748 [2];
  undefined1 local_4740 [64];
  undefined1 local_4700 [64];
  undefined8 local_46c0;
  undefined8 uStack_46b8;
  undefined8 uStack_46b0;
  undefined8 uStack_46a8;
  undefined8 uStack_46a0;
  undefined8 uStack_4698;
  undefined8 uStack_4690;
  undefined8 uStack_4688;
  undefined1 local_4680 [64];
  undefined8 local_4640;
  undefined8 uStack_4638;
  undefined8 uStack_4630;
  undefined8 uStack_4628;
  undefined8 uStack_4620;
  undefined8 uStack_4618;
  undefined8 uStack_4610;
  undefined8 uStack_4608;
  undefined8 local_4600;
  undefined8 uStack_45f8;
  undefined8 uStack_45f0;
  undefined8 uStack_45e8;
  undefined8 uStack_45e0;
  undefined8 uStack_45d8;
  undefined8 uStack_45d0;
  undefined8 uStack_45c8;
  undefined8 local_45c0;
  undefined8 uStack_45b8;
  undefined8 uStack_45b0;
  undefined8 uStack_45a8;
  undefined8 uStack_45a0;
  undefined8 uStack_4598;
  undefined8 uStack_4590;
  undefined8 uStack_4588;
  float local_4580 [2];
  float afStack_4578 [2];
  float afStack_4570 [2];
  float afStack_4568 [2];
  float afStack_4560 [2];
  float afStack_4558 [2];
  float afStack_4550 [2];
  float afStack_4548 [2];
  undefined8 local_4540;
  undefined8 uStack_4538;
  undefined8 uStack_4530;
  undefined8 uStack_4528;
  undefined8 uStack_4520;
  undefined8 uStack_4518;
  undefined8 uStack_4510;
  undefined8 uStack_4508;
  undefined8 local_4500;
  undefined8 uStack_44f8;
  undefined8 uStack_44f0;
  undefined8 uStack_44e8;
  undefined8 uStack_44e0;
  undefined8 uStack_44d8;
  undefined8 uStack_44d0;
  undefined8 uStack_44c8;
  undefined8 local_44c0;
  undefined8 uStack_44b8;
  undefined8 uStack_44b0;
  undefined8 uStack_44a8;
  undefined8 uStack_44a0;
  undefined8 uStack_4498;
  undefined8 uStack_4490;
  undefined8 uStack_4488;
  undefined1 local_4480 [64];
  undefined1 local_4440 [8];
  undefined8 uStack_4438;
  undefined8 uStack_4430;
  undefined8 uStack_4428;
  undefined8 uStack_4420;
  undefined8 uStack_4418;
  undefined8 uStack_4410;
  undefined8 uStack_4408;
  ushort local_43c2;
  float local_43c0 [2];
  float afStack_43b8 [2];
  float afStack_43b0 [2];
  float afStack_43a8 [2];
  float afStack_43a0 [2];
  float afStack_4398 [2];
  float afStack_4390 [2];
  float afStack_4388 [2];
  undefined1 local_4380 [64];
  undefined1 local_4340 [16];
  undefined8 uStack_4330;
  undefined8 uStack_4328;
  undefined8 uStack_4320;
  undefined8 uStack_4318;
  undefined8 uStack_4310;
  undefined8 uStack_4308;
  undefined1 local_4300 [64];
  undefined1 local_42c0 [64];
  undefined8 local_4280;
  undefined8 uStack_4278;
  undefined8 uStack_4270;
  undefined8 uStack_4268;
  undefined8 uStack_4260;
  undefined8 uStack_4258;
  undefined8 uStack_4250;
  undefined8 uStack_4248;
  undefined1 local_4240 [64];
  float local_4200 [2];
  float afStack_41f8 [2];
  float afStack_41f0 [2];
  float afStack_41e8 [2];
  float afStack_41e0 [2];
  float afStack_41d8 [2];
  float afStack_41d0 [2];
  float afStack_41c8 [2];
  undefined8 local_41c0;
  undefined8 uStack_41b8;
  undefined8 uStack_41b0;
  undefined8 uStack_41a8;
  undefined8 uStack_41a0;
  undefined8 uStack_4198;
  undefined8 uStack_4190;
  undefined8 uStack_4188;
  float local_4180 [2];
  float afStack_4178 [2];
  float afStack_4170 [2];
  float afStack_4168 [2];
  float afStack_4160 [2];
  float afStack_4158 [2];
  float afStack_4150 [2];
  float afStack_4148 [2];
  undefined8 local_4140;
  undefined8 uStack_4138;
  undefined8 uStack_4130;
  undefined8 uStack_4128;
  undefined8 uStack_4120;
  undefined8 uStack_4118;
  undefined8 uStack_4110;
  undefined8 uStack_4108;
  undefined8 local_4100;
  undefined8 uStack_40f8;
  undefined8 uStack_40f0;
  undefined8 uStack_40e8;
  undefined8 uStack_40e0;
  undefined8 uStack_40d8;
  undefined8 uStack_40d0;
  undefined8 uStack_40c8;
  undefined8 local_40c0;
  undefined8 uStack_40b8;
  undefined8 uStack_40b0;
  undefined8 uStack_40a8;
  undefined8 uStack_40a0;
  undefined8 uStack_4098;
  undefined8 uStack_4090;
  undefined8 uStack_4088;
  undefined8 local_4080;
  undefined8 uStack_4078;
  undefined8 uStack_4070;
  undefined8 uStack_4068;
  undefined8 uStack_4060;
  undefined8 uStack_4058;
  undefined8 uStack_4050;
  undefined8 uStack_4048;
  undefined8 local_4040;
  undefined8 uStack_4038;
  undefined8 uStack_4030;
  undefined8 uStack_4028;
  undefined8 uStack_4020;
  undefined8 uStack_4018;
  undefined8 uStack_4010;
  undefined8 uStack_4008;
  ushort local_3fc2;
  undefined8 local_3fc0;
  undefined8 uStack_3fb8;
  undefined8 uStack_3fb0;
  undefined8 uStack_3fa8;
  undefined8 uStack_3fa0;
  undefined8 uStack_3f98;
  undefined8 uStack_3f90;
  undefined8 uStack_3f88;
  undefined8 local_3f80;
  undefined8 uStack_3f78;
  undefined8 uStack_3f70;
  undefined8 uStack_3f68;
  undefined8 uStack_3f60;
  undefined8 uStack_3f58;
  undefined8 uStack_3f50;
  undefined8 uStack_3f48;
  undefined8 local_3f40;
  undefined8 uStack_3f38;
  undefined8 uStack_3f30;
  undefined8 uStack_3f28;
  undefined8 uStack_3f20;
  undefined8 uStack_3f18;
  undefined8 uStack_3f10;
  undefined8 uStack_3f08;
  undefined8 local_3f00;
  undefined8 uStack_3ef8;
  undefined8 uStack_3ef0;
  undefined8 uStack_3ee8;
  undefined8 uStack_3ee0;
  undefined8 uStack_3ed8;
  undefined8 uStack_3ed0;
  undefined8 uStack_3ec8;
  undefined8 local_3ec0;
  undefined8 uStack_3eb8;
  undefined8 uStack_3eb0;
  undefined8 uStack_3ea8;
  undefined8 uStack_3ea0;
  undefined8 uStack_3e98;
  undefined8 uStack_3e90;
  undefined8 uStack_3e88;
  ushort local_3e42;
  undefined8 local_3e40;
  undefined8 uStack_3e38;
  undefined8 uStack_3e30;
  undefined8 uStack_3e28;
  undefined8 uStack_3e20;
  undefined8 uStack_3e18;
  undefined8 uStack_3e10;
  undefined8 uStack_3e08;
  undefined8 local_3e00;
  undefined8 uStack_3df8;
  undefined8 uStack_3df0;
  undefined8 uStack_3de8;
  undefined8 uStack_3de0;
  undefined8 uStack_3dd8;
  undefined8 uStack_3dd0;
  undefined8 uStack_3dc8;
  undefined8 local_3dc0;
  undefined8 uStack_3db8;
  undefined8 uStack_3db0;
  undefined8 uStack_3da8;
  undefined8 uStack_3da0;
  undefined8 uStack_3d98;
  undefined8 uStack_3d90;
  undefined8 uStack_3d88;
  undefined8 local_3d80;
  undefined8 uStack_3d78;
  undefined8 uStack_3d70;
  undefined8 uStack_3d68;
  undefined8 uStack_3d60;
  undefined8 uStack_3d58;
  undefined8 uStack_3d50;
  undefined8 uStack_3d48;
  undefined1 (*local_3d10) [64];
  undefined4 local_3d04;
  undefined8 local_3d00;
  undefined8 uStack_3cf8;
  undefined8 uStack_3cf0;
  undefined8 uStack_3ce8;
  undefined8 local_3ce0;
  undefined8 uStack_3cd8;
  undefined8 uStack_3cd0;
  undefined8 uStack_3cc8;
  undefined1 (*local_3ca8) [64];
  undefined8 local_3ca0;
  undefined8 uStack_3c98;
  undefined8 uStack_3c90;
  undefined8 uStack_3c88;
  undefined8 local_3c80;
  undefined8 uStack_3c78;
  undefined8 uStack_3c70;
  undefined8 uStack_3c68;
  int local_3c60 [2];
  int aiStack_3c58 [2];
  int aiStack_3c50 [2];
  int aiStack_3c48 [2];
  undefined8 local_3c40;
  undefined8 uStack_3c38;
  undefined8 uStack_3c30;
  undefined8 uStack_3c28;
  undefined1 local_3c20 [8];
  undefined8 uStack_3c18;
  undefined8 uStack_3c10;
  undefined8 uStack_3c08;
  float local_3c00;
  float fStack_3bfc;
  float fStack_3bf8;
  float fStack_3bf4;
  float fStack_3bf0;
  float fStack_3bec;
  float fStack_3be8;
  float fStack_3be4;
  undefined1 local_3be0 [32];
  undefined1 local_3bc0 [32];
  undefined1 local_3ba0 [8];
  undefined8 uStack_3b98;
  undefined8 uStack_3b90;
  undefined8 uStack_3b88;
  undefined1 local_3b80 [32];
  undefined4 local_3b60;
  undefined4 uStack_3b5c;
  undefined4 uStack_3b58;
  undefined4 uStack_3b54;
  undefined4 uStack_3b50;
  undefined4 uStack_3b4c;
  undefined4 uStack_3b48;
  undefined4 uStack_3b44;
  undefined1 local_3b40 [32];
  undefined1 local_3b20 [8];
  undefined8 uStack_3b18;
  undefined8 uStack_3b10;
  undefined8 uStack_3b08;
  undefined8 local_3b00;
  undefined8 uStack_3af8;
  undefined8 uStack_3af0;
  undefined8 uStack_3ae8;
  undefined8 local_3ae0;
  undefined8 uStack_3ad8;
  undefined8 uStack_3ad0;
  undefined8 uStack_3ac8;
  undefined8 local_3ac0;
  undefined8 uStack_3ab8;
  undefined8 uStack_3ab0;
  undefined8 uStack_3aa8;
  undefined8 local_3aa0;
  undefined8 uStack_3a98;
  undefined8 uStack_3a90;
  undefined8 uStack_3a88;
  undefined8 local_3a80;
  undefined8 uStack_3a78;
  undefined8 uStack_3a70;
  undefined8 uStack_3a68;
  undefined4 local_3a60;
  undefined4 uStack_3a5c;
  undefined4 uStack_3a58;
  undefined4 uStack_3a54;
  undefined4 uStack_3a50;
  undefined4 uStack_3a4c;
  undefined4 uStack_3a48;
  undefined4 uStack_3a44;
  undefined8 local_3a40;
  undefined8 uStack_3a38;
  undefined8 uStack_3a30;
  undefined8 uStack_3a28;
  undefined8 local_3a20;
  undefined8 uStack_3a18;
  undefined8 uStack_3a10;
  undefined8 uStack_3a08;
  undefined8 local_3a00;
  undefined8 uStack_39f8;
  undefined8 uStack_39f0;
  undefined8 uStack_39e8;
  undefined8 local_39e0;
  undefined8 uStack_39d8;
  undefined8 uStack_39d0;
  undefined8 uStack_39c8;
  undefined8 local_39c0;
  undefined8 uStack_39b8;
  undefined8 uStack_39b0;
  undefined8 uStack_39a8;
  undefined8 local_39a0;
  undefined8 uStack_3998;
  undefined8 uStack_3990;
  undefined8 uStack_3988;
  undefined8 local_3980;
  undefined8 uStack_3978;
  undefined8 uStack_3970;
  undefined8 uStack_3968;
  undefined8 local_3960;
  undefined8 uStack_3958;
  undefined8 uStack_3950;
  undefined8 uStack_3948;
  undefined8 local_3940;
  undefined8 uStack_3938;
  undefined8 uStack_3930;
  undefined8 uStack_3928;
  undefined8 local_3920;
  undefined8 uStack_3918;
  undefined8 uStack_3910;
  undefined8 uStack_3908;
  undefined8 local_3900;
  undefined8 uStack_38f8;
  undefined8 uStack_38f0;
  undefined8 uStack_38e8;
  undefined8 local_38e0;
  undefined8 uStack_38d8;
  undefined8 uStack_38d0;
  undefined8 uStack_38c8;
  undefined1 local_38c0 [8];
  undefined8 uStack_38b8;
  undefined8 uStack_38b0;
  undefined8 uStack_38a8;
  undefined1 local_38a0 [32];
  undefined4 local_3880;
  undefined4 uStack_387c;
  undefined4 uStack_3878;
  undefined4 uStack_3874;
  undefined4 uStack_3870;
  undefined4 uStack_386c;
  undefined4 uStack_3868;
  undefined4 uStack_3864;
  undefined1 local_3860 [32];
  undefined1 local_3840 [32];
  undefined1 local_3820 [8];
  undefined8 uStack_3818;
  undefined8 uStack_3810;
  undefined8 uStack_3808;
  undefined1 local_3800 [32];
  undefined8 local_37e0;
  undefined8 uStack_37d8;
  undefined8 uStack_37d0;
  undefined8 uStack_37c8;
  undefined8 local_37c0;
  undefined8 uStack_37b8;
  undefined8 uStack_37b0;
  undefined8 uStack_37a8;
  undefined8 local_37a0;
  undefined8 uStack_3798;
  undefined8 uStack_3790;
  undefined8 uStack_3788;
  undefined8 local_3780;
  undefined8 uStack_3778;
  undefined8 uStack_3770;
  undefined8 uStack_3768;
  undefined8 local_3760;
  undefined8 uStack_3758;
  undefined8 uStack_3750;
  undefined8 uStack_3748;
  undefined8 local_3740;
  undefined8 uStack_3738;
  undefined8 uStack_3730;
  undefined8 uStack_3728;
  undefined8 local_3720;
  undefined8 uStack_3718;
  undefined8 uStack_3710;
  undefined8 uStack_3708;
  undefined1 local_3700 [32];
  undefined8 local_36e0;
  undefined8 uStack_36d8;
  undefined8 uStack_36d0;
  undefined8 uStack_36c8;
  undefined8 local_36c0;
  undefined8 uStack_36b8;
  undefined8 uStack_36b0;
  undefined8 uStack_36a8;
  undefined8 local_36a0;
  undefined8 uStack_3698;
  undefined8 uStack_3690;
  undefined8 uStack_3688;
  undefined8 local_3680;
  undefined8 uStack_3678;
  undefined8 uStack_3670;
  undefined8 uStack_3668;
  undefined8 local_3660;
  undefined8 uStack_3658;
  undefined8 uStack_3650;
  undefined8 uStack_3648;
  undefined8 local_3640;
  undefined8 uStack_3638;
  undefined8 uStack_3630;
  undefined8 uStack_3628;
  undefined1 (*local_3608) [64];
  undefined4 local_3600;
  undefined4 uStack_35fc;
  undefined4 uStack_35f8;
  undefined4 uStack_35f4;
  undefined4 local_35e4;
  undefined1 local_35e0 [16];
  undefined1 (*local_35c8) [64];
  undefined8 local_35c0;
  undefined8 uStack_35b8;
  undefined8 local_35b0;
  undefined8 uStack_35a8;
  undefined8 local_35a0;
  undefined8 uStack_3598;
  undefined8 local_3590;
  undefined8 uStack_3588;
  int local_3580 [2];
  int aiStack_3578 [2];
  undefined8 local_3570;
  undefined8 uStack_3568;
  undefined1 local_3560 [8];
  undefined8 uStack_3558;
  float local_3550;
  float fStack_354c;
  float fStack_3548;
  float fStack_3544;
  undefined1 local_3540 [16];
  undefined1 local_3530 [16];
  undefined1 local_3520 [8];
  undefined8 uStack_3518;
  undefined1 local_3510 [16];
  undefined4 local_3500;
  undefined4 uStack_34fc;
  undefined4 uStack_34f8;
  undefined4 uStack_34f4;
  undefined1 local_34f0 [16];
  undefined1 local_34e0 [8];
  undefined8 uStack_34d8;
  undefined1 local_34d0 [16];
  undefined8 local_34c0;
  undefined8 uStack_34b8;
  undefined8 local_34b0;
  undefined8 uStack_34a8;
  undefined8 local_34a0;
  undefined8 uStack_3498;
  undefined8 local_3490;
  undefined8 uStack_3488;
  undefined4 local_3480;
  undefined4 uStack_347c;
  undefined4 uStack_3478;
  undefined4 uStack_3474;
  undefined8 local_3470;
  undefined8 uStack_3468;
  undefined8 local_3460;
  undefined8 uStack_3458;
  undefined8 local_3450;
  undefined8 uStack_3448;
  undefined8 local_3440;
  undefined8 uStack_3438;
  undefined8 local_3430;
  undefined8 uStack_3428;
  undefined8 local_3420;
  undefined8 uStack_3418;
  undefined8 local_3410;
  undefined8 uStack_3408;
  undefined8 local_3400;
  undefined8 uStack_33f8;
  undefined8 local_33f0;
  undefined8 uStack_33e8;
  undefined8 local_33e0;
  undefined8 uStack_33d8;
  undefined8 local_33d0;
  undefined8 uStack_33c8;
  undefined8 local_33c0;
  undefined8 uStack_33b8;
  undefined1 local_33b0 [8];
  undefined8 uStack_33a8;
  undefined1 local_33a0 [16];
  undefined4 local_3390;
  undefined4 uStack_338c;
  undefined4 uStack_3388;
  undefined4 uStack_3384;
  undefined1 local_3380 [16];
  undefined1 local_3370 [8];
  undefined8 uStack_3368;
  undefined1 local_3360 [8];
  undefined8 uStack_3358;
  undefined1 local_3350 [16];
  undefined1 local_3340 [16];
  undefined8 local_3330;
  undefined8 uStack_3328;
  undefined8 local_3320;
  undefined8 uStack_3318;
  undefined8 local_3310;
  undefined8 uStack_3308;
  undefined8 local_3300;
  undefined8 uStack_32f8;
  undefined8 local_32f0;
  undefined8 uStack_32e8;
  undefined8 local_32e0;
  undefined8 uStack_32d8;
  undefined4 local_32d0;
  undefined4 uStack_32cc;
  undefined4 uStack_32c8;
  undefined4 uStack_32c4;
  undefined8 local_32c0;
  undefined8 uStack_32b8;
  undefined8 local_32b0;
  undefined8 uStack_32a8;
  undefined8 local_32a0;
  undefined8 uStack_3298;
  undefined1 local_3290 [16];
  undefined8 local_3280;
  undefined8 uStack_3278;
  undefined8 local_3270;
  undefined8 uStack_3268;
  undefined8 local_3260;
  undefined8 uStack_3258;
  undefined8 local_3250;
  undefined8 uStack_3248;
  undefined8 local_3240;
  undefined8 uStack_3238;
  undefined8 local_3230;
  undefined8 uStack_3228;
  undefined1 (*local_3218) [64];
  long local_3210;
  undefined4 local_3204;
  long local_3200;
  undefined1 (*local_31f8) [64];
  undefined4 local_31ec;
  int local_31e8;
  int local_31e4;
  undefined8 *local_31e0;
  undefined4 local_31d4;
  long local_31d0;
  undefined8 *local_31b0;
  float local_3180 [2];
  float afStack_3178 [2];
  float afStack_3170 [2];
  float afStack_3168 [2];
  float afStack_3160 [2];
  float afStack_3158 [2];
  float afStack_3150 [2];
  float afStack_3148 [2];
  undefined8 local_3140;
  undefined8 uStack_3138;
  undefined8 uStack_3130;
  undefined8 uStack_3128;
  undefined8 uStack_3120;
  undefined8 uStack_3118;
  undefined8 uStack_3110;
  undefined8 uStack_3108;
  int local_3100 [2];
  int aiStack_30f8 [2];
  int aiStack_30f0 [2];
  int aiStack_30e8 [2];
  int aiStack_30e0 [2];
  int aiStack_30d8 [2];
  int aiStack_30d0 [2];
  int aiStack_30c8 [2];
  undefined8 local_30c0;
  undefined8 uStack_30b8;
  undefined8 uStack_30b0;
  undefined8 uStack_30a8;
  undefined8 uStack_30a0;
  undefined8 uStack_3098;
  undefined8 uStack_3090;
  undefined8 uStack_3088;
  undefined4 local_3044;
  undefined8 local_3040;
  undefined8 uStack_3038;
  undefined8 uStack_3030;
  undefined8 uStack_3028;
  undefined8 uStack_3020;
  undefined8 uStack_3018;
  undefined8 uStack_3010;
  undefined8 uStack_3008;
  int local_3000 [2];
  int aiStack_2ff8 [2];
  int aiStack_2ff0 [2];
  int aiStack_2fe8 [2];
  int aiStack_2fe0 [2];
  int aiStack_2fd8 [2];
  int aiStack_2fd0 [2];
  int aiStack_2fc8 [2];
  undefined8 local_2fc0;
  undefined8 uStack_2fb8;
  undefined8 uStack_2fb0;
  undefined8 uStack_2fa8;
  undefined8 uStack_2fa0;
  undefined8 uStack_2f98;
  undefined8 uStack_2f90;
  undefined8 uStack_2f88;
  undefined1 local_2f80 [64];
  undefined8 local_2f40;
  undefined8 uStack_2f38;
  undefined8 uStack_2f30;
  undefined8 uStack_2f28;
  undefined8 uStack_2f20;
  undefined8 uStack_2f18;
  undefined8 uStack_2f10;
  undefined8 uStack_2f08;
  float local_2f00 [2];
  float afStack_2ef8 [2];
  float afStack_2ef0 [2];
  float afStack_2ee8 [2];
  float afStack_2ee0 [2];
  float afStack_2ed8 [2];
  float afStack_2ed0 [2];
  float afStack_2ec8 [2];
  undefined8 local_2ec0;
  undefined8 uStack_2eb8;
  undefined8 uStack_2eb0;
  undefined8 uStack_2ea8;
  undefined8 uStack_2ea0;
  undefined8 uStack_2e98;
  undefined8 uStack_2e90;
  undefined8 uStack_2e88;
  undefined1 local_2e80 [64];
  undefined1 local_2e40 [64];
  undefined1 local_2e00 [64];
  float local_2dc0 [2];
  float afStack_2db8 [2];
  float afStack_2db0 [2];
  float afStack_2da8 [2];
  float afStack_2da0 [2];
  float afStack_2d98 [2];
  float afStack_2d90 [2];
  float afStack_2d88 [2];
  undefined8 local_2d80;
  undefined8 uStack_2d78;
  undefined8 uStack_2d70;
  undefined8 uStack_2d68;
  undefined8 uStack_2d60;
  undefined8 uStack_2d58;
  undefined8 uStack_2d50;
  undefined8 uStack_2d48;
  ushort local_2d02;
  undefined8 local_2d00;
  undefined8 uStack_2cf8;
  undefined8 uStack_2cf0;
  undefined8 uStack_2ce8;
  undefined8 uStack_2ce0;
  undefined8 uStack_2cd8;
  undefined8 uStack_2cd0;
  undefined8 uStack_2cc8;
  float local_2cc0 [2];
  float afStack_2cb8 [2];
  float afStack_2cb0 [2];
  float afStack_2ca8 [2];
  float afStack_2ca0 [2];
  float afStack_2c98 [2];
  float afStack_2c90 [2];
  float afStack_2c88 [2];
  undefined8 local_2c80;
  undefined8 uStack_2c78;
  undefined8 uStack_2c70;
  undefined8 uStack_2c68;
  undefined8 uStack_2c60;
  undefined8 uStack_2c58;
  undefined8 uStack_2c50;
  undefined8 uStack_2c48;
  float local_2c40 [2];
  float afStack_2c38 [2];
  float afStack_2c30 [2];
  float afStack_2c28 [2];
  float afStack_2c20 [2];
  float afStack_2c18 [2];
  float afStack_2c10 [2];
  float afStack_2c08 [2];
  undefined8 local_2c00;
  undefined8 uStack_2bf8;
  undefined8 uStack_2bf0;
  undefined8 uStack_2be8;
  undefined8 uStack_2be0;
  undefined8 uStack_2bd8;
  undefined8 uStack_2bd0;
  undefined8 uStack_2bc8;
  ushort local_2b82;
  undefined8 local_2b80;
  undefined8 uStack_2b78;
  undefined8 uStack_2b70;
  undefined8 uStack_2b68;
  undefined8 uStack_2b60;
  undefined8 uStack_2b58;
  undefined8 uStack_2b50;
  undefined8 uStack_2b48;
  float local_2b40 [2];
  float afStack_2b38 [2];
  float afStack_2b30 [2];
  float afStack_2b28 [2];
  float afStack_2b20 [2];
  float afStack_2b18 [2];
  float afStack_2b10 [2];
  float afStack_2b08 [2];
  undefined8 local_2b00;
  undefined8 uStack_2af8;
  undefined8 uStack_2af0;
  undefined8 uStack_2ae8;
  undefined8 uStack_2ae0;
  undefined8 uStack_2ad8;
  undefined8 uStack_2ad0;
  undefined8 uStack_2ac8;
  undefined8 local_2ac0;
  undefined8 uStack_2ab8;
  undefined8 uStack_2ab0;
  undefined8 uStack_2aa8;
  undefined8 uStack_2aa0;
  undefined8 uStack_2a98;
  undefined8 uStack_2a90;
  undefined8 uStack_2a88;
  undefined8 local_2a80;
  undefined8 uStack_2a78;
  undefined8 uStack_2a70;
  undefined8 uStack_2a68;
  undefined8 uStack_2a60;
  undefined8 uStack_2a58;
  undefined8 uStack_2a50;
  undefined8 uStack_2a48;
  undefined8 local_2a40;
  undefined8 uStack_2a38;
  undefined8 uStack_2a30;
  undefined8 uStack_2a28;
  undefined8 uStack_2a20;
  undefined8 uStack_2a18;
  undefined8 uStack_2a10;
  undefined8 uStack_2a08;
  undefined8 local_2a00;
  undefined8 uStack_29f8;
  undefined8 uStack_29f0;
  undefined8 uStack_29e8;
  undefined8 uStack_29e0;
  undefined8 uStack_29d8;
  undefined8 uStack_29d0;
  undefined8 uStack_29c8;
  undefined8 local_29c0;
  undefined8 uStack_29b8;
  undefined8 uStack_29b0;
  undefined8 uStack_29a8;
  undefined8 uStack_29a0;
  undefined8 uStack_2998;
  undefined8 uStack_2990;
  undefined8 uStack_2988;
  undefined8 local_2980;
  undefined8 uStack_2978;
  undefined8 uStack_2970;
  undefined8 uStack_2968;
  undefined8 uStack_2960;
  undefined8 uStack_2958;
  undefined8 uStack_2950;
  undefined8 uStack_2948;
  undefined8 local_2940;
  undefined8 uStack_2938;
  undefined8 uStack_2930;
  undefined8 uStack_2928;
  undefined8 uStack_2920;
  undefined8 uStack_2918;
  undefined8 uStack_2910;
  undefined8 uStack_2908;
  undefined8 local_2900;
  undefined8 uStack_28f8;
  undefined8 uStack_28f0;
  undefined8 uStack_28e8;
  undefined8 uStack_28e0;
  undefined8 uStack_28d8;
  undefined8 uStack_28d0;
  undefined8 uStack_28c8;
  undefined8 local_28c0;
  undefined8 uStack_28b8;
  undefined8 uStack_28b0;
  undefined8 uStack_28a8;
  undefined8 uStack_28a0;
  undefined8 uStack_2898;
  undefined8 uStack_2890;
  undefined8 uStack_2888;
  undefined8 local_2880;
  undefined8 uStack_2878;
  undefined8 uStack_2870;
  undefined8 uStack_2868;
  undefined8 uStack_2860;
  undefined8 uStack_2858;
  undefined8 uStack_2850;
  undefined8 uStack_2848;
  undefined8 local_2840;
  undefined8 uStack_2838;
  undefined8 uStack_2830;
  undefined8 uStack_2828;
  undefined8 uStack_2820;
  undefined8 uStack_2818;
  undefined8 uStack_2810;
  undefined8 uStack_2808;
  undefined8 local_2800;
  undefined8 uStack_27f8;
  undefined8 uStack_27f0;
  undefined8 uStack_27e8;
  undefined8 uStack_27e0;
  undefined8 uStack_27d8;
  undefined8 uStack_27d0;
  undefined8 uStack_27c8;
  undefined8 local_27c0;
  undefined8 uStack_27b8;
  undefined8 uStack_27b0;
  undefined8 uStack_27a8;
  undefined8 uStack_27a0;
  undefined8 uStack_2798;
  undefined8 uStack_2790;
  undefined8 uStack_2788;
  float local_2780 [2];
  float afStack_2778 [2];
  float afStack_2770 [2];
  float afStack_2768 [2];
  float afStack_2760 [2];
  float afStack_2758 [2];
  float afStack_2750 [2];
  float afStack_2748 [2];
  undefined8 local_2740;
  undefined8 uStack_2738;
  undefined8 uStack_2730;
  undefined8 uStack_2728;
  undefined8 uStack_2720;
  undefined8 uStack_2718;
  undefined8 uStack_2710;
  undefined8 uStack_2708;
  undefined8 local_2700;
  undefined8 uStack_26f8;
  undefined8 uStack_26f0;
  undefined8 uStack_26e8;
  undefined8 uStack_26e0;
  undefined8 uStack_26d8;
  undefined8 uStack_26d0;
  undefined8 uStack_26c8;
  float local_26c0 [2];
  float afStack_26b8 [2];
  float afStack_26b0 [2];
  float afStack_26a8 [2];
  float afStack_26a0 [2];
  float afStack_2698 [2];
  float afStack_2690 [2];
  float afStack_2688 [2];
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  undefined8 uStack_2660;
  undefined8 uStack_2658;
  undefined8 uStack_2650;
  undefined8 uStack_2648;
  undefined8 local_2640;
  undefined8 uStack_2638;
  undefined8 uStack_2630;
  undefined8 uStack_2628;
  undefined8 uStack_2620;
  undefined8 uStack_2618;
  undefined8 uStack_2610;
  undefined8 uStack_2608;
  float local_2600 [2];
  float afStack_25f8 [2];
  float afStack_25f0 [2];
  float afStack_25e8 [2];
  float afStack_25e0 [2];
  float afStack_25d8 [2];
  float afStack_25d0 [2];
  float afStack_25c8 [2];
  undefined8 local_25c0;
  undefined8 uStack_25b8;
  undefined8 uStack_25b0;
  undefined8 uStack_25a8;
  undefined8 uStack_25a0;
  undefined8 uStack_2598;
  undefined8 uStack_2590;
  undefined8 uStack_2588;
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined8 uStack_2560;
  undefined8 uStack_2558;
  undefined8 uStack_2550;
  undefined8 uStack_2548;
  float local_2540 [2];
  float afStack_2538 [2];
  float afStack_2530 [2];
  float afStack_2528 [2];
  float afStack_2520 [2];
  float afStack_2518 [2];
  float afStack_2510 [2];
  float afStack_2508 [2];
  undefined8 local_2500;
  undefined8 uStack_24f8;
  undefined8 uStack_24f0;
  undefined8 uStack_24e8;
  undefined8 uStack_24e0;
  undefined8 uStack_24d8;
  undefined8 uStack_24d0;
  undefined8 uStack_24c8;
  undefined8 local_24c0;
  undefined8 uStack_24b8;
  undefined8 uStack_24b0;
  undefined8 uStack_24a8;
  undefined8 uStack_24a0;
  undefined8 uStack_2498;
  undefined8 uStack_2490;
  undefined8 uStack_2488;
  float local_2480 [2];
  float afStack_2478 [2];
  float afStack_2470 [2];
  float afStack_2468 [2];
  float afStack_2460 [2];
  float afStack_2458 [2];
  float afStack_2450 [2];
  float afStack_2448 [2];
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined8 uStack_2430;
  undefined8 uStack_2428;
  undefined8 uStack_2420;
  undefined8 uStack_2418;
  undefined8 uStack_2410;
  undefined8 uStack_2408;
  float local_2400 [2];
  float afStack_23f8 [2];
  float afStack_23f0 [2];
  float afStack_23e8 [2];
  float afStack_23e0 [2];
  float afStack_23d8 [2];
  float afStack_23d0 [2];
  float afStack_23c8 [2];
  float local_23c0 [2];
  float afStack_23b8 [2];
  float afStack_23b0 [2];
  float afStack_23a8 [2];
  float afStack_23a0 [2];
  float afStack_2398 [2];
  float afStack_2390 [2];
  float afStack_2388 [2];
  float local_2380 [2];
  float afStack_2378 [2];
  float afStack_2370 [2];
  float afStack_2368 [2];
  float afStack_2360 [2];
  float afStack_2358 [2];
  float afStack_2350 [2];
  float afStack_2348 [2];
  undefined8 local_2340;
  undefined8 uStack_2338;
  undefined8 uStack_2330;
  undefined8 uStack_2328;
  undefined8 uStack_2320;
  undefined8 uStack_2318;
  undefined8 uStack_2310;
  undefined8 uStack_2308;
  undefined8 local_2300;
  undefined8 uStack_22f8;
  undefined8 uStack_22f0;
  undefined8 uStack_22e8;
  undefined8 uStack_22e0;
  undefined8 uStack_22d8;
  undefined8 uStack_22d0;
  undefined8 uStack_22c8;
  float local_22c0 [2];
  float afStack_22b8 [2];
  float afStack_22b0 [2];
  float afStack_22a8 [2];
  float afStack_22a0 [2];
  float afStack_2298 [2];
  float afStack_2290 [2];
  float afStack_2288 [2];
  undefined8 local_2280;
  undefined8 uStack_2278;
  undefined8 uStack_2270;
  undefined8 uStack_2268;
  undefined8 uStack_2260;
  undefined8 uStack_2258;
  undefined8 uStack_2250;
  undefined8 uStack_2248;
  undefined8 local_2240;
  undefined8 uStack_2238;
  undefined8 uStack_2230;
  undefined8 uStack_2228;
  undefined8 uStack_2220;
  undefined8 uStack_2218;
  undefined8 uStack_2210;
  undefined8 uStack_2208;
  float local_2200 [2];
  float afStack_21f8 [2];
  float afStack_21f0 [2];
  float afStack_21e8 [2];
  float afStack_21e0 [2];
  float afStack_21d8 [2];
  float afStack_21d0 [2];
  float afStack_21c8 [2];
  undefined8 local_21c0;
  undefined8 uStack_21b8;
  undefined8 uStack_21b0;
  undefined8 uStack_21a8;
  undefined8 uStack_21a0;
  undefined8 uStack_2198;
  undefined8 uStack_2190;
  undefined8 uStack_2188;
  float local_2180 [2];
  float afStack_2178 [2];
  float afStack_2170 [2];
  float afStack_2168 [2];
  float afStack_2160 [2];
  float afStack_2158 [2];
  float afStack_2150 [2];
  float afStack_2148 [2];
  undefined8 local_2140;
  undefined8 uStack_2138;
  undefined8 uStack_2130;
  undefined8 uStack_2128;
  undefined8 uStack_2120;
  undefined8 uStack_2118;
  undefined8 uStack_2110;
  undefined8 uStack_2108;
  undefined8 local_2100;
  undefined8 uStack_20f8;
  undefined8 uStack_20f0;
  undefined8 uStack_20e8;
  undefined8 uStack_20e0;
  undefined8 uStack_20d8;
  undefined8 uStack_20d0;
  undefined8 uStack_20c8;
  float local_20c0 [2];
  float afStack_20b8 [2];
  float afStack_20b0 [2];
  float afStack_20a8 [2];
  float afStack_20a0 [2];
  float afStack_2098 [2];
  float afStack_2090 [2];
  float afStack_2088 [2];
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  undefined8 uStack_2060;
  undefined8 uStack_2058;
  undefined8 uStack_2050;
  undefined8 uStack_2048;
  undefined8 local_2040;
  undefined8 uStack_2038;
  undefined8 uStack_2030;
  undefined8 uStack_2028;
  undefined8 uStack_2020;
  undefined8 uStack_2018;
  undefined8 uStack_2010;
  undefined8 uStack_2008;
  float local_2000 [2];
  float afStack_1ff8 [2];
  float afStack_1ff0 [2];
  float afStack_1fe8 [2];
  float afStack_1fe0 [2];
  float afStack_1fd8 [2];
  float afStack_1fd0 [2];
  float afStack_1fc8 [2];
  undefined8 local_1fc0;
  undefined8 uStack_1fb8;
  undefined8 uStack_1fb0;
  undefined8 uStack_1fa8;
  undefined8 uStack_1fa0;
  undefined8 uStack_1f98;
  undefined8 uStack_1f90;
  undefined8 uStack_1f88;
  undefined8 local_1f80;
  undefined8 uStack_1f78;
  undefined8 uStack_1f70;
  undefined8 uStack_1f68;
  undefined8 uStack_1f60;
  undefined8 uStack_1f58;
  undefined8 uStack_1f50;
  undefined8 uStack_1f48;
  float local_1f40 [2];
  float afStack_1f38 [2];
  float afStack_1f30 [2];
  float afStack_1f28 [2];
  float afStack_1f20 [2];
  float afStack_1f18 [2];
  float afStack_1f10 [2];
  float afStack_1f08 [2];
  undefined8 local_1f00;
  undefined8 uStack_1ef8;
  undefined8 uStack_1ef0;
  undefined8 uStack_1ee8;
  undefined8 uStack_1ee0;
  undefined8 uStack_1ed8;
  undefined8 uStack_1ed0;
  undefined8 uStack_1ec8;
  undefined8 local_1ec0;
  undefined8 uStack_1eb8;
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  undefined8 uStack_1ea0;
  undefined8 uStack_1e98;
  undefined8 uStack_1e90;
  undefined8 uStack_1e88;
  float local_1e80 [2];
  float afStack_1e78 [2];
  float afStack_1e70 [2];
  float afStack_1e68 [2];
  float afStack_1e60 [2];
  float afStack_1e58 [2];
  float afStack_1e50 [2];
  float afStack_1e48 [2];
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  undefined8 uStack_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  undefined8 uStack_1de0;
  undefined8 uStack_1dd8;
  undefined8 uStack_1dd0;
  undefined8 uStack_1dc8;
  float local_1dc0 [2];
  float afStack_1db8 [2];
  float afStack_1db0 [2];
  float afStack_1da8 [2];
  float afStack_1da0 [2];
  float afStack_1d98 [2];
  float afStack_1d90 [2];
  float afStack_1d88 [2];
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined8 uStack_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined8 uStack_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  float local_1d00 [2];
  float afStack_1cf8 [2];
  float afStack_1cf0 [2];
  float afStack_1ce8 [2];
  float afStack_1ce0 [2];
  float afStack_1cd8 [2];
  float afStack_1cd0 [2];
  float afStack_1cc8 [2];
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  undefined8 uStack_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  undefined8 uStack_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  float local_1c40 [2];
  float afStack_1c38 [2];
  float afStack_1c30 [2];
  float afStack_1c28 [2];
  float afStack_1c20 [2];
  float afStack_1c18 [2];
  float afStack_1c10 [2];
  float afStack_1c08 [2];
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined8 uStack_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  float local_1bc0 [2];
  float afStack_1bb8 [2];
  float afStack_1bb0 [2];
  float afStack_1ba8 [2];
  float afStack_1ba0 [2];
  float afStack_1b98 [2];
  float afStack_1b90 [2];
  float afStack_1b88 [2];
  undefined8 local_1b80;
  undefined8 uStack_1b78;
  undefined8 uStack_1b70;
  undefined8 uStack_1b68;
  undefined8 uStack_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  float local_1b40 [2];
  float afStack_1b38 [2];
  float afStack_1b30 [2];
  float afStack_1b28 [2];
  float afStack_1b20 [2];
  float afStack_1b18 [2];
  float afStack_1b10 [2];
  float afStack_1b08 [2];
  undefined8 local_1b00;
  undefined8 uStack_1af8;
  undefined8 uStack_1af0;
  undefined8 uStack_1ae8;
  undefined8 uStack_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  undefined8 local_1ac0;
  undefined8 uStack_1ab8;
  undefined8 uStack_1ab0;
  undefined8 uStack_1aa8;
  undefined8 uStack_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  float local_1a80 [2];
  float afStack_1a78 [2];
  float afStack_1a70 [2];
  float afStack_1a68 [2];
  float afStack_1a60 [2];
  float afStack_1a58 [2];
  float afStack_1a50 [2];
  float afStack_1a48 [2];
  undefined8 local_1a40;
  undefined8 uStack_1a38;
  undefined8 uStack_1a30;
  undefined8 uStack_1a28;
  undefined8 uStack_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  undefined8 local_1a00;
  undefined8 uStack_19f8;
  undefined8 uStack_19f0;
  undefined8 uStack_19e8;
  undefined8 uStack_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  float local_19c0 [2];
  float afStack_19b8 [2];
  float afStack_19b0 [2];
  float afStack_19a8 [2];
  float afStack_19a0 [2];
  float afStack_1998 [2];
  float afStack_1990 [2];
  float afStack_1988 [2];
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 uStack_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined2 local_1902;
  float local_1900 [2];
  float afStack_18f8 [2];
  float afStack_18f0 [2];
  float afStack_18e8 [2];
  float afStack_18e0 [2];
  float afStack_18d8 [2];
  float afStack_18d0 [2];
  float afStack_18c8 [2];
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined8 uStack_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  undefined8 uStack_1860;
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  undefined1 local_1840 [64];
  undefined1 local_1800 [64];
  undefined4 local_1784;
  undefined1 local_1780 [64];
  undefined1 local_1740 [64];
  undefined1 local_16e0 [16];
  undefined1 auStack_16d0 [16];
  undefined4 local_16c0;
  undefined4 local_16bc;
  undefined4 local_16b8;
  undefined4 local_16b4;
  undefined4 local_16b0;
  undefined4 local_16ac;
  undefined4 local_16a8;
  undefined4 local_16a4;
  undefined4 local_16a0;
  undefined4 uStack_169c;
  undefined4 uStack_1698;
  undefined4 uStack_1694;
  undefined4 uStack_1690;
  undefined4 uStack_168c;
  undefined4 uStack_1688;
  undefined4 uStack_1684;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined4 local_1660;
  undefined4 uStack_165c;
  undefined4 uStack_1658;
  undefined4 uStack_1654;
  undefined4 uStack_1650;
  undefined4 uStack_164c;
  undefined4 uStack_1648;
  undefined4 uStack_1644;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined4 local_1604;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  undefined8 local_15a0;
  undefined8 uStack_1598;
  undefined8 uStack_1590;
  undefined8 uStack_1588;
  undefined4 local_1580;
  undefined4 uStack_157c;
  undefined4 uStack_1578;
  undefined4 uStack_1574;
  undefined4 uStack_1570;
  undefined4 uStack_156c;
  undefined4 uStack_1568;
  undefined4 uStack_1564;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  undefined8 local_14c0;
  undefined8 uStack_14b8;
  undefined8 uStack_14b0;
  undefined8 uStack_14a8;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  ulong uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 uStack_13d0;
  undefined8 uStack_13c8;
  undefined8 local_13c0;
  undefined8 uStack_13b8;
  undefined8 uStack_13b0;
  undefined8 uStack_13a8;
  undefined1 *local_1388;
  undefined1 *local_1380;
  undefined1 *local_1378;
  float *local_1370;
  undefined1 *local_1368;
  undefined1 *local_1360;
  float *local_1358;
  undefined1 *local_1350;
  undefined1 *local_1348;
  float *local_1340;
  undefined1 *local_1338;
  undefined1 *local_1330;
  float *local_1328;
  undefined1 *local_1320;
  undefined1 *local_1318;
  float *local_1310;
  undefined1 *local_1308;
  undefined1 *local_1300;
  float *local_12f8;
  float *local_12f0;
  undefined1 *local_12e8;
  undefined1 *local_12e0;
  float *local_12d8;
  undefined1 *local_12d0;
  undefined1 *local_12c8;
  float *local_12c0;
  undefined1 *local_12b8;
  float *local_12b0;
  undefined1 *local_12a8;
  undefined1 *local_12a0;
  float *local_1298;
  undefined1 *local_1290;
  undefined1 *local_1288;
  float *local_1280;
  undefined1 *local_1278;
  undefined1 *local_1270;
  float *local_1268;
  undefined1 *local_1260;
  undefined1 *local_1258;
  float *local_1250;
  undefined1 *local_1248;
  undefined1 *local_1240;
  float *local_1238;
  undefined1 *local_1230;
  undefined1 *local_1228;
  float *local_1220;
  undefined1 *local_1218;
  undefined1 *local_1210;
  float *local_1208;
  undefined1 *local_1200;
  undefined1 *local_11f8;
  undefined1 *local_11f0;
  float *local_11e8;
  undefined1 *local_11e0;
  undefined1 *local_11d8;
  float *local_11d0;
  undefined1 *local_11c8;
  undefined1 *local_11c0;
  float *local_11b8;
  float *local_11b0;
  undefined4 local_11a4;
  undefined8 local_11a0;
  undefined8 uStack_1198;
  undefined8 uStack_1190;
  undefined8 uStack_1188;
  undefined8 local_1180;
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined8 local_1160;
  undefined8 uStack_1158;
  undefined8 uStack_1150;
  undefined8 uStack_1148;
  float local_1140 [2];
  float afStack_1138 [2];
  float afStack_1130 [2];
  float afStack_1128 [2];
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined8 local_1100;
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  float local_10e0 [2];
  float afStack_10d8 [2];
  float afStack_10d0 [2];
  float afStack_10c8 [2];
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  float local_1080 [2];
  float afStack_1078 [2];
  float afStack_1070 [2];
  float afStack_1068 [2];
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  float local_1020 [2];
  float afStack_1018 [2];
  float afStack_1010 [2];
  float afStack_1008 [2];
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  float local_fc0 [2];
  float afStack_fb8 [2];
  float afStack_fb0 [2];
  float afStack_fa8 [2];
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  float local_f60 [2];
  float afStack_f58 [2];
  float afStack_f50 [2];
  float afStack_f48 [2];
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  float local_f00 [2];
  float afStack_ef8 [2];
  float afStack_ef0 [2];
  float afStack_ee8 [2];
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  float local_ea0 [2];
  float afStack_e98 [2];
  float afStack_e90 [2];
  float afStack_e88 [2];
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  ulong uStack_e28;
  float local_e20 [2];
  float afStack_e18 [2];
  float afStack_e10 [2];
  float afStack_e08 [2];
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  float local_dc0 [2];
  float afStack_db8 [2];
  float afStack_db0 [2];
  float afStack_da8 [2];
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  float local_d80 [2];
  float afStack_d78 [2];
  float afStack_d70 [2];
  float afStack_d68 [2];
  float local_d60 [2];
  float afStack_d58 [2];
  float afStack_d50 [2];
  float afStack_d48 [2];
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  float local_d20 [2];
  float afStack_d18 [2];
  float afStack_d10 [2];
  float afStack_d08 [2];
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  float local_cc0 [2];
  float afStack_cb8 [2];
  float afStack_cb0 [2];
  float afStack_ca8 [2];
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  undefined8 local_c80;
  undefined8 uStack_c78;
  undefined8 uStack_c70;
  undefined8 uStack_c68;
  float local_c60 [2];
  float afStack_c58 [2];
  float afStack_c50 [2];
  float afStack_c48 [2];
  undefined8 local_c40;
  undefined8 uStack_c38;
  undefined8 uStack_c30;
  undefined8 uStack_c28;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  float local_c00 [2];
  float afStack_bf8 [2];
  float afStack_bf0 [2];
  float afStack_be8 [2];
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  undefined8 local_bc0;
  undefined8 uStack_bb8;
  undefined8 uStack_bb0;
  undefined8 uStack_ba8;
  float local_ba0 [2];
  float afStack_b98 [2];
  float afStack_b90 [2];
  float afStack_b88 [2];
  undefined8 local_b80;
  undefined8 uStack_b78;
  undefined8 uStack_b70;
  undefined8 uStack_b68;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  undefined8 local_b40;
  undefined8 uStack_b38;
  undefined8 uStack_b30;
  undefined8 uStack_b28;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  undefined8 local_b00;
  undefined8 uStack_af8;
  undefined8 uStack_af0;
  undefined8 uStack_ae8;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  float local_ac0 [2];
  float afStack_ab8 [2];
  float afStack_ab0 [2];
  float afStack_aa8 [2];
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  float local_a60 [2];
  float afStack_a58 [2];
  float afStack_a50 [2];
  float afStack_a48 [2];
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  float local_a00 [2];
  float afStack_9f8 [2];
  float afStack_9f0 [2];
  float afStack_9e8 [2];
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined4 local_9c0;
  undefined4 uStack_9bc;
  undefined4 uStack_9b8;
  undefined4 uStack_9b4;
  undefined4 uStack_9b0;
  undefined4 uStack_9ac;
  undefined4 uStack_9a8;
  undefined4 uStack_9a4;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined4 local_904;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined4 local_864;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined4 local_810;
  undefined4 uStack_80c;
  undefined4 uStack_808;
  undefined4 uStack_804;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined4 local_7f0;
  undefined4 uStack_7ec;
  undefined4 uStack_7e8;
  undefined4 uStack_7e4;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined4 local_7c4;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 local_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 local_790;
  undefined8 uStack_788;
  undefined4 local_780;
  undefined4 uStack_77c;
  undefined4 uStack_778;
  undefined4 uStack_774;
  undefined8 local_770;
  undefined8 uStack_768;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 local_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 local_730;
  undefined8 uStack_728;
  undefined4 local_720;
  undefined4 uStack_71c;
  undefined4 uStack_718;
  undefined4 uStack_714;
  undefined8 local_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 local_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 local_6d0;
  undefined8 uStack_6c8;
  undefined4 local_6c0;
  undefined4 uStack_6bc;
  undefined4 uStack_6b8;
  undefined4 uStack_6b4;
  undefined8 local_6b0;
  undefined8 uStack_6a8;
  undefined8 local_6a0;
  undefined8 uStack_698;
  undefined8 local_690;
  undefined8 uStack_688;
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 local_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 local_650;
  undefined8 uStack_648;
  undefined1 *local_638;
  undefined1 *local_630;
  undefined1 *local_628;
  float *local_620;
  undefined1 *local_618;
  undefined1 *local_610;
  float *local_608;
  undefined1 *local_600;
  undefined1 *local_5f8;
  float *local_5f0;
  undefined1 *local_5e8;
  undefined1 *local_5e0;
  float *local_5d8;
  undefined1 *local_5d0;
  undefined1 *local_5c8;
  float *local_5c0;
  undefined1 *local_5b8;
  undefined1 *local_5b0;
  undefined1 *local_5a8;
  float *local_5a0;
  undefined1 *local_598;
  undefined1 *local_590;
  float *local_588;
  undefined1 *local_580;
  float *local_578;
  undefined1 *local_570;
  undefined1 *local_568;
  float *local_560;
  undefined1 *local_558;
  undefined1 *local_550;
  float *local_548;
  undefined1 *local_540;
  undefined1 *local_538;
  float *local_530;
  undefined1 *local_528;
  undefined1 *local_520;
  float *local_518;
  undefined1 *local_510;
  undefined1 *local_508;
  float *local_500;
  undefined1 *local_4f8;
  undefined1 *local_4f0;
  float *local_4e8;
  undefined1 *local_4e0;
  undefined1 *local_4d8;
  float *local_4d0;
  undefined1 *local_4c8;
  undefined1 *local_4c0;
  undefined1 *local_4b8;
  float *local_4b0;
  undefined1 *local_4a8;
  undefined1 *local_4a0;
  float *local_498;
  undefined1 *local_490;
  undefined1 *local_488;
  float *local_480;
  float *local_478;
  float local_470 [2];
  float afStack_468 [2];
  undefined8 local_460;
  undefined8 uStack_458;
  undefined8 local_450;
  undefined8 uStack_448;
  float local_440 [2];
  float afStack_438 [2];
  undefined8 local_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  float local_410 [2];
  float afStack_408 [2];
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 local_3f0;
  undefined8 uStack_3e8;
  float local_3e0 [2];
  float afStack_3d8 [2];
  undefined8 local_3d0;
  undefined8 uStack_3c8;
  undefined8 local_3c0;
  undefined8 uStack_3b8;
  float local_3b0 [2];
  float afStack_3a8 [2];
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 local_390;
  undefined8 uStack_388;
  float local_380 [2];
  float afStack_378 [2];
  undefined8 local_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  float local_350 [2];
  float afStack_348 [2];
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 local_330;
  undefined8 uStack_328;
  float local_320 [2];
  float afStack_318 [2];
  undefined8 local_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 local_2f0;
  undefined8 uStack_2e8;
  float local_2e0 [2];
  float afStack_2d8 [2];
  undefined8 local_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  float local_2b0 [2];
  float afStack_2a8 [2];
  undefined8 local_2a0;
  undefined8 uStack_298;
  float local_290 [2];
  float afStack_288 [2];
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 local_270;
  undefined8 uStack_268;
  float local_260 [2];
  float afStack_258 [2];
  undefined8 local_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  float local_230 [2];
  float afStack_228 [2];
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 local_210;
  undefined8 uStack_208;
  float local_200 [2];
  float afStack_1f8 [2];
  undefined8 local_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  float local_1d0 [2];
  float afStack_1c8 [2];
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 local_1b0;
  undefined8 uStack_1a8;
  undefined8 local_1a0;
  undefined8 uStack_198;
  undefined8 local_190;
  undefined8 uStack_188;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined8 local_170;
  undefined8 uStack_168;
  float local_160 [2];
  float afStack_158 [2];
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  float local_130 [2];
  float afStack_128 [2];
  undefined8 local_120;
  undefined8 uStack_118;
  undefined8 local_110;
  undefined8 uStack_108;
  float local_100 [2];
  float afStack_f8 [2];
  undefined8 local_f0;
  undefined8 uStack_e8;
  undefined4 local_e0;
  undefined4 uStack_dc;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  undefined8 local_d0;
  undefined8 uStack_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 uStack_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined4 local_74;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined1 auVar166 [24];
  undefined1 auVar167 [32];
  
  local_4bd4 = *(int *)((long)in_RSI + 0x2c);
  local_4bd8 = (int)in_RSI[6];
  local_4bdc = *(int *)((long)in_RSI + 0x34);
  local_4be0 = (int)in_RSI[7];
  local_4be4 = (int)in_RSI[3];
  local_4be8 = local_4bd4 * local_4bd8 * local_4bdc * local_4be4;
  local_4bc8 = in_RSI;
  for (local_4bec = 0; local_4bec < local_4be0; local_4bec = local_4bec + 1) {
    local_4ba8 = &local_4c40;
    local_31e4 = *(int *)((long)local_4bc8 + 0x2c);
    local_31e8 = (int)local_4bc8[6];
    local_31ec = *(undefined4 *)((long)local_4bc8 + 0x34);
    local_31f8 = (undefined1 (*) [64])
                 (*local_4bc8 + local_4bc8[8] * (long)local_4bec * local_4bc8[2]);
    local_3200 = local_4bc8[2];
    local_3204 = (undefined4)local_4bc8[3];
    local_3210 = local_4bc8[4];
    local_31e0 = &local_4c40;
    local_31d0 = (long)local_31e4 * (long)local_31e8 * local_3200;
    local_4ba0 = &local_4c40;
    local_4b90 = &local_4c40;
    local_31d4 = 0x10;
    local_4bb4 = local_4bec;
    local_4bb5 = 1;
    local_4c40 = 0;
    local_4c30 = 0;
    local_4c28 = 0;
    local_4c18 = 0;
    local_4c14 = 0;
    local_4c10 = 0;
    local_4c0c = 0;
    local_4c08 = 0;
    local_4c00 = 0;
    local_4c38 = 0;
    local_4c50 = 0;
    local_4b04 = 0x3f800000;
    local_4b80 = vbroadcastss_avx512f(ZEXT416(0x3f800000));
    local_4b00 = 0;
    uStack_4af8 = 0;
    uStack_4af0 = 0;
    uStack_4ae8 = 0;
    uStack_4ae0 = 0;
    uStack_4ad8 = 0;
    uStack_4ad0 = 0;
    uStack_4ac8 = 0;
    local_4bf8 = local_31f8;
    for (; local_4c50 + 0xf < local_4be8; local_4c50 = local_4c50 + 0x10) {
      local_4a88 = local_4bf8;
      local_4a00 = *(undefined8 *)*local_4bf8;
      uStack_49f8 = *(undefined8 *)(*local_4bf8 + 8);
      uStack_49f0 = *(undefined8 *)(*local_4bf8 + 0x10);
      uStack_49e8 = *(undefined8 *)(*local_4bf8 + 0x18);
      uStack_49e0 = *(undefined8 *)(*local_4bf8 + 0x20);
      uStack_49d8 = *(undefined8 *)(*local_4bf8 + 0x28);
      uStack_49d0 = *(undefined8 *)(*local_4bf8 + 0x30);
      uStack_49c8 = *(undefined8 *)(*local_4bf8 + 0x38);
      uStack_4d34 = (undefined4)((ulong)uStack_49f8 >> 0x20);
      uStack_4d30 = (undefined4)uStack_49f0;
      uStack_4d2c = (undefined4)((ulong)uStack_49f0 >> 0x20);
      uStack_4d28 = (undefined4)uStack_49e8;
      uStack_4d24 = (undefined4)((ulong)uStack_49e8 >> 0x20);
      uStack_4d20 = (undefined4)uStack_49e0;
      uStack_4d1c = (undefined4)((ulong)uStack_49e0 >> 0x20);
      uStack_4d18 = (undefined4)uStack_49d8;
      uStack_4d14 = (undefined4)((ulong)uStack_49d8 >> 0x20);
      uStack_4d10 = (undefined4)uStack_49d0;
      uStack_4d0c = (undefined4)((ulong)uStack_49d0 >> 0x20);
      uStack_4d08 = (undefined4)uStack_49c8;
      uStack_4d04 = (undefined4)((ulong)uStack_49c8 >> 0x20);
      auVar158._12_4_ = uStack_4d34;
      auVar158._0_12_ = *(undefined1 (*) [12])*local_4bf8;
      auVar158._16_4_ = uStack_4d30;
      auVar158._20_4_ = uStack_4d2c;
      auVar158._24_4_ = uStack_4d28;
      auVar158._28_4_ = uStack_4d24;
      auVar158._32_4_ = uStack_4d20;
      auVar158._36_4_ = uStack_4d1c;
      auVar158._40_4_ = uStack_4d18;
      auVar158._44_4_ = uStack_4d14;
      auVar158._48_4_ = uStack_4d10;
      auVar158._52_4_ = uStack_4d0c;
      auVar158._56_4_ = uStack_4d08;
      auVar158._60_4_ = uStack_4d04;
      uVar23 = vcmpps_avx512f(ZEXT1664(ZEXT816(0)),auVar158,1);
      local_3e42 = (ushort)uVar23;
      local_4904 = 0x7fffffff;
      auVar158 = vpbroadcastd_avx512f(ZEXT416(0x7fffffff));
      local_4980 = vmovdqa64_avx512f(auVar158);
      auVar158 = vmovdqa64_avx512f(local_4980);
      local_4a40 = vmovdqa64_avx512f(auVar158);
      auVar158 = vmovdqa64_avx512f(*local_4bf8);
      auVar159 = vmovdqa64_avx512f(local_4a40);
      auVar158 = vpandq_avx512f(auVar158,auVar159);
      local_4a80 = vmovdqa64_avx512f(auVar158);
      auVar158 = vmovdqa64_avx512f(local_4a80);
      auVar158 = vmovdqa64_avx512f(auVar158);
      local_44c0 = local_4b80._0_8_;
      uStack_44b8 = local_4b80._8_8_;
      uStack_44b0 = local_4b80._16_8_;
      uStack_44a8 = local_4b80._24_8_;
      uStack_44a0 = local_4b80._32_8_;
      uStack_4498 = local_4b80._40_8_;
      uStack_4490 = local_4b80._48_8_;
      uStack_4488 = local_4b80._56_8_;
      local_40c0 = 0;
      uStack_40b8 = 0;
      uStack_40b0 = 0;
      uStack_40a8 = 0;
      uStack_40a0 = 0;
      uStack_4098 = 0;
      uStack_4090 = 0;
      uStack_4088 = 0;
      local_4dc0 = auVar158._0_8_;
      local_4100 = local_4dc0;
      uStack_4db8 = auVar158._8_8_;
      uStack_40f8 = uStack_4db8;
      uStack_4db0 = auVar158._16_8_;
      uStack_40f0 = uStack_4db0;
      uStack_4da8 = auVar158._24_8_;
      uStack_40e8 = uStack_4da8;
      uStack_4da0 = auVar158._32_8_;
      uStack_40e0 = uStack_4da0;
      uStack_4d98 = auVar158._40_8_;
      uStack_40d8 = uStack_4d98;
      uStack_4d90 = auVar158._48_8_;
      uStack_40d0 = uStack_4d90;
      uStack_4d88 = auVar158._56_8_;
      uStack_40c8 = uStack_4d88;
      auVar158 = vsubps_avx512f(ZEXT1664(ZEXT816(0)),auVar158);
      local_4280 = 0;
      uStack_4278 = 0;
      uStack_4270 = 0;
      uStack_4268 = 0;
      uStack_4260 = 0;
      uStack_4258 = 0;
      uStack_4250 = 0;
      uStack_4248 = 0;
      local_43c0[0] = 1.0;
      local_43c0[1] = 1.0;
      afStack_43b8[0] = 1.0;
      afStack_43b8[1] = 1.0;
      afStack_43b0[0] = 1.0;
      afStack_43b0[1] = 1.0;
      afStack_43a8[0] = 1.0;
      afStack_43a8[1] = 1.0;
      afStack_43a0[0] = 1.0;
      afStack_43a0[1] = 1.0;
      afStack_4398[0] = 1.0;
      afStack_4398[1] = 1.0;
      afStack_4390[0] = 1.0;
      afStack_4390[1] = 1.0;
      afStack_4388[0] = 1.0;
      afStack_4388[1] = 1.0;
      local_42c0._0_8_ = auVar158._0_8_;
      local_18c0 = local_42c0._0_8_;
      local_42c0._8_8_ = auVar158._8_8_;
      uStack_18b8 = local_42c0._8_8_;
      local_42c0._16_8_ = auVar158._16_8_;
      uStack_18b0 = local_42c0._16_8_;
      local_42c0._24_8_ = auVar158._24_8_;
      uStack_18a8 = local_42c0._24_8_;
      local_42c0._32_8_ = auVar158._32_8_;
      uStack_18a0 = local_42c0._32_8_;
      local_42c0._40_8_ = auVar158._40_8_;
      uStack_1898 = local_42c0._40_8_;
      local_42c0._48_8_ = auVar158._48_8_;
      uStack_1890 = local_42c0._48_8_;
      local_42c0._56_8_ = auVar158._56_8_;
      uStack_1888 = local_42c0._56_8_;
      local_1900[0] = 88.37626;
      local_1900[1] = 88.37626;
      afStack_18f8[0] = 88.37626;
      afStack_18f8[1] = 88.37626;
      afStack_18f0[0] = 88.37626;
      afStack_18f0[1] = 88.37626;
      afStack_18e8[0] = 88.37626;
      afStack_18e8[1] = 88.37626;
      afStack_18e0[0] = 88.37626;
      afStack_18e0[1] = 88.37626;
      afStack_18d8[0] = 88.37626;
      afStack_18d8[1] = 88.37626;
      afStack_18d0[0] = 88.37626;
      afStack_18d0[1] = 88.37626;
      afStack_18c8[0] = 88.37626;
      afStack_18c8[1] = 88.37626;
      auVar91._8_4_ = 88.37626;
      auVar91._12_4_ = 88.37626;
      auVar91._0_4_ = 88.37626;
      auVar91._4_4_ = 88.37626;
      auVar91._16_4_ = 88.37626;
      auVar91._20_4_ = 88.37626;
      auVar91._24_4_ = 88.37626;
      auVar91._28_4_ = 88.37626;
      auVar91._32_4_ = 88.37626;
      auVar91._36_4_ = 88.37626;
      auVar91._40_4_ = 88.37626;
      auVar91._44_4_ = 88.37626;
      auVar91._48_4_ = 88.37626;
      auVar91._52_4_ = 88.37626;
      auVar91._56_4_ = 88.37626;
      auVar91._60_4_ = 88.37626;
      auVar158 = vminps_avx512f(auVar158,auVar91);
      local_42c0._0_8_ = auVar158._0_8_;
      local_3140 = local_42c0._0_8_;
      local_42c0._8_8_ = auVar158._8_8_;
      uStack_3138 = local_42c0._8_8_;
      local_42c0._16_8_ = auVar158._16_8_;
      uStack_3130 = local_42c0._16_8_;
      local_42c0._24_8_ = auVar158._24_8_;
      uStack_3128 = local_42c0._24_8_;
      local_42c0._32_8_ = auVar158._32_8_;
      uStack_3120 = local_42c0._32_8_;
      local_42c0._40_8_ = auVar158._40_8_;
      uStack_3118 = local_42c0._40_8_;
      local_42c0._48_8_ = auVar158._48_8_;
      uStack_3110 = local_42c0._48_8_;
      local_42c0._56_8_ = auVar158._56_8_;
      uStack_3108 = local_42c0._56_8_;
      local_3180[0] = -88.37626;
      local_3180[1] = -88.37626;
      afStack_3178[0] = -88.37626;
      afStack_3178[1] = -88.37626;
      afStack_3170[0] = -88.37626;
      afStack_3170[1] = -88.37626;
      afStack_3168[0] = -88.37626;
      afStack_3168[1] = -88.37626;
      afStack_3160[0] = -88.37626;
      afStack_3160[1] = -88.37626;
      afStack_3158[0] = -88.37626;
      afStack_3158[1] = -88.37626;
      afStack_3150[0] = -88.37626;
      afStack_3150[1] = -88.37626;
      afStack_3148[0] = -88.37626;
      afStack_3148[1] = -88.37626;
      auVar48._8_4_ = -88.37626;
      auVar48._12_4_ = -88.37626;
      auVar48._0_4_ = -88.37626;
      auVar48._4_4_ = -88.37626;
      auVar48._16_4_ = -88.37626;
      auVar48._20_4_ = -88.37626;
      auVar48._24_4_ = -88.37626;
      auVar48._28_4_ = -88.37626;
      auVar48._32_4_ = -88.37626;
      auVar48._36_4_ = -88.37626;
      auVar48._40_4_ = -88.37626;
      auVar48._44_4_ = -88.37626;
      auVar48._48_4_ = -88.37626;
      auVar48._52_4_ = -88.37626;
      auVar48._56_4_ = -88.37626;
      auVar48._60_4_ = -88.37626;
      auVar158 = vmaxps_avx512f(auVar158,auVar48);
      local_42c0._0_8_ = auVar158._0_8_;
      local_2340 = local_42c0._0_8_;
      local_42c0._8_8_ = auVar158._8_8_;
      uStack_2338 = local_42c0._8_8_;
      local_42c0._16_8_ = auVar158._16_8_;
      uStack_2330 = local_42c0._16_8_;
      local_42c0._24_8_ = auVar158._24_8_;
      uStack_2328 = local_42c0._24_8_;
      local_42c0._32_8_ = auVar158._32_8_;
      uStack_2320 = local_42c0._32_8_;
      local_42c0._40_8_ = auVar158._40_8_;
      uStack_2318 = local_42c0._40_8_;
      local_42c0._48_8_ = auVar158._48_8_;
      uStack_2310 = local_42c0._48_8_;
      local_42c0._56_8_ = auVar158._56_8_;
      uStack_2308 = local_42c0._56_8_;
      local_2380[0] = 1.442695;
      local_2380[1] = 1.442695;
      afStack_2378[0] = 1.442695;
      afStack_2378[1] = 1.442695;
      afStack_2370[0] = 1.442695;
      afStack_2370[1] = 1.442695;
      afStack_2368[0] = 1.442695;
      afStack_2368[1] = 1.442695;
      afStack_2360[0] = 1.442695;
      afStack_2360[1] = 1.442695;
      afStack_2358[0] = 1.442695;
      afStack_2358[1] = 1.442695;
      afStack_2350[0] = 1.442695;
      afStack_2350[1] = 1.442695;
      afStack_2348[0] = 1.442695;
      afStack_2348[1] = 1.442695;
      local_23c0[0] = 0.5;
      local_23c0[1] = 0.5;
      afStack_23b8[0] = 0.5;
      afStack_23b8[1] = 0.5;
      afStack_23b0[0] = 0.5;
      afStack_23b0[1] = 0.5;
      afStack_23a8[0] = 0.5;
      afStack_23a8[1] = 0.5;
      afStack_23a0[0] = 0.5;
      afStack_23a0[1] = 0.5;
      afStack_2398[0] = 0.5;
      afStack_2398[1] = 0.5;
      afStack_2390[0] = 0.5;
      afStack_2390[1] = 0.5;
      afStack_2388[0] = 0.5;
      afStack_2388[1] = 0.5;
      auVar64._8_4_ = 1.442695;
      auVar64._12_4_ = 1.442695;
      auVar64._0_4_ = 1.442695;
      auVar64._4_4_ = 1.442695;
      auVar64._16_4_ = 1.442695;
      auVar64._20_4_ = 1.442695;
      auVar64._24_4_ = 1.442695;
      auVar64._28_4_ = 1.442695;
      auVar64._32_4_ = 1.442695;
      auVar64._36_4_ = 1.442695;
      auVar64._40_4_ = 1.442695;
      auVar64._44_4_ = 1.442695;
      auVar64._48_4_ = 1.442695;
      auVar64._52_4_ = 1.442695;
      auVar64._56_4_ = 1.442695;
      auVar64._60_4_ = 1.442695;
      auVar63._8_4_ = 0.5;
      auVar63._12_4_ = 0.5;
      auVar63._0_4_ = 0.5;
      auVar63._4_4_ = 0.5;
      auVar63._16_4_ = 0.5;
      auVar63._20_4_ = 0.5;
      auVar63._24_4_ = 0.5;
      auVar63._28_4_ = 0.5;
      auVar63._32_4_ = 0.5;
      auVar63._36_4_ = 0.5;
      auVar63._40_4_ = 0.5;
      auVar63._44_4_ = 0.5;
      auVar63._48_4_ = 0.5;
      auVar63._52_4_ = 0.5;
      auVar63._56_4_ = 0.5;
      auVar63._60_4_ = 0.5;
      auVar159 = vfmadd213ps_avx512f(auVar64,auVar158,auVar63);
      auVar160 = vrndscaleps_avx512f(auVar159,1);
      uVar24 = vcmpps_avx512f(auVar159,auVar160,1);
      local_43c2 = (ushort)uVar24;
      local_4300._0_8_ = auVar160._0_8_;
      local_2d80 = local_4300._0_8_;
      local_4300._8_8_ = auVar160._8_8_;
      uStack_2d78 = local_4300._8_8_;
      local_4300._16_8_ = auVar160._16_8_;
      uStack_2d70 = local_4300._16_8_;
      local_4300._24_8_ = auVar160._24_8_;
      uStack_2d68 = local_4300._24_8_;
      local_4300._32_8_ = auVar160._32_8_;
      uStack_2d60 = local_4300._32_8_;
      local_4300._40_8_ = auVar160._40_8_;
      uStack_2d58 = local_4300._40_8_;
      local_4300._48_8_ = auVar160._48_8_;
      uStack_2d50 = local_4300._48_8_;
      local_4300._56_8_ = auVar160._56_8_;
      uStack_2d48 = local_4300._56_8_;
      local_2dc0[0] = 1.0;
      local_2dc0[1] = 1.0;
      afStack_2db8[0] = 1.0;
      afStack_2db8[1] = 1.0;
      afStack_2db0[0] = 1.0;
      afStack_2db0[1] = 1.0;
      afStack_2da8[0] = 1.0;
      afStack_2da8[1] = 1.0;
      afStack_2da0[0] = 1.0;
      afStack_2da0[1] = 1.0;
      afStack_2d98[0] = 1.0;
      afStack_2d98[1] = 1.0;
      afStack_2d90[0] = 1.0;
      afStack_2d90[1] = 1.0;
      afStack_2d88[0] = 1.0;
      afStack_2d88[1] = 1.0;
      local_2c80 = local_4300._0_8_;
      uStack_2c78 = local_4300._8_8_;
      uStack_2c70 = local_4300._16_8_;
      uStack_2c68 = local_4300._24_8_;
      uStack_2c60 = local_4300._32_8_;
      uStack_2c58 = local_4300._40_8_;
      uStack_2c50 = local_4300._48_8_;
      uStack_2c48 = local_4300._56_8_;
      local_2cc0[0] = 1.0;
      local_2cc0[1] = 1.0;
      afStack_2cb8[0] = 1.0;
      afStack_2cb8[1] = 1.0;
      afStack_2cb0[0] = 1.0;
      afStack_2cb0[1] = 1.0;
      afStack_2ca8[0] = 1.0;
      afStack_2ca8[1] = 1.0;
      afStack_2ca0[0] = 1.0;
      afStack_2ca0[1] = 1.0;
      afStack_2c98[0] = 1.0;
      afStack_2c98[1] = 1.0;
      afStack_2c90[0] = 1.0;
      afStack_2c90[1] = 1.0;
      afStack_2c88[0] = 1.0;
      afStack_2c88[1] = 1.0;
      auVar52._8_4_ = 1.0;
      auVar52._12_4_ = 1.0;
      auVar52._0_4_ = 1.0;
      auVar52._4_4_ = 1.0;
      auVar52._16_4_ = 1.0;
      auVar52._20_4_ = 1.0;
      auVar52._24_4_ = 1.0;
      auVar52._28_4_ = 1.0;
      auVar52._32_4_ = 1.0;
      auVar52._36_4_ = 1.0;
      auVar52._40_4_ = 1.0;
      auVar52._44_4_ = 1.0;
      auVar52._48_4_ = 1.0;
      auVar52._52_4_ = 1.0;
      auVar52._56_4_ = 1.0;
      auVar52._60_4_ = 1.0;
      local_2d00._0_4_ = auVar160._0_4_;
      local_2d00._4_4_ = auVar160._4_4_;
      uStack_2cf8._0_4_ = auVar160._8_4_;
      uStack_2cf8._4_4_ = auVar160._12_4_;
      uStack_2cf0._0_4_ = auVar160._16_4_;
      uStack_2cf0._4_4_ = auVar160._20_4_;
      uStack_2ce8._0_4_ = auVar160._24_4_;
      uStack_2ce8._4_4_ = auVar160._28_4_;
      uStack_2ce0._0_4_ = auVar160._32_4_;
      uStack_2ce0._4_4_ = auVar160._36_4_;
      uStack_2cd8._0_4_ = auVar160._40_4_;
      uStack_2cd8._4_4_ = auVar160._44_4_;
      uStack_2cd0._0_4_ = auVar160._48_4_;
      uStack_2cd0._4_4_ = auVar160._52_4_;
      uStack_2cc8._0_4_ = auVar160._56_4_;
      uStack_2cc8._4_4_ = auVar160._60_4_;
      auVar159 = vsubps_avx512f(auVar160,auVar52);
      bVar1 = (bool)((byte)uVar24 & 1);
      bVar2 = (bool)((byte)(local_43c2 >> 1) & 1);
      bVar3 = (bool)((byte)(local_43c2 >> 2) & 1);
      bVar4 = (bool)((byte)(local_43c2 >> 3) & 1);
      bVar5 = (bool)((byte)(local_43c2 >> 4) & 1);
      bVar6 = (bool)((byte)(local_43c2 >> 5) & 1);
      bVar7 = (bool)((byte)(local_43c2 >> 6) & 1);
      bVar8 = (bool)((byte)(local_43c2 >> 7) & 1);
      bVar9 = (byte)((ulong)uVar24 >> 8);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      local_4340._4_4_ = (uint)bVar2 * auVar159._4_4_ | (uint)!bVar2 * local_2d00._4_4_;
      local_4340._0_4_ = (uint)bVar1 * auVar159._0_4_ | (uint)!bVar1 * (int)local_2d00;
      local_4340._8_4_ = (uint)bVar3 * auVar159._8_4_ | (uint)!bVar3 * (int)uStack_2cf8;
      local_4340._12_4_ = (uint)bVar4 * auVar159._12_4_ | (uint)!bVar4 * uStack_2cf8._4_4_;
      uStack_4330._0_4_ = (uint)bVar5 * auVar159._16_4_ | (uint)!bVar5 * (int)uStack_2cf0;
      uStack_4330._4_4_ = (uint)bVar6 * auVar159._20_4_ | (uint)!bVar6 * uStack_2cf0._4_4_;
      auVar166 = _local_4340;
      uStack_4328._0_4_ = (uint)bVar7 * auVar159._24_4_ | (uint)!bVar7 * (int)uStack_2ce8;
      uStack_4328._4_4_ = (uint)bVar8 * auVar159._28_4_ | (uint)!bVar8 * uStack_2ce8._4_4_;
      auVar16 = _local_4340;
      uStack_4320._0_4_ =
           (uint)(bVar9 & 1) * auVar159._32_4_ | (uint)!(bool)(bVar9 & 1) * (int)uStack_2ce0;
      uStack_4320._4_4_ = (uint)bVar10 * auVar159._36_4_ | (uint)!bVar10 * uStack_2ce0._4_4_;
      auVar151 = _local_4340;
      uStack_4318._0_4_ = (uint)bVar11 * auVar159._40_4_ | (uint)!bVar11 * (int)uStack_2cd8;
      uStack_4318._4_4_ = (uint)bVar12 * auVar159._44_4_ | (uint)!bVar12 * uStack_2cd8._4_4_;
      auVar152 = _local_4340;
      uStack_4310._0_4_ = (uint)bVar13 * auVar159._48_4_ | (uint)!bVar13 * (int)uStack_2cd0;
      uStack_4310._4_4_ = (uint)bVar14 * auVar159._52_4_ | (uint)!bVar14 * uStack_2cd0._4_4_;
      auVar153 = _local_4340;
      uStack_4308._0_4_ = (uint)bVar15 * auVar159._56_4_ | (uint)!bVar15 * (int)uStack_2cc8;
      uStack_4308._4_4_ =
           (uint)(bVar9 >> 7) * auVar159._60_4_ | (uint)!(bool)(bVar9 >> 7) * uStack_2cc8._4_4_;
      auVar48 = _local_4340;
      local_1a40 = local_4340._0_8_;
      uStack_1a38 = local_4340._8_8_;
      uStack_4330 = auVar166._16_8_;
      uStack_1a30 = uStack_4330;
      uStack_4328 = auVar16._24_8_;
      uStack_1a28 = uStack_4328;
      uStack_4320 = auVar151._32_8_;
      uStack_1a20 = uStack_4320;
      uStack_4318 = auVar152._40_8_;
      uStack_1a18 = uStack_4318;
      uStack_4310 = auVar153._48_8_;
      uStack_1a10 = uStack_4310;
      uStack_4308 = auVar48._56_8_;
      uStack_1a08 = uStack_4308;
      local_1a80[0] = 0.6933594;
      local_1a80[1] = 0.6933594;
      afStack_1a78[0] = 0.6933594;
      afStack_1a78[1] = 0.6933594;
      afStack_1a70[0] = 0.6933594;
      afStack_1a70[1] = 0.6933594;
      afStack_1a68[0] = 0.6933594;
      afStack_1a68[1] = 0.6933594;
      afStack_1a60[0] = 0.6933594;
      afStack_1a60[1] = 0.6933594;
      afStack_1a58[0] = 0.6933594;
      afStack_1a58[1] = 0.6933594;
      afStack_1a50[0] = 0.6933594;
      afStack_1a50[1] = 0.6933594;
      afStack_1a48[0] = 0.6933594;
      afStack_1a48[1] = 0.6933594;
      local_1ac0 = local_42c0._0_8_;
      uStack_1ab8 = local_42c0._8_8_;
      uStack_1ab0 = local_42c0._16_8_;
      uStack_1aa8 = local_42c0._24_8_;
      uStack_1aa0 = local_42c0._32_8_;
      uStack_1a98 = local_42c0._40_8_;
      uStack_1a90 = local_42c0._48_8_;
      uStack_1a88 = local_42c0._56_8_;
      auVar89._16_8_ = uStack_4330;
      auVar89._0_16_ = local_4340;
      auVar89._24_8_ = uStack_4328;
      auVar89._32_8_ = uStack_4320;
      auVar89._40_8_ = uStack_4318;
      auVar89._48_8_ = uStack_4310;
      auVar89._56_8_ = uStack_4308;
      auVar88._8_4_ = 0.6933594;
      auVar88._12_4_ = 0.6933594;
      auVar88._0_4_ = 0.6933594;
      auVar88._4_4_ = 0.6933594;
      auVar88._16_4_ = 0.6933594;
      auVar88._20_4_ = 0.6933594;
      auVar88._24_4_ = 0.6933594;
      auVar88._28_4_ = 0.6933594;
      auVar88._32_4_ = 0.6933594;
      auVar88._36_4_ = 0.6933594;
      auVar88._40_4_ = 0.6933594;
      auVar88._44_4_ = 0.6933594;
      auVar88._48_4_ = 0.6933594;
      auVar88._52_4_ = 0.6933594;
      auVar88._56_4_ = 0.6933594;
      auVar88._60_4_ = 0.6933594;
      auVar158 = vfnmadd213ps_avx512f(auVar88,auVar89,auVar158);
      local_1b00 = local_4340._0_8_;
      uStack_1af8 = local_4340._8_8_;
      uStack_1af0 = uStack_4330;
      uStack_1ae8 = uStack_4328;
      uStack_1ae0 = uStack_4320;
      uStack_1ad8 = uStack_4318;
      uStack_1ad0 = uStack_4310;
      uStack_1ac8 = uStack_4308;
      local_1b40[0] = -0.00021219444;
      local_1b40[1] = -0.00021219444;
      afStack_1b38[0] = -0.00021219444;
      afStack_1b38[1] = -0.00021219444;
      afStack_1b30[0] = -0.00021219444;
      afStack_1b30[1] = -0.00021219444;
      afStack_1b28[0] = -0.00021219444;
      afStack_1b28[1] = -0.00021219444;
      afStack_1b20[0] = -0.00021219444;
      afStack_1b20[1] = -0.00021219444;
      afStack_1b18[0] = -0.00021219444;
      afStack_1b18[1] = -0.00021219444;
      afStack_1b10[0] = -0.00021219444;
      afStack_1b10[1] = -0.00021219444;
      afStack_1b08[0] = -0.00021219444;
      afStack_1b08[1] = -0.00021219444;
      local_42c0._0_8_ = auVar158._0_8_;
      local_1b80 = local_42c0._0_8_;
      local_42c0._8_8_ = auVar158._8_8_;
      uStack_1b78 = local_42c0._8_8_;
      local_42c0._16_8_ = auVar158._16_8_;
      uStack_1b70 = local_42c0._16_8_;
      local_42c0._24_8_ = auVar158._24_8_;
      uStack_1b68 = local_42c0._24_8_;
      local_42c0._32_8_ = auVar158._32_8_;
      uStack_1b60 = local_42c0._32_8_;
      local_42c0._40_8_ = auVar158._40_8_;
      uStack_1b58 = local_42c0._40_8_;
      local_42c0._48_8_ = auVar158._48_8_;
      uStack_1b50 = local_42c0._48_8_;
      local_42c0._56_8_ = auVar158._56_8_;
      uStack_1b48 = local_42c0._56_8_;
      auVar87._16_8_ = uStack_4330;
      auVar87._0_16_ = local_4340;
      auVar87._24_8_ = uStack_4328;
      auVar87._32_8_ = uStack_4320;
      auVar87._40_8_ = uStack_4318;
      auVar87._48_8_ = uStack_4310;
      auVar87._56_8_ = uStack_4308;
      auVar86._8_4_ = -0.00021219444;
      auVar86._12_4_ = -0.00021219444;
      auVar86._0_4_ = -0.00021219444;
      auVar86._4_4_ = -0.00021219444;
      auVar86._16_4_ = -0.00021219444;
      auVar86._20_4_ = -0.00021219444;
      auVar86._24_4_ = -0.00021219444;
      auVar86._28_4_ = -0.00021219444;
      auVar86._32_4_ = -0.00021219444;
      auVar86._36_4_ = -0.00021219444;
      auVar86._40_4_ = -0.00021219444;
      auVar86._44_4_ = -0.00021219444;
      auVar86._48_4_ = -0.00021219444;
      auVar86._52_4_ = -0.00021219444;
      auVar86._56_4_ = -0.00021219444;
      auVar86._60_4_ = -0.00021219444;
      local_42c0 = vfnmadd213ps_avx512f(auVar86,auVar87,auVar158);
      local_2a40 = local_42c0._0_8_;
      uStack_2a38 = local_42c0._8_8_;
      uStack_2a30 = local_42c0._16_8_;
      uStack_2a28 = local_42c0._24_8_;
      uStack_2a20 = local_42c0._32_8_;
      uStack_2a18 = local_42c0._40_8_;
      uStack_2a10 = local_42c0._48_8_;
      uStack_2a08 = local_42c0._56_8_;
      local_4300 = vmulps_avx512f(local_42c0,local_42c0);
      uStack_4438._0_4_ = 0.00019875691;
      uStack_4438._4_4_ = 0.00019875691;
      local_4440._0_4_ = 0.00019875691;
      local_4440._4_4_ = 0.00019875691;
      local_2400[0] = 0.00019875691;
      local_2400[1] = 0.00019875691;
      afStack_23f8[0] = 0.00019875691;
      afStack_23f8[1] = 0.00019875691;
      afStack_23f0[0] = 0.00019875691;
      afStack_23f0[1] = 0.00019875691;
      afStack_23e8[0] = 0.00019875691;
      afStack_23e8[1] = 0.00019875691;
      afStack_23e0[0] = 0.00019875691;
      afStack_23e0[1] = 0.00019875691;
      afStack_23d8[0] = 0.00019875691;
      afStack_23d8[1] = 0.00019875691;
      afStack_23d0[0] = 0.00019875691;
      afStack_23d0[1] = 0.00019875691;
      afStack_23c8[0] = 0.00019875691;
      afStack_23c8[1] = 0.00019875691;
      local_2440 = local_42c0._0_8_;
      uStack_2438 = local_42c0._8_8_;
      uStack_2430 = local_42c0._16_8_;
      uStack_2428 = local_42c0._24_8_;
      uStack_2420 = local_42c0._32_8_;
      uStack_2418 = local_42c0._40_8_;
      uStack_2410 = local_42c0._48_8_;
      uStack_2408 = local_42c0._56_8_;
      local_2480[0] = 0.0013981999;
      local_2480[1] = 0.0013981999;
      afStack_2478[0] = 0.0013981999;
      afStack_2478[1] = 0.0013981999;
      afStack_2470[0] = 0.0013981999;
      afStack_2470[1] = 0.0013981999;
      afStack_2468[0] = 0.0013981999;
      afStack_2468[1] = 0.0013981999;
      afStack_2460[0] = 0.0013981999;
      afStack_2460[1] = 0.0013981999;
      afStack_2458[0] = 0.0013981999;
      afStack_2458[1] = 0.0013981999;
      afStack_2450[0] = 0.0013981999;
      afStack_2450[1] = 0.0013981999;
      afStack_2448[0] = 0.0013981999;
      afStack_2448[1] = 0.0013981999;
      auVar62._16_4_ = 0.00019875691;
      auVar62._20_4_ = 0.00019875691;
      auVar62._0_16_ = _local_4440;
      auVar62._24_4_ = 0.00019875691;
      auVar62._28_4_ = 0.00019875691;
      auVar62._32_4_ = 0.00019875691;
      auVar62._36_4_ = 0.00019875691;
      auVar62._40_4_ = 0.00019875691;
      auVar62._44_4_ = 0.00019875691;
      auVar62._48_4_ = 0.00019875691;
      auVar62._52_4_ = 0.00019875691;
      auVar62._56_4_ = 0.00019875691;
      auVar62._60_4_ = 0.00019875691;
      auVar61._8_4_ = 0.0013981999;
      auVar61._12_4_ = 0.0013981999;
      auVar61._0_4_ = 0.0013981999;
      auVar61._4_4_ = 0.0013981999;
      auVar61._16_4_ = 0.0013981999;
      auVar61._20_4_ = 0.0013981999;
      auVar61._24_4_ = 0.0013981999;
      auVar61._28_4_ = 0.0013981999;
      auVar61._32_4_ = 0.0013981999;
      auVar61._36_4_ = 0.0013981999;
      auVar61._40_4_ = 0.0013981999;
      auVar61._44_4_ = 0.0013981999;
      auVar61._48_4_ = 0.0013981999;
      auVar61._52_4_ = 0.0013981999;
      auVar61._56_4_ = 0.0013981999;
      auVar61._60_4_ = 0.0013981999;
      auVar158 = vfmadd213ps_avx512f(local_42c0,auVar62,auVar61);
      local_4440 = auVar158._0_8_;
      local_24c0 = local_4440;
      uStack_4438 = auVar158._8_8_;
      uStack_24b8 = uStack_4438;
      uStack_4430 = auVar158._16_8_;
      uStack_24b0 = uStack_4430;
      uStack_4428 = auVar158._24_8_;
      uStack_24a8 = uStack_4428;
      uStack_4420 = auVar158._32_8_;
      uStack_24a0 = uStack_4420;
      uStack_4418 = auVar158._40_8_;
      uStack_2498 = uStack_4418;
      uStack_4410 = auVar158._48_8_;
      uStack_2490 = uStack_4410;
      uStack_4408 = auVar158._56_8_;
      uStack_2488 = uStack_4408;
      local_2500 = local_42c0._0_8_;
      uStack_24f8 = local_42c0._8_8_;
      uStack_24f0 = local_42c0._16_8_;
      uStack_24e8 = local_42c0._24_8_;
      uStack_24e0 = local_42c0._32_8_;
      uStack_24d8 = local_42c0._40_8_;
      uStack_24d0 = local_42c0._48_8_;
      uStack_24c8 = local_42c0._56_8_;
      local_2540[0] = 0.008333452;
      local_2540[1] = 0.008333452;
      afStack_2538[0] = 0.008333452;
      afStack_2538[1] = 0.008333452;
      afStack_2530[0] = 0.008333452;
      afStack_2530[1] = 0.008333452;
      afStack_2528[0] = 0.008333452;
      afStack_2528[1] = 0.008333452;
      afStack_2520[0] = 0.008333452;
      afStack_2520[1] = 0.008333452;
      afStack_2518[0] = 0.008333452;
      afStack_2518[1] = 0.008333452;
      afStack_2510[0] = 0.008333452;
      afStack_2510[1] = 0.008333452;
      afStack_2508[0] = 0.008333452;
      afStack_2508[1] = 0.008333452;
      auVar60._8_4_ = 0.008333452;
      auVar60._12_4_ = 0.008333452;
      auVar60._0_4_ = 0.008333452;
      auVar60._4_4_ = 0.008333452;
      auVar60._16_4_ = 0.008333452;
      auVar60._20_4_ = 0.008333452;
      auVar60._24_4_ = 0.008333452;
      auVar60._28_4_ = 0.008333452;
      auVar60._32_4_ = 0.008333452;
      auVar60._36_4_ = 0.008333452;
      auVar60._40_4_ = 0.008333452;
      auVar60._44_4_ = 0.008333452;
      auVar60._48_4_ = 0.008333452;
      auVar60._52_4_ = 0.008333452;
      auVar60._56_4_ = 0.008333452;
      auVar60._60_4_ = 0.008333452;
      auVar158 = vfmadd213ps_avx512f(local_42c0,auVar158,auVar60);
      local_4440 = auVar158._0_8_;
      local_2580 = local_4440;
      uStack_4438 = auVar158._8_8_;
      uStack_2578 = uStack_4438;
      uStack_4430 = auVar158._16_8_;
      uStack_2570 = uStack_4430;
      uStack_4428 = auVar158._24_8_;
      uStack_2568 = uStack_4428;
      uStack_4420 = auVar158._32_8_;
      uStack_2560 = uStack_4420;
      uStack_4418 = auVar158._40_8_;
      uStack_2558 = uStack_4418;
      uStack_4410 = auVar158._48_8_;
      uStack_2550 = uStack_4410;
      uStack_4408 = auVar158._56_8_;
      uStack_2548 = uStack_4408;
      local_25c0 = local_42c0._0_8_;
      uStack_25b8 = local_42c0._8_8_;
      uStack_25b0 = local_42c0._16_8_;
      uStack_25a8 = local_42c0._24_8_;
      uStack_25a0 = local_42c0._32_8_;
      uStack_2598 = local_42c0._40_8_;
      uStack_2590 = local_42c0._48_8_;
      uStack_2588 = local_42c0._56_8_;
      local_2600[0] = 0.041665796;
      local_2600[1] = 0.041665796;
      afStack_25f8[0] = 0.041665796;
      afStack_25f8[1] = 0.041665796;
      afStack_25f0[0] = 0.041665796;
      afStack_25f0[1] = 0.041665796;
      afStack_25e8[0] = 0.041665796;
      afStack_25e8[1] = 0.041665796;
      afStack_25e0[0] = 0.041665796;
      afStack_25e0[1] = 0.041665796;
      afStack_25d8[0] = 0.041665796;
      afStack_25d8[1] = 0.041665796;
      afStack_25d0[0] = 0.041665796;
      afStack_25d0[1] = 0.041665796;
      afStack_25c8[0] = 0.041665796;
      afStack_25c8[1] = 0.041665796;
      auVar59._8_4_ = 0.041665796;
      auVar59._12_4_ = 0.041665796;
      auVar59._0_4_ = 0.041665796;
      auVar59._4_4_ = 0.041665796;
      auVar59._16_4_ = 0.041665796;
      auVar59._20_4_ = 0.041665796;
      auVar59._24_4_ = 0.041665796;
      auVar59._28_4_ = 0.041665796;
      auVar59._32_4_ = 0.041665796;
      auVar59._36_4_ = 0.041665796;
      auVar59._40_4_ = 0.041665796;
      auVar59._44_4_ = 0.041665796;
      auVar59._48_4_ = 0.041665796;
      auVar59._52_4_ = 0.041665796;
      auVar59._56_4_ = 0.041665796;
      auVar59._60_4_ = 0.041665796;
      auVar158 = vfmadd213ps_avx512f(local_42c0,auVar158,auVar59);
      local_4440 = auVar158._0_8_;
      local_2640 = local_4440;
      uStack_4438 = auVar158._8_8_;
      uStack_2638 = uStack_4438;
      uStack_4430 = auVar158._16_8_;
      uStack_2630 = uStack_4430;
      uStack_4428 = auVar158._24_8_;
      uStack_2628 = uStack_4428;
      uStack_4420 = auVar158._32_8_;
      uStack_2620 = uStack_4420;
      uStack_4418 = auVar158._40_8_;
      uStack_2618 = uStack_4418;
      uStack_4410 = auVar158._48_8_;
      uStack_2610 = uStack_4410;
      uStack_4408 = auVar158._56_8_;
      uStack_2608 = uStack_4408;
      local_2680 = local_42c0._0_8_;
      uStack_2678 = local_42c0._8_8_;
      uStack_2670 = local_42c0._16_8_;
      uStack_2668 = local_42c0._24_8_;
      uStack_2660 = local_42c0._32_8_;
      uStack_2658 = local_42c0._40_8_;
      uStack_2650 = local_42c0._48_8_;
      uStack_2648 = local_42c0._56_8_;
      local_26c0[0] = 0.16666666;
      local_26c0[1] = 0.16666666;
      afStack_26b8[0] = 0.16666666;
      afStack_26b8[1] = 0.16666666;
      afStack_26b0[0] = 0.16666666;
      afStack_26b0[1] = 0.16666666;
      afStack_26a8[0] = 0.16666666;
      afStack_26a8[1] = 0.16666666;
      afStack_26a0[0] = 0.16666666;
      afStack_26a0[1] = 0.16666666;
      afStack_2698[0] = 0.16666666;
      afStack_2698[1] = 0.16666666;
      afStack_2690[0] = 0.16666666;
      afStack_2690[1] = 0.16666666;
      afStack_2688[0] = 0.16666666;
      afStack_2688[1] = 0.16666666;
      auVar58._8_4_ = 0.16666666;
      auVar58._12_4_ = 0.16666666;
      auVar58._0_4_ = 0.16666666;
      auVar58._4_4_ = 0.16666666;
      auVar58._16_4_ = 0.16666666;
      auVar58._20_4_ = 0.16666666;
      auVar58._24_4_ = 0.16666666;
      auVar58._28_4_ = 0.16666666;
      auVar58._32_4_ = 0.16666666;
      auVar58._36_4_ = 0.16666666;
      auVar58._40_4_ = 0.16666666;
      auVar58._44_4_ = 0.16666666;
      auVar58._48_4_ = 0.16666666;
      auVar58._52_4_ = 0.16666666;
      auVar58._56_4_ = 0.16666666;
      auVar58._60_4_ = 0.16666666;
      auVar158 = vfmadd213ps_avx512f(local_42c0,auVar158,auVar58);
      local_4440 = auVar158._0_8_;
      local_2700 = local_4440;
      uStack_4438 = auVar158._8_8_;
      uStack_26f8 = uStack_4438;
      uStack_4430 = auVar158._16_8_;
      uStack_26f0 = uStack_4430;
      uStack_4428 = auVar158._24_8_;
      uStack_26e8 = uStack_4428;
      uStack_4420 = auVar158._32_8_;
      uStack_26e0 = uStack_4420;
      uStack_4418 = auVar158._40_8_;
      uStack_26d8 = uStack_4418;
      uStack_4410 = auVar158._48_8_;
      uStack_26d0 = uStack_4410;
      uStack_4408 = auVar158._56_8_;
      uStack_26c8 = uStack_4408;
      local_2740 = local_42c0._0_8_;
      uStack_2738 = local_42c0._8_8_;
      uStack_2730 = local_42c0._16_8_;
      uStack_2728 = local_42c0._24_8_;
      uStack_2720 = local_42c0._32_8_;
      uStack_2718 = local_42c0._40_8_;
      uStack_2710 = local_42c0._48_8_;
      uStack_2708 = local_42c0._56_8_;
      local_2780[0] = 0.5;
      local_2780[1] = 0.5;
      afStack_2778[0] = 0.5;
      afStack_2778[1] = 0.5;
      afStack_2770[0] = 0.5;
      afStack_2770[1] = 0.5;
      afStack_2768[0] = 0.5;
      afStack_2768[1] = 0.5;
      afStack_2760[0] = 0.5;
      afStack_2760[1] = 0.5;
      afStack_2758[0] = 0.5;
      afStack_2758[1] = 0.5;
      afStack_2750[0] = 0.5;
      afStack_2750[1] = 0.5;
      afStack_2748[0] = 0.5;
      afStack_2748[1] = 0.5;
      auVar57._8_4_ = 0.5;
      auVar57._12_4_ = 0.5;
      auVar57._0_4_ = 0.5;
      auVar57._4_4_ = 0.5;
      auVar57._16_4_ = 0.5;
      auVar57._20_4_ = 0.5;
      auVar57._24_4_ = 0.5;
      auVar57._28_4_ = 0.5;
      auVar57._32_4_ = 0.5;
      auVar57._36_4_ = 0.5;
      auVar57._40_4_ = 0.5;
      auVar57._44_4_ = 0.5;
      auVar57._48_4_ = 0.5;
      auVar57._52_4_ = 0.5;
      auVar57._56_4_ = 0.5;
      auVar57._60_4_ = 0.5;
      auVar158 = vfmadd213ps_avx512f(local_42c0,auVar158,auVar57);
      local_4440 = auVar158._0_8_;
      local_27c0 = local_4440;
      uStack_4438 = auVar158._8_8_;
      uStack_27b8 = uStack_4438;
      uStack_4430 = auVar158._16_8_;
      uStack_27b0 = uStack_4430;
      uStack_4428 = auVar158._24_8_;
      uStack_27a8 = uStack_4428;
      uStack_4420 = auVar158._32_8_;
      uStack_27a0 = uStack_4420;
      uStack_4418 = auVar158._40_8_;
      uStack_2798 = uStack_4418;
      uStack_4410 = auVar158._48_8_;
      uStack_2790 = uStack_4410;
      uStack_4408 = auVar158._56_8_;
      uStack_2788 = uStack_4408;
      local_2800 = local_4300._0_8_;
      uStack_27f8 = local_4300._8_8_;
      uStack_27f0 = local_4300._16_8_;
      uStack_27e8 = local_4300._24_8_;
      uStack_27e0 = local_4300._32_8_;
      uStack_27d8 = local_4300._40_8_;
      uStack_27d0 = local_4300._48_8_;
      uStack_27c8 = local_4300._56_8_;
      local_2840 = local_42c0._0_8_;
      uStack_2838 = local_42c0._8_8_;
      uStack_2830 = local_42c0._16_8_;
      uStack_2828 = local_42c0._24_8_;
      uStack_2820 = local_42c0._32_8_;
      uStack_2818 = local_42c0._40_8_;
      uStack_2810 = local_42c0._48_8_;
      uStack_2808 = local_42c0._56_8_;
      auVar158 = vfmadd213ps_avx512f(local_4300,auVar158,local_42c0);
      local_4440 = auVar158._0_8_;
      local_41c0 = local_4440;
      uStack_4438 = auVar158._8_8_;
      uStack_41b8 = uStack_4438;
      uStack_4430 = auVar158._16_8_;
      uStack_41b0 = uStack_4430;
      uStack_4428 = auVar158._24_8_;
      uStack_41a8 = uStack_4428;
      uStack_4420 = auVar158._32_8_;
      uStack_41a0 = uStack_4420;
      uStack_4418 = auVar158._40_8_;
      uStack_4198 = uStack_4418;
      uStack_4410 = auVar158._48_8_;
      uStack_4190 = uStack_4410;
      uStack_4408 = auVar158._56_8_;
      uStack_4188 = uStack_4408;
      local_4200[0] = 1.0;
      local_4200[1] = 1.0;
      afStack_41f8[0] = 1.0;
      afStack_41f8[1] = 1.0;
      afStack_41f0[0] = 1.0;
      afStack_41f0[1] = 1.0;
      afStack_41e8[0] = 1.0;
      afStack_41e8[1] = 1.0;
      afStack_41e0[0] = 1.0;
      afStack_41e0[1] = 1.0;
      afStack_41d8[0] = 1.0;
      afStack_41d8[1] = 1.0;
      afStack_41d0[0] = 1.0;
      afStack_41d0[1] = 1.0;
      afStack_41c8[0] = 1.0;
      afStack_41c8[1] = 1.0;
      auVar38._8_4_ = 1.0;
      auVar38._12_4_ = 1.0;
      auVar38._0_4_ = 1.0;
      auVar38._4_4_ = 1.0;
      auVar38._16_4_ = 1.0;
      auVar38._20_4_ = 1.0;
      auVar38._24_4_ = 1.0;
      auVar38._28_4_ = 1.0;
      auVar38._32_4_ = 1.0;
      auVar38._36_4_ = 1.0;
      auVar38._40_4_ = 1.0;
      auVar38._44_4_ = 1.0;
      auVar38._48_4_ = 1.0;
      auVar38._52_4_ = 1.0;
      auVar38._56_4_ = 1.0;
      auVar38._60_4_ = 1.0;
      auVar159 = vaddps_avx512f(auVar158,auVar38);
      local_1880 = local_4340._0_8_;
      uStack_1878 = local_4340._8_8_;
      uStack_1870 = uStack_4330;
      uStack_1868 = uStack_4328;
      uStack_1860 = uStack_4320;
      uStack_1858 = uStack_4318;
      uStack_1850 = uStack_4310;
      uStack_1848 = uStack_4308;
      auVar92._16_8_ = uStack_4330;
      auVar92._0_16_ = local_4340;
      auVar92._24_8_ = uStack_4328;
      auVar92._32_8_ = uStack_4320;
      auVar92._40_8_ = uStack_4318;
      auVar92._48_8_ = uStack_4310;
      auVar92._56_8_ = uStack_4308;
      auVar158 = vcvttps2dq_avx512f(auVar92);
      local_1740 = vmovdqa64_avx512f(ZEXT1664((undefined1  [16])0x0));
      auVar158 = vmovdqa64_avx512f(auVar158);
      auVar158 = vmovdqa64_avx512f(auVar158);
      auVar160 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
      local_1800 = vmovdqa64_avx512f(auVar158);
      local_1840 = vmovdqa64_avx512f(auVar160);
      auVar158 = vmovdqa64_avx512f(local_1800);
      auVar160 = vmovdqa64_avx512f(local_1840);
      auVar158 = vpaddd_avx512f(auVar158,auVar160);
      auVar158 = vmovdqa64_avx512f(auVar158);
      auVar158 = vmovdqa64_avx512f(auVar158);
      local_1780 = vmovdqa64_avx512f(auVar158);
      local_1784 = 0x17;
      auVar158 = vmovdqa64_avx512f(local_1780);
      auVar158 = vpslld_avx512f(auVar158,ZEXT416(0x17));
      local_4380 = vmovdqa64_avx512f(auVar158);
      auVar158 = vmovdqa64_avx512f(local_4380);
      local_4240 = vmovdqa64_avx512f(auVar158);
      auVar158 = vmovdqa64_avx512f(local_4240);
      local_4480 = vmovdqa64_avx512f(auVar158);
      local_4440 = auVar159._0_8_;
      local_2a80 = local_4440;
      uStack_4438 = auVar159._8_8_;
      uStack_2a78 = uStack_4438;
      uStack_4430 = auVar159._16_8_;
      uStack_2a70 = uStack_4430;
      uStack_4428 = auVar159._24_8_;
      uStack_2a68 = uStack_4428;
      uStack_4420 = auVar159._32_8_;
      uStack_2a60 = uStack_4420;
      uStack_4418 = auVar159._40_8_;
      uStack_2a58 = uStack_4418;
      uStack_4410 = auVar159._48_8_;
      uStack_2a50 = uStack_4410;
      uStack_4408 = auVar159._56_8_;
      uStack_2a48 = uStack_4408;
      local_2ac0 = local_4480._0_8_;
      uStack_2ab8 = local_4480._8_8_;
      uStack_2ab0 = local_4480._16_8_;
      uStack_2aa8 = local_4480._24_8_;
      uStack_2aa0 = local_4480._32_8_;
      uStack_2a98 = local_4480._40_8_;
      uStack_2a90 = local_4480._48_8_;
      uStack_2a88 = local_4480._56_8_;
      _local_4440 = vmulps_avx512f(auVar159,local_4480);
      local_4500 = local_4440;
      uStack_44f8 = uStack_4438;
      uStack_44f0 = uStack_4430;
      uStack_44e8 = uStack_4428;
      uStack_44e0 = uStack_4420;
      uStack_44d8 = uStack_4418;
      uStack_44d0 = uStack_4410;
      uStack_44c8 = uStack_4408;
      auVar158 = vaddps_avx512f(local_4b80,_local_4440);
      local_4780[0] = 1.0;
      local_4780[1] = 1.0;
      afStack_4778[0] = 1.0;
      afStack_4778[1] = 1.0;
      afStack_4770[0] = 1.0;
      afStack_4770[1] = 1.0;
      afStack_4768[0] = 1.0;
      afStack_4768[1] = 1.0;
      afStack_4760[0] = 1.0;
      afStack_4760[1] = 1.0;
      afStack_4758[0] = 1.0;
      afStack_4758[1] = 1.0;
      afStack_4750[0] = 1.0;
      afStack_4750[1] = 1.0;
      afStack_4748[0] = 1.0;
      afStack_4748[1] = 1.0;
      local_46c0 = 0;
      uStack_46b8 = 0;
      uStack_46b0 = 0;
      uStack_46a8 = 0;
      uStack_46a0 = 0;
      uStack_4698 = 0;
      uStack_4690 = 0;
      uStack_4688 = 0;
      uVar25 = vcmpps_avx512f(auVar158,ZEXT1664(ZEXT816(0)),2);
      local_4782 = (undefined2)uVar25;
      local_4700._0_8_ = auVar158._0_8_;
      local_30c0 = local_4700._0_8_;
      local_4700._8_8_ = auVar158._8_8_;
      uStack_30b8 = local_4700._8_8_;
      local_4700._16_8_ = auVar158._16_8_;
      uStack_30b0 = local_4700._16_8_;
      local_4700._24_8_ = auVar158._24_8_;
      uStack_30a8 = local_4700._24_8_;
      local_4700._32_8_ = auVar158._32_8_;
      uStack_30a0 = local_4700._32_8_;
      local_4700._40_8_ = auVar158._40_8_;
      uStack_3098 = local_4700._40_8_;
      local_4700._48_8_ = auVar158._48_8_;
      uStack_3090 = local_4700._48_8_;
      local_4700._56_8_ = auVar158._56_8_;
      uStack_3088 = local_4700._56_8_;
      local_3100[0] = 0x800000;
      local_3100[1] = 0x800000;
      aiStack_30f8[0] = 0x800000;
      aiStack_30f8[1] = 0x800000;
      aiStack_30f0[0] = 0x800000;
      aiStack_30f0[1] = 0x800000;
      aiStack_30e8[0] = 0x800000;
      aiStack_30e8[1] = 0x800000;
      aiStack_30e0[0] = 0x800000;
      aiStack_30e0[1] = 0x800000;
      aiStack_30d8[0] = 0x800000;
      aiStack_30d8[1] = 0x800000;
      aiStack_30d0[0] = 0x800000;
      aiStack_30d0[1] = 0x800000;
      aiStack_30c8[0] = 0x800000;
      aiStack_30c8[1] = 0x800000;
      auVar49._8_4_ = 0x800000;
      auVar49._12_4_ = 0x800000;
      auVar49._0_4_ = 0x800000;
      auVar49._4_4_ = 0x800000;
      auVar49._16_4_ = 0x800000;
      auVar49._20_4_ = 0x800000;
      auVar49._24_4_ = 0x800000;
      auVar49._28_4_ = 0x800000;
      auVar49._32_4_ = 0x800000;
      auVar49._36_4_ = 0x800000;
      auVar49._40_4_ = 0x800000;
      auVar49._44_4_ = 0x800000;
      auVar49._48_4_ = 0x800000;
      auVar49._52_4_ = 0x800000;
      auVar49._56_4_ = 0x800000;
      auVar49._60_4_ = 0x800000;
      auVar159 = vmaxps_avx512f(auVar158,auVar49);
      local_4700._0_8_ = auVar159._0_8_;
      local_4640 = local_4700._0_8_;
      local_4700._8_8_ = auVar159._8_8_;
      uStack_4638 = local_4700._8_8_;
      local_4700._16_8_ = auVar159._16_8_;
      uStack_4630 = local_4700._16_8_;
      local_4700._24_8_ = auVar159._24_8_;
      uStack_4628 = local_4700._24_8_;
      local_4700._32_8_ = auVar159._32_8_;
      uStack_4620 = local_4700._32_8_;
      local_4700._40_8_ = auVar159._40_8_;
      uStack_4618 = local_4700._40_8_;
      local_4700._48_8_ = auVar159._48_8_;
      uStack_4610 = local_4700._48_8_;
      local_4700._56_8_ = auVar159._56_8_;
      uStack_4608 = local_4700._56_8_;
      local_3040 = local_4700._0_8_;
      uStack_3038 = local_4700._8_8_;
      uStack_3030 = local_4700._16_8_;
      uStack_3028 = local_4700._24_8_;
      uStack_3020 = local_4700._32_8_;
      uStack_3018 = local_4700._40_8_;
      uStack_3010 = local_4700._48_8_;
      uStack_3008 = local_4700._56_8_;
      local_3044 = 0x17;
      auVar158 = vmovdqa64_avx512f(auVar159);
      auVar158 = vpsrld_avx512f(auVar158,ZEXT416(0x17));
      auVar158 = vmovdqa64_avx512f(auVar158);
      local_2fc0 = local_4700._0_8_;
      uStack_2fb8 = local_4700._8_8_;
      uStack_2fb0 = local_4700._16_8_;
      uStack_2fa8 = local_4700._24_8_;
      uStack_2fa0 = local_4700._32_8_;
      uStack_2f98 = local_4700._40_8_;
      uStack_2f90 = local_4700._48_8_;
      uStack_2f88 = local_4700._56_8_;
      local_3000[0] = -0x7f800001;
      local_3000[1] = -0x7f800001;
      aiStack_2ff8[0] = -0x7f800001;
      aiStack_2ff8[1] = -0x7f800001;
      aiStack_2ff0[0] = -0x7f800001;
      aiStack_2ff0[1] = -0x7f800001;
      aiStack_2fe8[0] = -0x7f800001;
      aiStack_2fe8[1] = -0x7f800001;
      aiStack_2fe0[0] = -0x7f800001;
      aiStack_2fe0[1] = -0x7f800001;
      aiStack_2fd8[0] = -0x7f800001;
      aiStack_2fd8[1] = -0x7f800001;
      aiStack_2fd0[0] = -0x7f800001;
      aiStack_2fd0[1] = -0x7f800001;
      aiStack_2fc8[0] = -0x7f800001;
      aiStack_2fc8[1] = -0x7f800001;
      auVar159 = vmovdqa64_avx512f(auVar159);
      auVar50._8_4_ = -0x7f800001;
      auVar50._12_4_ = -0x7f800001;
      auVar50._0_4_ = -0x7f800001;
      auVar50._4_4_ = -0x7f800001;
      auVar50._16_4_ = -0x7f800001;
      auVar50._20_4_ = -0x7f800001;
      auVar50._24_4_ = -0x7f800001;
      auVar50._28_4_ = -0x7f800001;
      auVar50._32_4_ = -0x7f800001;
      auVar50._36_4_ = -0x7f800001;
      auVar50._40_4_ = -0x7f800001;
      auVar50._44_4_ = -0x7f800001;
      auVar50._48_4_ = -0x7f800001;
      auVar50._52_4_ = -0x7f800001;
      auVar50._56_4_ = -0x7f800001;
      auVar50._60_4_ = -0x7f800001;
      auVar160 = vmovdqa64_avx512f(auVar50);
      auVar159 = vpandd_avx512f(auVar159,auVar160);
      auVar159 = vmovdqa64_avx512f(auVar159);
      local_4700._0_8_ = auVar159._0_8_;
      local_2ec0 = local_4700._0_8_;
      local_4700._8_8_ = auVar159._8_8_;
      uStack_2eb8 = local_4700._8_8_;
      local_4700._16_8_ = auVar159._16_8_;
      uStack_2eb0 = local_4700._16_8_;
      local_4700._24_8_ = auVar159._24_8_;
      uStack_2ea8 = local_4700._24_8_;
      local_4700._32_8_ = auVar159._32_8_;
      uStack_2ea0 = local_4700._32_8_;
      local_4700._40_8_ = auVar159._40_8_;
      uStack_2e98 = local_4700._40_8_;
      local_4700._48_8_ = auVar159._48_8_;
      uStack_2e90 = local_4700._48_8_;
      local_4700._56_8_ = auVar159._56_8_;
      uStack_2e88 = local_4700._56_8_;
      local_2f00[0] = 0.5;
      local_2f00[1] = 0.5;
      afStack_2ef8[0] = 0.5;
      afStack_2ef8[1] = 0.5;
      afStack_2ef0[0] = 0.5;
      afStack_2ef0[1] = 0.5;
      afStack_2ee8[0] = 0.5;
      afStack_2ee8[1] = 0.5;
      afStack_2ee0[0] = 0.5;
      afStack_2ee0[1] = 0.5;
      afStack_2ed8[0] = 0.5;
      afStack_2ed8[1] = 0.5;
      afStack_2ed0[0] = 0.5;
      afStack_2ed0[1] = 0.5;
      afStack_2ec8[0] = 0.5;
      afStack_2ec8[1] = 0.5;
      auVar159 = vmovdqa64_avx512f(auVar159);
      auVar51._8_4_ = 0.5;
      auVar51._12_4_ = 0.5;
      auVar51._0_4_ = 0.5;
      auVar51._4_4_ = 0.5;
      auVar51._16_4_ = 0.5;
      auVar51._20_4_ = 0.5;
      auVar51._24_4_ = 0.5;
      auVar51._28_4_ = 0.5;
      auVar51._32_4_ = 0.5;
      auVar51._36_4_ = 0.5;
      auVar51._40_4_ = 0.5;
      auVar51._44_4_ = 0.5;
      auVar51._48_4_ = 0.5;
      auVar51._52_4_ = 0.5;
      auVar51._56_4_ = 0.5;
      auVar51._60_4_ = 0.5;
      auVar160 = vmovdqa64_avx512f(auVar51);
      auVar159 = vpord_avx512f(auVar159,auVar160);
      auVar159 = vmovdqa64_avx512f(auVar159);
      auVar158 = vmovdqa64_avx512f(auVar158);
      auVar160 = vmovdqa64_avx512f((undefined1  [64])_pi32_512_0x7f);
      local_2e40 = vmovdqa64_avx512f(auVar158);
      local_2e80 = vmovdqa64_avx512f(auVar160);
      auVar158 = vmovdqa64_avx512f(local_2e40);
      auVar160 = vmovdqa64_avx512f(local_2e80);
      auVar158 = vpsubd_avx512f(auVar158,auVar160);
      local_4740 = vmovdqa64_avx512f(auVar158);
      auVar158 = vmovdqa64_avx512f(local_4740);
      local_2e00 = vmovdqa64_avx512f(auVar158);
      auVar158 = vcvtdq2ps_avx512f(local_2e00);
      local_4800._0_8_ = auVar158._0_8_;
      local_4540 = local_4800._0_8_;
      local_4800._8_8_ = auVar158._8_8_;
      uStack_4538 = local_4800._8_8_;
      uStack_47f0 = auVar158._16_8_;
      uStack_4530 = uStack_47f0;
      uStack_47e8 = auVar158._24_8_;
      uStack_4528 = uStack_47e8;
      uStack_47e0 = auVar158._32_8_;
      uStack_4520 = uStack_47e0;
      uStack_47d8 = auVar158._40_8_;
      uStack_4518 = uStack_47d8;
      uStack_47d0 = auVar158._48_8_;
      uStack_4510 = uStack_47d0;
      uStack_47c8 = auVar158._56_8_;
      uStack_4508 = uStack_47c8;
      local_4580[0] = 1.0;
      local_4580[1] = 1.0;
      afStack_4578[0] = 1.0;
      afStack_4578[1] = 1.0;
      afStack_4570[0] = 1.0;
      afStack_4570[1] = 1.0;
      afStack_4568[0] = 1.0;
      afStack_4568[1] = 1.0;
      afStack_4560[0] = 1.0;
      afStack_4560[1] = 1.0;
      afStack_4558[0] = 1.0;
      afStack_4558[1] = 1.0;
      afStack_4550[0] = 1.0;
      afStack_4550[1] = 1.0;
      afStack_4548[0] = 1.0;
      afStack_4548[1] = 1.0;
      auVar160._8_4_ = 1.0;
      auVar160._12_4_ = 1.0;
      auVar160._0_4_ = 1.0;
      auVar160._4_4_ = 1.0;
      auVar160._16_4_ = 1.0;
      auVar160._20_4_ = 1.0;
      auVar160._24_4_ = 1.0;
      auVar160._28_4_ = 1.0;
      auVar160._32_4_ = 1.0;
      auVar160._36_4_ = 1.0;
      auVar160._40_4_ = 1.0;
      auVar160._44_4_ = 1.0;
      auVar160._48_4_ = 1.0;
      auVar160._52_4_ = 1.0;
      auVar160._56_4_ = 1.0;
      auVar160._60_4_ = 1.0;
      auVar158 = vaddps_avx512f(auVar158,auVar160);
      uVar24 = vcmpps_avx512f(auVar159,(undefined1  [64])_ps512_cephes_SQRTHF,1);
      local_4802 = (ushort)uVar24;
      local_4700._0_8_ = auVar159._0_8_;
      local_4140 = local_4700._0_8_;
      local_4700._8_8_ = auVar159._8_8_;
      uStack_4138 = local_4700._8_8_;
      local_4700._16_8_ = auVar159._16_8_;
      uStack_4130 = local_4700._16_8_;
      local_4700._24_8_ = auVar159._24_8_;
      uStack_4128 = local_4700._24_8_;
      local_4700._32_8_ = auVar159._32_8_;
      uStack_4120 = local_4700._32_8_;
      local_4700._40_8_ = auVar159._40_8_;
      uStack_4118 = local_4700._40_8_;
      local_4700._48_8_ = auVar159._48_8_;
      uStack_4110 = local_4700._48_8_;
      local_4700._56_8_ = auVar159._56_8_;
      uStack_4108 = local_4700._56_8_;
      local_4180[0] = 1.0;
      local_4180[1] = 1.0;
      afStack_4178[0] = 1.0;
      afStack_4178[1] = 1.0;
      afStack_4170[0] = 1.0;
      afStack_4170[1] = 1.0;
      afStack_4168[0] = 1.0;
      afStack_4168[1] = 1.0;
      afStack_4160[0] = 1.0;
      afStack_4160[1] = 1.0;
      afStack_4158[0] = 1.0;
      afStack_4158[1] = 1.0;
      afStack_4150[0] = 1.0;
      afStack_4150[1] = 1.0;
      afStack_4148[0] = 1.0;
      afStack_4148[1] = 1.0;
      auVar39._8_4_ = 1.0;
      auVar39._12_4_ = 1.0;
      auVar39._0_4_ = 1.0;
      auVar39._4_4_ = 1.0;
      auVar39._16_4_ = 1.0;
      auVar39._20_4_ = 1.0;
      auVar39._24_4_ = 1.0;
      auVar39._28_4_ = 1.0;
      auVar39._32_4_ = 1.0;
      auVar39._36_4_ = 1.0;
      auVar39._40_4_ = 1.0;
      auVar39._44_4_ = 1.0;
      auVar39._48_4_ = 1.0;
      auVar39._52_4_ = 1.0;
      auVar39._56_4_ = 1.0;
      auVar39._60_4_ = 1.0;
      local_4880 = vsubps_avx512f(auVar159,auVar39);
      local_4800._0_8_ = auVar158._0_8_;
      local_2c00 = local_4800._0_8_;
      local_4800._8_8_ = auVar158._8_8_;
      uStack_2bf8 = local_4800._8_8_;
      uStack_47f0 = auVar158._16_8_;
      uStack_2bf0 = uStack_47f0;
      uStack_47e8 = auVar158._24_8_;
      uStack_2be8 = uStack_47e8;
      uStack_47e0 = auVar158._32_8_;
      uStack_2be0 = uStack_47e0;
      uStack_47d8 = auVar158._40_8_;
      uStack_2bd8 = uStack_47d8;
      uStack_47d0 = auVar158._48_8_;
      uStack_2bd0 = uStack_47d0;
      uStack_47c8 = auVar158._56_8_;
      uStack_2bc8 = uStack_47c8;
      local_2c40[0] = 1.0;
      local_2c40[1] = 1.0;
      afStack_2c38[0] = 1.0;
      afStack_2c38[1] = 1.0;
      afStack_2c30[0] = 1.0;
      afStack_2c30[1] = 1.0;
      afStack_2c28[0] = 1.0;
      afStack_2c28[1] = 1.0;
      afStack_2c20[0] = 1.0;
      afStack_2c20[1] = 1.0;
      afStack_2c18[0] = 1.0;
      afStack_2c18[1] = 1.0;
      afStack_2c10[0] = 1.0;
      afStack_2c10[1] = 1.0;
      afStack_2c08[0] = 1.0;
      afStack_2c08[1] = 1.0;
      local_2b00 = local_4800._0_8_;
      uStack_2af8 = local_4800._8_8_;
      uStack_2af0 = uStack_47f0;
      uStack_2ae8 = uStack_47e8;
      uStack_2ae0 = uStack_47e0;
      uStack_2ad8 = uStack_47d8;
      uStack_2ad0 = uStack_47d0;
      uStack_2ac8 = uStack_47c8;
      local_2b40[0] = 1.0;
      local_2b40[1] = 1.0;
      afStack_2b38[0] = 1.0;
      afStack_2b38[1] = 1.0;
      afStack_2b30[0] = 1.0;
      afStack_2b30[1] = 1.0;
      afStack_2b28[0] = 1.0;
      afStack_2b28[1] = 1.0;
      afStack_2b20[0] = 1.0;
      afStack_2b20[1] = 1.0;
      afStack_2b18[0] = 1.0;
      afStack_2b18[1] = 1.0;
      afStack_2b10[0] = 1.0;
      afStack_2b10[1] = 1.0;
      afStack_2b08[0] = 1.0;
      afStack_2b08[1] = 1.0;
      auVar53._8_4_ = 1.0;
      auVar53._12_4_ = 1.0;
      auVar53._0_4_ = 1.0;
      auVar53._4_4_ = 1.0;
      auVar53._16_4_ = 1.0;
      auVar53._20_4_ = 1.0;
      auVar53._24_4_ = 1.0;
      auVar53._28_4_ = 1.0;
      auVar53._32_4_ = 1.0;
      auVar53._36_4_ = 1.0;
      auVar53._40_4_ = 1.0;
      auVar53._44_4_ = 1.0;
      auVar53._48_4_ = 1.0;
      auVar53._52_4_ = 1.0;
      auVar53._56_4_ = 1.0;
      auVar53._60_4_ = 1.0;
      local_2b80._0_4_ = auVar158._0_4_;
      local_2b80._4_4_ = auVar158._4_4_;
      uStack_2b78._0_4_ = auVar158._8_4_;
      uStack_2b78._4_4_ = auVar158._12_4_;
      uStack_2b70._0_4_ = auVar158._16_4_;
      uStack_2b70._4_4_ = auVar158._20_4_;
      uStack_2b68._0_4_ = auVar158._24_4_;
      uStack_2b68._4_4_ = auVar158._28_4_;
      uStack_2b60._0_4_ = auVar158._32_4_;
      uStack_2b60._4_4_ = auVar158._36_4_;
      uStack_2b58._0_4_ = auVar158._40_4_;
      uStack_2b58._4_4_ = auVar158._44_4_;
      uStack_2b50._0_4_ = auVar158._48_4_;
      uStack_2b50._4_4_ = auVar158._52_4_;
      uStack_2b48._0_4_ = auVar158._56_4_;
      uStack_2b48._4_4_ = auVar158._60_4_;
      auVar158 = vsubps_avx512f(auVar158,auVar53);
      bVar1 = (bool)((byte)uVar24 & 1);
      bVar2 = (bool)((byte)(local_4802 >> 1) & 1);
      bVar3 = (bool)((byte)(local_4802 >> 2) & 1);
      bVar4 = (bool)((byte)(local_4802 >> 3) & 1);
      bVar5 = (bool)((byte)(local_4802 >> 4) & 1);
      bVar6 = (bool)((byte)(local_4802 >> 5) & 1);
      bVar7 = (bool)((byte)(local_4802 >> 6) & 1);
      bVar8 = (bool)((byte)(local_4802 >> 7) & 1);
      bVar9 = (byte)((ulong)uVar24 >> 8);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      local_4800._4_4_ = (uint)bVar2 * auVar158._4_4_ | (uint)!bVar2 * local_2b80._4_4_;
      local_4800._0_4_ = (uint)bVar1 * auVar158._0_4_ | (uint)!bVar1 * (int)local_2b80;
      local_4800._8_4_ = (uint)bVar3 * auVar158._8_4_ | (uint)!bVar3 * (int)uStack_2b78;
      local_4800._12_4_ = (uint)bVar4 * auVar158._12_4_ | (uint)!bVar4 * uStack_2b78._4_4_;
      uStack_47f0._0_4_ = (uint)bVar5 * auVar158._16_4_ | (uint)!bVar5 * (int)uStack_2b70;
      uStack_47f0._4_4_ = (uint)bVar6 * auVar158._20_4_ | (uint)!bVar6 * uStack_2b70._4_4_;
      auVar166 = _local_4800;
      uStack_47e8._0_4_ = (uint)bVar7 * auVar158._24_4_ | (uint)!bVar7 * (int)uStack_2b68;
      uStack_47e8._4_4_ = (uint)bVar8 * auVar158._28_4_ | (uint)!bVar8 * uStack_2b68._4_4_;
      auVar16 = _local_4800;
      uStack_47e0._0_4_ =
           (uint)(bVar9 & 1) * auVar158._32_4_ | (uint)!(bool)(bVar9 & 1) * (int)uStack_2b60;
      uStack_47e0._4_4_ = (uint)bVar10 * auVar158._36_4_ | (uint)!bVar10 * uStack_2b60._4_4_;
      auVar151 = _local_4800;
      uStack_47d8._0_4_ = (uint)bVar11 * auVar158._40_4_ | (uint)!bVar11 * (int)uStack_2b58;
      uStack_47d8._4_4_ = (uint)bVar12 * auVar158._44_4_ | (uint)!bVar12 * uStack_2b58._4_4_;
      auVar152 = _local_4800;
      uStack_47d0._0_4_ = (uint)bVar13 * auVar158._48_4_ | (uint)!bVar13 * (int)uStack_2b50;
      uStack_47d0._4_4_ = (uint)bVar14 * auVar158._52_4_ | (uint)!bVar14 * uStack_2b50._4_4_;
      auVar153 = _local_4800;
      uStack_47c8._0_4_ = (uint)bVar15 * auVar158._56_4_ | (uint)!bVar15 * (int)uStack_2b48;
      uStack_47c8._4_4_ =
           (uint)(bVar9 >> 7) * auVar158._60_4_ | (uint)!(bool)(bVar9 >> 7) * uStack_2b48._4_4_;
      auVar158 = _local_4800;
      local_4040 = local_4880._0_8_;
      uStack_4038 = local_4880._8_8_;
      uStack_4030 = local_4880._16_8_;
      uStack_4028 = local_4880._24_8_;
      uStack_4020 = local_4880._32_8_;
      uStack_4018 = local_4880._40_8_;
      uStack_4010 = local_4880._48_8_;
      uStack_4008 = local_4880._56_8_;
      local_4080 = local_4700._0_8_;
      uStack_4078 = local_4700._8_8_;
      uStack_4070 = local_4700._16_8_;
      uStack_4068 = local_4700._24_8_;
      uStack_4060 = local_4700._32_8_;
      uStack_4058 = local_4700._40_8_;
      uStack_4050 = local_4700._48_8_;
      uStack_4048 = local_4700._56_8_;
      local_3f40 = local_4880._0_8_;
      uStack_3f38 = local_4880._8_8_;
      uStack_3f30 = local_4880._16_8_;
      uStack_3f28 = local_4880._24_8_;
      uStack_3f20 = local_4880._32_8_;
      uStack_3f18 = local_4880._40_8_;
      uStack_3f10 = local_4880._48_8_;
      uStack_3f08 = local_4880._56_8_;
      local_3f80 = local_4700._0_8_;
      uStack_3f78 = local_4700._8_8_;
      uStack_3f70 = local_4700._16_8_;
      uStack_3f68 = local_4700._24_8_;
      uStack_3f60 = local_4700._32_8_;
      uStack_3f58 = local_4700._40_8_;
      uStack_3f50 = local_4700._48_8_;
      uStack_3f48 = local_4700._56_8_;
      local_3fc0._0_4_ = local_4880._0_4_;
      local_3fc0._4_4_ = local_4880._4_4_;
      uStack_3fb8._0_4_ = local_4880._8_4_;
      uStack_3fb8._4_4_ = local_4880._12_4_;
      uStack_3fb0._0_4_ = local_4880._16_4_;
      uStack_3fb0._4_4_ = local_4880._20_4_;
      uStack_3fa8._0_4_ = local_4880._24_4_;
      uStack_3fa8._4_4_ = local_4880._28_4_;
      uStack_3fa0._0_4_ = local_4880._32_4_;
      uStack_3fa0._4_4_ = local_4880._36_4_;
      uStack_3f98._0_4_ = local_4880._40_4_;
      uStack_3f98._4_4_ = local_4880._44_4_;
      uStack_3f90._0_4_ = local_4880._48_4_;
      uStack_3f90._4_4_ = local_4880._52_4_;
      uStack_3f88._0_4_ = local_4880._56_4_;
      uStack_3f88._4_4_ = local_4880._60_4_;
      auVar159 = vaddps_avx512f(local_4880,auVar159);
      bVar1 = (bool)((byte)uVar24 & 1);
      bVar2 = (bool)((byte)(local_4802 >> 1) & 1);
      bVar3 = (bool)((byte)(local_4802 >> 2) & 1);
      bVar4 = (bool)((byte)(local_4802 >> 3) & 1);
      bVar5 = (bool)((byte)(local_4802 >> 4) & 1);
      bVar6 = (bool)((byte)(local_4802 >> 5) & 1);
      bVar7 = (bool)((byte)(local_4802 >> 6) & 1);
      bVar8 = (bool)((byte)(local_4802 >> 7) & 1);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      local_4700._4_4_ = (uint)bVar2 * auVar159._4_4_ | (uint)!bVar2 * local_3fc0._4_4_;
      local_4700._0_4_ = (uint)bVar1 * auVar159._0_4_ | (uint)!bVar1 * (int)local_3fc0;
      local_4700._8_4_ = (uint)bVar3 * auVar159._8_4_ | (uint)!bVar3 * (int)uStack_3fb8;
      local_4700._12_4_ = (uint)bVar4 * auVar159._12_4_ | (uint)!bVar4 * uStack_3fb8._4_4_;
      local_4700._16_4_ = (uint)bVar5 * auVar159._16_4_ | (uint)!bVar5 * (int)uStack_3fb0;
      local_4700._20_4_ = (uint)bVar6 * auVar159._20_4_ | (uint)!bVar6 * uStack_3fb0._4_4_;
      auVar154 = local_4700._0_24_;
      local_4700._24_4_ = (uint)bVar7 * auVar159._24_4_ | (uint)!bVar7 * (int)uStack_3fa8;
      local_4700._28_4_ = (uint)bVar8 * auVar159._28_4_ | (uint)!bVar8 * uStack_3fa8._4_4_;
      auVar22 = local_4700._0_32_;
      local_4700._32_4_ =
           (uint)(bVar9 & 1) * auVar159._32_4_ | (uint)!(bool)(bVar9 & 1) * (int)uStack_3fa0;
      local_4700._36_4_ = (uint)bVar10 * auVar159._36_4_ | (uint)!bVar10 * uStack_3fa0._4_4_;
      auVar155 = local_4700._0_40_;
      local_4700._40_4_ = (uint)bVar11 * auVar159._40_4_ | (uint)!bVar11 * (int)uStack_3f98;
      local_4700._44_4_ = (uint)bVar12 * auVar159._44_4_ | (uint)!bVar12 * uStack_3f98._4_4_;
      auVar156 = local_4700._0_48_;
      local_4700._48_4_ = (uint)bVar13 * auVar159._48_4_ | (uint)!bVar13 * (int)uStack_3f90;
      local_4700._52_4_ = (uint)bVar14 * auVar159._52_4_ | (uint)!bVar14 * uStack_3f90._4_4_;
      auVar157 = local_4700._0_56_;
      local_4700._56_4_ = (uint)bVar15 * auVar159._56_4_ | (uint)!bVar15 * (int)uStack_3f88;
      local_4700._60_4_ =
           (uint)(bVar9 >> 7) * auVar159._60_4_ | (uint)!(bool)(bVar9 >> 7) * uStack_3f88._4_4_;
      auVar159 = local_4700;
      local_28c0 = local_4700._0_8_;
      uStack_28b8 = local_4700._8_8_;
      local_4700._16_8_ = auVar154._16_8_;
      uStack_28b0 = local_4700._16_8_;
      local_4700._24_8_ = auVar22._24_8_;
      uStack_28a8 = local_4700._24_8_;
      local_4700._32_8_ = auVar155._32_8_;
      uStack_28a0 = local_4700._32_8_;
      local_4700._40_8_ = auVar156._40_8_;
      uStack_2898 = local_4700._40_8_;
      local_4700._48_8_ = auVar157._48_8_;
      uStack_2890 = local_4700._48_8_;
      local_4700._56_8_ = auVar159._56_8_;
      uStack_2888 = local_4700._56_8_;
      auVar56._16_8_ = local_4700._16_8_;
      auVar56._0_16_ = local_4700._0_16_;
      auVar56._24_8_ = local_4700._24_8_;
      auVar56._32_8_ = local_4700._32_8_;
      auVar56._40_8_ = local_4700._40_8_;
      auVar56._48_8_ = local_4700._48_8_;
      auVar56._56_8_ = local_4700._56_8_;
      auVar55._16_8_ = local_4700._16_8_;
      auVar55._0_16_ = local_4700._0_16_;
      auVar55._24_8_ = local_4700._24_8_;
      auVar55._32_8_ = local_4700._32_8_;
      auVar55._40_8_ = local_4700._40_8_;
      auVar55._48_8_ = local_4700._48_8_;
      auVar55._56_8_ = local_4700._56_8_;
      local_48c0 = vmulps_avx512f(auVar56,auVar55);
      uStack_48f8._0_4_ = 0.070376836;
      uStack_48f8._4_4_ = 0.070376836;
      local_4900._0_4_ = 0.070376836;
      local_4900._4_4_ = 0.070376836;
      local_1bc0[0] = 0.070376836;
      local_1bc0[1] = 0.070376836;
      afStack_1bb8[0] = 0.070376836;
      afStack_1bb8[1] = 0.070376836;
      afStack_1bb0[0] = 0.070376836;
      afStack_1bb0[1] = 0.070376836;
      afStack_1ba8[0] = 0.070376836;
      afStack_1ba8[1] = 0.070376836;
      afStack_1ba0[0] = 0.070376836;
      afStack_1ba0[1] = 0.070376836;
      afStack_1b98[0] = 0.070376836;
      afStack_1b98[1] = 0.070376836;
      afStack_1b90[0] = 0.070376836;
      afStack_1b90[1] = 0.070376836;
      afStack_1b88[0] = 0.070376836;
      afStack_1b88[1] = 0.070376836;
      local_1c00 = local_4700._0_8_;
      uStack_1bf8 = local_4700._8_8_;
      uStack_1bf0 = local_4700._16_8_;
      uStack_1be8 = local_4700._24_8_;
      uStack_1be0 = local_4700._32_8_;
      uStack_1bd8 = local_4700._40_8_;
      uStack_1bd0 = local_4700._48_8_;
      uStack_1bc8 = local_4700._56_8_;
      local_1c40[0] = -0.1151461;
      local_1c40[1] = -0.1151461;
      afStack_1c38[0] = -0.1151461;
      afStack_1c38[1] = -0.1151461;
      afStack_1c30[0] = -0.1151461;
      afStack_1c30[1] = -0.1151461;
      afStack_1c28[0] = -0.1151461;
      afStack_1c28[1] = -0.1151461;
      afStack_1c20[0] = -0.1151461;
      afStack_1c20[1] = -0.1151461;
      afStack_1c18[0] = -0.1151461;
      afStack_1c18[1] = -0.1151461;
      afStack_1c10[0] = -0.1151461;
      afStack_1c10[1] = -0.1151461;
      afStack_1c08[0] = -0.1151461;
      afStack_1c08[1] = -0.1151461;
      auVar85._16_4_ = 0.070376836;
      auVar85._20_4_ = 0.070376836;
      auVar85._0_16_ = _local_4900;
      auVar85._24_4_ = 0.070376836;
      auVar85._28_4_ = 0.070376836;
      auVar85._32_4_ = 0.070376836;
      auVar85._36_4_ = 0.070376836;
      auVar85._40_4_ = 0.070376836;
      auVar85._44_4_ = 0.070376836;
      auVar85._48_4_ = 0.070376836;
      auVar85._52_4_ = 0.070376836;
      auVar85._56_4_ = 0.070376836;
      auVar85._60_4_ = 0.070376836;
      auVar84._16_8_ = local_4700._16_8_;
      auVar84._0_16_ = local_4700._0_16_;
      auVar84._24_8_ = local_4700._24_8_;
      auVar84._32_8_ = local_4700._32_8_;
      auVar84._40_8_ = local_4700._40_8_;
      auVar84._48_8_ = local_4700._48_8_;
      auVar84._56_8_ = local_4700._56_8_;
      auVar83._8_4_ = -0.1151461;
      auVar83._12_4_ = -0.1151461;
      auVar83._0_4_ = -0.1151461;
      auVar83._4_4_ = -0.1151461;
      auVar83._16_4_ = -0.1151461;
      auVar83._20_4_ = -0.1151461;
      auVar83._24_4_ = -0.1151461;
      auVar83._28_4_ = -0.1151461;
      auVar83._32_4_ = -0.1151461;
      auVar83._36_4_ = -0.1151461;
      auVar83._40_4_ = -0.1151461;
      auVar83._44_4_ = -0.1151461;
      auVar83._48_4_ = -0.1151461;
      auVar83._52_4_ = -0.1151461;
      auVar83._56_4_ = -0.1151461;
      auVar83._60_4_ = -0.1151461;
      auVar159 = vfmadd213ps_avx512f(auVar84,auVar85,auVar83);
      local_4900 = auVar159._0_8_;
      local_1c80 = local_4900;
      uStack_48f8 = auVar159._8_8_;
      uStack_1c78 = uStack_48f8;
      uStack_48f0 = auVar159._16_8_;
      uStack_1c70 = uStack_48f0;
      uStack_48e8 = auVar159._24_8_;
      uStack_1c68 = uStack_48e8;
      uStack_48e0 = auVar159._32_8_;
      uStack_1c60 = uStack_48e0;
      uStack_48d8 = auVar159._40_8_;
      uStack_1c58 = uStack_48d8;
      uStack_48d0 = auVar159._48_8_;
      uStack_1c50 = uStack_48d0;
      uStack_48c8 = auVar159._56_8_;
      uStack_1c48 = uStack_48c8;
      local_1cc0 = local_4700._0_8_;
      uStack_1cb8 = local_4700._8_8_;
      uStack_1cb0 = local_4700._16_8_;
      uStack_1ca8 = local_4700._24_8_;
      uStack_1ca0 = local_4700._32_8_;
      uStack_1c98 = local_4700._40_8_;
      uStack_1c90 = local_4700._48_8_;
      uStack_1c88 = local_4700._56_8_;
      local_1d00[0] = 0.116769984;
      local_1d00[1] = 0.116769984;
      afStack_1cf8[0] = 0.116769984;
      afStack_1cf8[1] = 0.116769984;
      afStack_1cf0[0] = 0.116769984;
      afStack_1cf0[1] = 0.116769984;
      afStack_1ce8[0] = 0.116769984;
      afStack_1ce8[1] = 0.116769984;
      afStack_1ce0[0] = 0.116769984;
      afStack_1ce0[1] = 0.116769984;
      afStack_1cd8[0] = 0.116769984;
      afStack_1cd8[1] = 0.116769984;
      afStack_1cd0[0] = 0.116769984;
      afStack_1cd0[1] = 0.116769984;
      afStack_1cc8[0] = 0.116769984;
      afStack_1cc8[1] = 0.116769984;
      auVar82._16_8_ = local_4700._16_8_;
      auVar82._0_16_ = local_4700._0_16_;
      auVar82._24_8_ = local_4700._24_8_;
      auVar82._32_8_ = local_4700._32_8_;
      auVar82._40_8_ = local_4700._40_8_;
      auVar82._48_8_ = local_4700._48_8_;
      auVar82._56_8_ = local_4700._56_8_;
      auVar81._8_4_ = 0.116769984;
      auVar81._12_4_ = 0.116769984;
      auVar81._0_4_ = 0.116769984;
      auVar81._4_4_ = 0.116769984;
      auVar81._16_4_ = 0.116769984;
      auVar81._20_4_ = 0.116769984;
      auVar81._24_4_ = 0.116769984;
      auVar81._28_4_ = 0.116769984;
      auVar81._32_4_ = 0.116769984;
      auVar81._36_4_ = 0.116769984;
      auVar81._40_4_ = 0.116769984;
      auVar81._44_4_ = 0.116769984;
      auVar81._48_4_ = 0.116769984;
      auVar81._52_4_ = 0.116769984;
      auVar81._56_4_ = 0.116769984;
      auVar81._60_4_ = 0.116769984;
      auVar159 = vfmadd213ps_avx512f(auVar82,auVar159,auVar81);
      local_4900 = auVar159._0_8_;
      local_1d40 = local_4900;
      uStack_48f8 = auVar159._8_8_;
      uStack_1d38 = uStack_48f8;
      uStack_48f0 = auVar159._16_8_;
      uStack_1d30 = uStack_48f0;
      uStack_48e8 = auVar159._24_8_;
      uStack_1d28 = uStack_48e8;
      uStack_48e0 = auVar159._32_8_;
      uStack_1d20 = uStack_48e0;
      uStack_48d8 = auVar159._40_8_;
      uStack_1d18 = uStack_48d8;
      uStack_48d0 = auVar159._48_8_;
      uStack_1d10 = uStack_48d0;
      uStack_48c8 = auVar159._56_8_;
      uStack_1d08 = uStack_48c8;
      local_1d80 = local_4700._0_8_;
      uStack_1d78 = local_4700._8_8_;
      uStack_1d70 = local_4700._16_8_;
      uStack_1d68 = local_4700._24_8_;
      uStack_1d60 = local_4700._32_8_;
      uStack_1d58 = local_4700._40_8_;
      uStack_1d50 = local_4700._48_8_;
      uStack_1d48 = local_4700._56_8_;
      local_1dc0[0] = -0.12420141;
      local_1dc0[1] = -0.12420141;
      afStack_1db8[0] = -0.12420141;
      afStack_1db8[1] = -0.12420141;
      afStack_1db0[0] = -0.12420141;
      afStack_1db0[1] = -0.12420141;
      afStack_1da8[0] = -0.12420141;
      afStack_1da8[1] = -0.12420141;
      afStack_1da0[0] = -0.12420141;
      afStack_1da0[1] = -0.12420141;
      afStack_1d98[0] = -0.12420141;
      afStack_1d98[1] = -0.12420141;
      afStack_1d90[0] = -0.12420141;
      afStack_1d90[1] = -0.12420141;
      afStack_1d88[0] = -0.12420141;
      afStack_1d88[1] = -0.12420141;
      auVar80._16_8_ = local_4700._16_8_;
      auVar80._0_16_ = local_4700._0_16_;
      auVar80._24_8_ = local_4700._24_8_;
      auVar80._32_8_ = local_4700._32_8_;
      auVar80._40_8_ = local_4700._40_8_;
      auVar80._48_8_ = local_4700._48_8_;
      auVar80._56_8_ = local_4700._56_8_;
      auVar79._8_4_ = -0.12420141;
      auVar79._12_4_ = -0.12420141;
      auVar79._0_4_ = -0.12420141;
      auVar79._4_4_ = -0.12420141;
      auVar79._16_4_ = -0.12420141;
      auVar79._20_4_ = -0.12420141;
      auVar79._24_4_ = -0.12420141;
      auVar79._28_4_ = -0.12420141;
      auVar79._32_4_ = -0.12420141;
      auVar79._36_4_ = -0.12420141;
      auVar79._40_4_ = -0.12420141;
      auVar79._44_4_ = -0.12420141;
      auVar79._48_4_ = -0.12420141;
      auVar79._52_4_ = -0.12420141;
      auVar79._56_4_ = -0.12420141;
      auVar79._60_4_ = -0.12420141;
      auVar159 = vfmadd213ps_avx512f(auVar80,auVar159,auVar79);
      local_4900 = auVar159._0_8_;
      local_1e00 = local_4900;
      uStack_48f8 = auVar159._8_8_;
      uStack_1df8 = uStack_48f8;
      uStack_48f0 = auVar159._16_8_;
      uStack_1df0 = uStack_48f0;
      uStack_48e8 = auVar159._24_8_;
      uStack_1de8 = uStack_48e8;
      uStack_48e0 = auVar159._32_8_;
      uStack_1de0 = uStack_48e0;
      uStack_48d8 = auVar159._40_8_;
      uStack_1dd8 = uStack_48d8;
      uStack_48d0 = auVar159._48_8_;
      uStack_1dd0 = uStack_48d0;
      uStack_48c8 = auVar159._56_8_;
      uStack_1dc8 = uStack_48c8;
      local_1e40 = local_4700._0_8_;
      uStack_1e38 = local_4700._8_8_;
      uStack_1e30 = local_4700._16_8_;
      uStack_1e28 = local_4700._24_8_;
      uStack_1e20 = local_4700._32_8_;
      uStack_1e18 = local_4700._40_8_;
      uStack_1e10 = local_4700._48_8_;
      uStack_1e08 = local_4700._56_8_;
      local_1e80[0] = 0.14249323;
      local_1e80[1] = 0.14249323;
      afStack_1e78[0] = 0.14249323;
      afStack_1e78[1] = 0.14249323;
      afStack_1e70[0] = 0.14249323;
      afStack_1e70[1] = 0.14249323;
      afStack_1e68[0] = 0.14249323;
      afStack_1e68[1] = 0.14249323;
      afStack_1e60[0] = 0.14249323;
      afStack_1e60[1] = 0.14249323;
      afStack_1e58[0] = 0.14249323;
      afStack_1e58[1] = 0.14249323;
      afStack_1e50[0] = 0.14249323;
      afStack_1e50[1] = 0.14249323;
      afStack_1e48[0] = 0.14249323;
      afStack_1e48[1] = 0.14249323;
      auVar78._16_8_ = local_4700._16_8_;
      auVar78._0_16_ = local_4700._0_16_;
      auVar78._24_8_ = local_4700._24_8_;
      auVar78._32_8_ = local_4700._32_8_;
      auVar78._40_8_ = local_4700._40_8_;
      auVar78._48_8_ = local_4700._48_8_;
      auVar78._56_8_ = local_4700._56_8_;
      auVar77._8_4_ = 0.14249323;
      auVar77._12_4_ = 0.14249323;
      auVar77._0_4_ = 0.14249323;
      auVar77._4_4_ = 0.14249323;
      auVar77._16_4_ = 0.14249323;
      auVar77._20_4_ = 0.14249323;
      auVar77._24_4_ = 0.14249323;
      auVar77._28_4_ = 0.14249323;
      auVar77._32_4_ = 0.14249323;
      auVar77._36_4_ = 0.14249323;
      auVar77._40_4_ = 0.14249323;
      auVar77._44_4_ = 0.14249323;
      auVar77._48_4_ = 0.14249323;
      auVar77._52_4_ = 0.14249323;
      auVar77._56_4_ = 0.14249323;
      auVar77._60_4_ = 0.14249323;
      auVar159 = vfmadd213ps_avx512f(auVar78,auVar159,auVar77);
      local_4900 = auVar159._0_8_;
      local_1ec0 = local_4900;
      uStack_48f8 = auVar159._8_8_;
      uStack_1eb8 = uStack_48f8;
      uStack_48f0 = auVar159._16_8_;
      uStack_1eb0 = uStack_48f0;
      uStack_48e8 = auVar159._24_8_;
      uStack_1ea8 = uStack_48e8;
      uStack_48e0 = auVar159._32_8_;
      uStack_1ea0 = uStack_48e0;
      uStack_48d8 = auVar159._40_8_;
      uStack_1e98 = uStack_48d8;
      uStack_48d0 = auVar159._48_8_;
      uStack_1e90 = uStack_48d0;
      uStack_48c8 = auVar159._56_8_;
      uStack_1e88 = uStack_48c8;
      local_1f00 = local_4700._0_8_;
      uStack_1ef8 = local_4700._8_8_;
      uStack_1ef0 = local_4700._16_8_;
      uStack_1ee8 = local_4700._24_8_;
      uStack_1ee0 = local_4700._32_8_;
      uStack_1ed8 = local_4700._40_8_;
      uStack_1ed0 = local_4700._48_8_;
      uStack_1ec8 = local_4700._56_8_;
      local_1f40[0] = -0.16668057;
      local_1f40[1] = -0.16668057;
      afStack_1f38[0] = -0.16668057;
      afStack_1f38[1] = -0.16668057;
      afStack_1f30[0] = -0.16668057;
      afStack_1f30[1] = -0.16668057;
      afStack_1f28[0] = -0.16668057;
      afStack_1f28[1] = -0.16668057;
      afStack_1f20[0] = -0.16668057;
      afStack_1f20[1] = -0.16668057;
      afStack_1f18[0] = -0.16668057;
      afStack_1f18[1] = -0.16668057;
      afStack_1f10[0] = -0.16668057;
      afStack_1f10[1] = -0.16668057;
      afStack_1f08[0] = -0.16668057;
      afStack_1f08[1] = -0.16668057;
      auVar76._16_8_ = local_4700._16_8_;
      auVar76._0_16_ = local_4700._0_16_;
      auVar76._24_8_ = local_4700._24_8_;
      auVar76._32_8_ = local_4700._32_8_;
      auVar76._40_8_ = local_4700._40_8_;
      auVar76._48_8_ = local_4700._48_8_;
      auVar76._56_8_ = local_4700._56_8_;
      auVar75._8_4_ = -0.16668057;
      auVar75._12_4_ = -0.16668057;
      auVar75._0_4_ = -0.16668057;
      auVar75._4_4_ = -0.16668057;
      auVar75._16_4_ = -0.16668057;
      auVar75._20_4_ = -0.16668057;
      auVar75._24_4_ = -0.16668057;
      auVar75._28_4_ = -0.16668057;
      auVar75._32_4_ = -0.16668057;
      auVar75._36_4_ = -0.16668057;
      auVar75._40_4_ = -0.16668057;
      auVar75._44_4_ = -0.16668057;
      auVar75._48_4_ = -0.16668057;
      auVar75._52_4_ = -0.16668057;
      auVar75._56_4_ = -0.16668057;
      auVar75._60_4_ = -0.16668057;
      auVar159 = vfmadd213ps_avx512f(auVar76,auVar159,auVar75);
      local_4900 = auVar159._0_8_;
      local_1f80 = local_4900;
      uStack_48f8 = auVar159._8_8_;
      uStack_1f78 = uStack_48f8;
      uStack_48f0 = auVar159._16_8_;
      uStack_1f70 = uStack_48f0;
      uStack_48e8 = auVar159._24_8_;
      uStack_1f68 = uStack_48e8;
      uStack_48e0 = auVar159._32_8_;
      uStack_1f60 = uStack_48e0;
      uStack_48d8 = auVar159._40_8_;
      uStack_1f58 = uStack_48d8;
      uStack_48d0 = auVar159._48_8_;
      uStack_1f50 = uStack_48d0;
      uStack_48c8 = auVar159._56_8_;
      uStack_1f48 = uStack_48c8;
      local_1fc0 = local_4700._0_8_;
      uStack_1fb8 = local_4700._8_8_;
      uStack_1fb0 = local_4700._16_8_;
      uStack_1fa8 = local_4700._24_8_;
      uStack_1fa0 = local_4700._32_8_;
      uStack_1f98 = local_4700._40_8_;
      uStack_1f90 = local_4700._48_8_;
      uStack_1f88 = local_4700._56_8_;
      local_2000[0] = 0.20000714;
      local_2000[1] = 0.20000714;
      afStack_1ff8[0] = 0.20000714;
      afStack_1ff8[1] = 0.20000714;
      afStack_1ff0[0] = 0.20000714;
      afStack_1ff0[1] = 0.20000714;
      afStack_1fe8[0] = 0.20000714;
      afStack_1fe8[1] = 0.20000714;
      afStack_1fe0[0] = 0.20000714;
      afStack_1fe0[1] = 0.20000714;
      afStack_1fd8[0] = 0.20000714;
      afStack_1fd8[1] = 0.20000714;
      afStack_1fd0[0] = 0.20000714;
      afStack_1fd0[1] = 0.20000714;
      afStack_1fc8[0] = 0.20000714;
      afStack_1fc8[1] = 0.20000714;
      auVar74._16_8_ = local_4700._16_8_;
      auVar74._0_16_ = local_4700._0_16_;
      auVar74._24_8_ = local_4700._24_8_;
      auVar74._32_8_ = local_4700._32_8_;
      auVar74._40_8_ = local_4700._40_8_;
      auVar74._48_8_ = local_4700._48_8_;
      auVar74._56_8_ = local_4700._56_8_;
      auVar73._8_4_ = 0.20000714;
      auVar73._12_4_ = 0.20000714;
      auVar73._0_4_ = 0.20000714;
      auVar73._4_4_ = 0.20000714;
      auVar73._16_4_ = 0.20000714;
      auVar73._20_4_ = 0.20000714;
      auVar73._24_4_ = 0.20000714;
      auVar73._28_4_ = 0.20000714;
      auVar73._32_4_ = 0.20000714;
      auVar73._36_4_ = 0.20000714;
      auVar73._40_4_ = 0.20000714;
      auVar73._44_4_ = 0.20000714;
      auVar73._48_4_ = 0.20000714;
      auVar73._52_4_ = 0.20000714;
      auVar73._56_4_ = 0.20000714;
      auVar73._60_4_ = 0.20000714;
      auVar159 = vfmadd213ps_avx512f(auVar74,auVar159,auVar73);
      local_4900 = auVar159._0_8_;
      local_2040 = local_4900;
      uStack_48f8 = auVar159._8_8_;
      uStack_2038 = uStack_48f8;
      uStack_48f0 = auVar159._16_8_;
      uStack_2030 = uStack_48f0;
      uStack_48e8 = auVar159._24_8_;
      uStack_2028 = uStack_48e8;
      uStack_48e0 = auVar159._32_8_;
      uStack_2020 = uStack_48e0;
      uStack_48d8 = auVar159._40_8_;
      uStack_2018 = uStack_48d8;
      uStack_48d0 = auVar159._48_8_;
      uStack_2010 = uStack_48d0;
      uStack_48c8 = auVar159._56_8_;
      uStack_2008 = uStack_48c8;
      local_2080 = local_4700._0_8_;
      uStack_2078 = local_4700._8_8_;
      uStack_2070 = local_4700._16_8_;
      uStack_2068 = local_4700._24_8_;
      uStack_2060 = local_4700._32_8_;
      uStack_2058 = local_4700._40_8_;
      uStack_2050 = local_4700._48_8_;
      uStack_2048 = local_4700._56_8_;
      local_20c0[0] = -0.24999994;
      local_20c0[1] = -0.24999994;
      afStack_20b8[0] = -0.24999994;
      afStack_20b8[1] = -0.24999994;
      afStack_20b0[0] = -0.24999994;
      afStack_20b0[1] = -0.24999994;
      afStack_20a8[0] = -0.24999994;
      afStack_20a8[1] = -0.24999994;
      afStack_20a0[0] = -0.24999994;
      afStack_20a0[1] = -0.24999994;
      afStack_2098[0] = -0.24999994;
      afStack_2098[1] = -0.24999994;
      afStack_2090[0] = -0.24999994;
      afStack_2090[1] = -0.24999994;
      afStack_2088[0] = -0.24999994;
      afStack_2088[1] = -0.24999994;
      auVar72._16_8_ = local_4700._16_8_;
      auVar72._0_16_ = local_4700._0_16_;
      auVar72._24_8_ = local_4700._24_8_;
      auVar72._32_8_ = local_4700._32_8_;
      auVar72._40_8_ = local_4700._40_8_;
      auVar72._48_8_ = local_4700._48_8_;
      auVar72._56_8_ = local_4700._56_8_;
      auVar71._8_4_ = -0.24999994;
      auVar71._12_4_ = -0.24999994;
      auVar71._0_4_ = -0.24999994;
      auVar71._4_4_ = -0.24999994;
      auVar71._16_4_ = -0.24999994;
      auVar71._20_4_ = -0.24999994;
      auVar71._24_4_ = -0.24999994;
      auVar71._28_4_ = -0.24999994;
      auVar71._32_4_ = -0.24999994;
      auVar71._36_4_ = -0.24999994;
      auVar71._40_4_ = -0.24999994;
      auVar71._44_4_ = -0.24999994;
      auVar71._48_4_ = -0.24999994;
      auVar71._52_4_ = -0.24999994;
      auVar71._56_4_ = -0.24999994;
      auVar71._60_4_ = -0.24999994;
      auVar159 = vfmadd213ps_avx512f(auVar72,auVar159,auVar71);
      local_4900 = auVar159._0_8_;
      local_2100 = local_4900;
      uStack_48f8 = auVar159._8_8_;
      uStack_20f8 = uStack_48f8;
      uStack_48f0 = auVar159._16_8_;
      uStack_20f0 = uStack_48f0;
      uStack_48e8 = auVar159._24_8_;
      uStack_20e8 = uStack_48e8;
      uStack_48e0 = auVar159._32_8_;
      uStack_20e0 = uStack_48e0;
      uStack_48d8 = auVar159._40_8_;
      uStack_20d8 = uStack_48d8;
      uStack_48d0 = auVar159._48_8_;
      uStack_20d0 = uStack_48d0;
      uStack_48c8 = auVar159._56_8_;
      uStack_20c8 = uStack_48c8;
      local_2140 = local_4700._0_8_;
      uStack_2138 = local_4700._8_8_;
      uStack_2130 = local_4700._16_8_;
      uStack_2128 = local_4700._24_8_;
      uStack_2120 = local_4700._32_8_;
      uStack_2118 = local_4700._40_8_;
      uStack_2110 = local_4700._48_8_;
      uStack_2108 = local_4700._56_8_;
      local_2180[0] = 0.3333333;
      local_2180[1] = 0.3333333;
      afStack_2178[0] = 0.3333333;
      afStack_2178[1] = 0.3333333;
      afStack_2170[0] = 0.3333333;
      afStack_2170[1] = 0.3333333;
      afStack_2168[0] = 0.3333333;
      afStack_2168[1] = 0.3333333;
      afStack_2160[0] = 0.3333333;
      afStack_2160[1] = 0.3333333;
      afStack_2158[0] = 0.3333333;
      afStack_2158[1] = 0.3333333;
      afStack_2150[0] = 0.3333333;
      afStack_2150[1] = 0.3333333;
      afStack_2148[0] = 0.3333333;
      afStack_2148[1] = 0.3333333;
      auVar70._16_8_ = local_4700._16_8_;
      auVar70._0_16_ = local_4700._0_16_;
      auVar70._24_8_ = local_4700._24_8_;
      auVar70._32_8_ = local_4700._32_8_;
      auVar70._40_8_ = local_4700._40_8_;
      auVar70._48_8_ = local_4700._48_8_;
      auVar70._56_8_ = local_4700._56_8_;
      auVar69._8_4_ = 0.3333333;
      auVar69._12_4_ = 0.3333333;
      auVar69._0_4_ = 0.3333333;
      auVar69._4_4_ = 0.3333333;
      auVar69._16_4_ = 0.3333333;
      auVar69._20_4_ = 0.3333333;
      auVar69._24_4_ = 0.3333333;
      auVar69._28_4_ = 0.3333333;
      auVar69._32_4_ = 0.3333333;
      auVar69._36_4_ = 0.3333333;
      auVar69._40_4_ = 0.3333333;
      auVar69._44_4_ = 0.3333333;
      auVar69._48_4_ = 0.3333333;
      auVar69._52_4_ = 0.3333333;
      auVar69._56_4_ = 0.3333333;
      auVar69._60_4_ = 0.3333333;
      auVar159 = vfmadd213ps_avx512f(auVar70,auVar159,auVar69);
      local_4900 = auVar159._0_8_;
      local_2900 = local_4900;
      uStack_48f8 = auVar159._8_8_;
      uStack_28f8 = uStack_48f8;
      uStack_48f0 = auVar159._16_8_;
      uStack_28f0 = uStack_48f0;
      uStack_48e8 = auVar159._24_8_;
      uStack_28e8 = uStack_48e8;
      uStack_48e0 = auVar159._32_8_;
      uStack_28e0 = uStack_48e0;
      uStack_48d8 = auVar159._40_8_;
      uStack_28d8 = uStack_48d8;
      uStack_48d0 = auVar159._48_8_;
      uStack_28d0 = uStack_48d0;
      uStack_48c8 = auVar159._56_8_;
      uStack_28c8 = uStack_48c8;
      local_2940 = local_4700._0_8_;
      uStack_2938 = local_4700._8_8_;
      uStack_2930 = local_4700._16_8_;
      uStack_2928 = local_4700._24_8_;
      uStack_2920 = local_4700._32_8_;
      uStack_2918 = local_4700._40_8_;
      uStack_2910 = local_4700._48_8_;
      uStack_2908 = local_4700._56_8_;
      auVar54._16_8_ = local_4700._16_8_;
      auVar54._0_16_ = local_4700._0_16_;
      auVar54._24_8_ = local_4700._24_8_;
      auVar54._32_8_ = local_4700._32_8_;
      auVar54._40_8_ = local_4700._40_8_;
      auVar54._48_8_ = local_4700._48_8_;
      auVar54._56_8_ = local_4700._56_8_;
      auVar159 = vmulps_avx512f(auVar159,auVar54);
      local_4900 = auVar159._0_8_;
      local_2980 = local_4900;
      uStack_48f8 = auVar159._8_8_;
      uStack_2978 = uStack_48f8;
      uStack_48f0 = auVar159._16_8_;
      uStack_2970 = uStack_48f0;
      uStack_48e8 = auVar159._24_8_;
      uStack_2968 = uStack_48e8;
      uStack_48e0 = auVar159._32_8_;
      uStack_2960 = uStack_48e0;
      uStack_48d8 = auVar159._40_8_;
      uStack_2958 = uStack_48d8;
      uStack_48d0 = auVar159._48_8_;
      uStack_2950 = uStack_48d0;
      uStack_48c8 = auVar159._56_8_;
      uStack_2948 = uStack_48c8;
      local_29c0 = local_48c0._0_8_;
      uStack_29b8 = local_48c0._8_8_;
      uStack_29b0 = local_48c0._16_8_;
      uStack_29a8 = local_48c0._24_8_;
      uStack_29a0 = local_48c0._32_8_;
      uStack_2998 = local_48c0._40_8_;
      uStack_2990 = local_48c0._48_8_;
      uStack_2988 = local_48c0._56_8_;
      auVar159 = vmulps_avx512f(auVar159,local_48c0);
      local_21c0 = local_4800._0_8_;
      uStack_21b8 = local_4800._8_8_;
      uStack_47f0 = auVar166._16_8_;
      uStack_21b0 = uStack_47f0;
      uStack_47e8 = auVar16._24_8_;
      uStack_21a8 = uStack_47e8;
      uStack_47e0 = auVar151._32_8_;
      uStack_21a0 = uStack_47e0;
      uStack_47d8 = auVar152._40_8_;
      uStack_2198 = uStack_47d8;
      uStack_47d0 = auVar153._48_8_;
      uStack_2190 = uStack_47d0;
      uStack_47c8 = auVar158._56_8_;
      uStack_2188 = uStack_47c8;
      local_2200[0] = -0.00021219444;
      local_2200[1] = -0.00021219444;
      afStack_21f8[0] = -0.00021219444;
      afStack_21f8[1] = -0.00021219444;
      afStack_21f0[0] = -0.00021219444;
      afStack_21f0[1] = -0.00021219444;
      afStack_21e8[0] = -0.00021219444;
      afStack_21e8[1] = -0.00021219444;
      afStack_21e0[0] = -0.00021219444;
      afStack_21e0[1] = -0.00021219444;
      afStack_21d8[0] = -0.00021219444;
      afStack_21d8[1] = -0.00021219444;
      afStack_21d0[0] = -0.00021219444;
      afStack_21d0[1] = -0.00021219444;
      afStack_21c8[0] = -0.00021219444;
      afStack_21c8[1] = -0.00021219444;
      local_4900 = auVar159._0_8_;
      local_2240 = local_4900;
      uStack_48f8 = auVar159._8_8_;
      uStack_2238 = uStack_48f8;
      uStack_48f0 = auVar159._16_8_;
      uStack_2230 = uStack_48f0;
      uStack_48e8 = auVar159._24_8_;
      uStack_2228 = uStack_48e8;
      uStack_48e0 = auVar159._32_8_;
      uStack_2220 = uStack_48e0;
      uStack_48d8 = auVar159._40_8_;
      uStack_2218 = uStack_48d8;
      uStack_48d0 = auVar159._48_8_;
      uStack_2210 = uStack_48d0;
      uStack_48c8 = auVar159._56_8_;
      uStack_2208 = uStack_48c8;
      auVar68._16_8_ = uStack_47f0;
      auVar68._0_16_ = local_4800;
      auVar68._24_8_ = uStack_47e8;
      auVar68._32_8_ = uStack_47e0;
      auVar68._40_8_ = uStack_47d8;
      auVar68._48_8_ = uStack_47d0;
      auVar68._56_8_ = uStack_47c8;
      auVar67._8_4_ = -0.00021219444;
      auVar67._12_4_ = -0.00021219444;
      auVar67._0_4_ = -0.00021219444;
      auVar67._4_4_ = -0.00021219444;
      auVar67._16_4_ = -0.00021219444;
      auVar67._20_4_ = -0.00021219444;
      auVar67._24_4_ = -0.00021219444;
      auVar67._28_4_ = -0.00021219444;
      auVar67._32_4_ = -0.00021219444;
      auVar67._36_4_ = -0.00021219444;
      auVar67._40_4_ = -0.00021219444;
      auVar67._44_4_ = -0.00021219444;
      auVar67._48_4_ = -0.00021219444;
      auVar67._52_4_ = -0.00021219444;
      auVar67._56_4_ = -0.00021219444;
      auVar67._60_4_ = -0.00021219444;
      auVar159 = vfmadd213ps_avx512f(auVar67,auVar68,auVar159);
      local_1980 = local_48c0._0_8_;
      uStack_1978 = local_48c0._8_8_;
      uStack_1970 = local_48c0._16_8_;
      uStack_1968 = local_48c0._24_8_;
      uStack_1960 = local_48c0._32_8_;
      uStack_1958 = local_48c0._40_8_;
      uStack_1950 = local_48c0._48_8_;
      uStack_1948 = local_48c0._56_8_;
      local_19c0[0] = 0.5;
      local_19c0[1] = 0.5;
      afStack_19b8[0] = 0.5;
      afStack_19b8[1] = 0.5;
      afStack_19b0[0] = 0.5;
      afStack_19b0[1] = 0.5;
      afStack_19a8[0] = 0.5;
      afStack_19a8[1] = 0.5;
      afStack_19a0[0] = 0.5;
      afStack_19a0[1] = 0.5;
      afStack_1998[0] = 0.5;
      afStack_1998[1] = 0.5;
      afStack_1990[0] = 0.5;
      afStack_1990[1] = 0.5;
      afStack_1988[0] = 0.5;
      afStack_1988[1] = 0.5;
      local_4900 = auVar159._0_8_;
      local_1a00 = local_4900;
      uStack_48f8 = auVar159._8_8_;
      uStack_19f8 = uStack_48f8;
      uStack_48f0 = auVar159._16_8_;
      uStack_19f0 = uStack_48f0;
      uStack_48e8 = auVar159._24_8_;
      uStack_19e8 = uStack_48e8;
      uStack_48e0 = auVar159._32_8_;
      uStack_19e0 = uStack_48e0;
      uStack_48d8 = auVar159._40_8_;
      uStack_19d8 = uStack_48d8;
      uStack_48d0 = auVar159._48_8_;
      uStack_19d0 = uStack_48d0;
      uStack_48c8 = auVar159._56_8_;
      uStack_19c8 = uStack_48c8;
      auVar90._8_4_ = 0.5;
      auVar90._12_4_ = 0.5;
      auVar90._0_4_ = 0.5;
      auVar90._4_4_ = 0.5;
      auVar90._16_4_ = 0.5;
      auVar90._20_4_ = 0.5;
      auVar90._24_4_ = 0.5;
      auVar90._28_4_ = 0.5;
      auVar90._32_4_ = 0.5;
      auVar90._36_4_ = 0.5;
      auVar90._40_4_ = 0.5;
      auVar90._44_4_ = 0.5;
      auVar90._48_4_ = 0.5;
      auVar90._52_4_ = 0.5;
      auVar90._56_4_ = 0.5;
      auVar90._60_4_ = 0.5;
      auVar160 = vfnmadd213ps_avx512f(auVar90,local_48c0,auVar159);
      local_45c0 = local_4700._0_8_;
      uStack_45b8 = local_4700._8_8_;
      uStack_45b0 = local_4700._16_8_;
      uStack_45a8 = local_4700._24_8_;
      uStack_45a0 = local_4700._32_8_;
      uStack_4598 = local_4700._40_8_;
      uStack_4590 = local_4700._48_8_;
      uStack_4588 = local_4700._56_8_;
      local_4900 = auVar160._0_8_;
      local_4600 = local_4900;
      uStack_48f8 = auVar160._8_8_;
      uStack_45f8 = uStack_48f8;
      uStack_48f0 = auVar160._16_8_;
      uStack_45f0 = uStack_48f0;
      uStack_48e8 = auVar160._24_8_;
      uStack_45e8 = uStack_48e8;
      uStack_48e0 = auVar160._32_8_;
      uStack_45e0 = uStack_48e0;
      uStack_48d8 = auVar160._40_8_;
      uStack_45d8 = uStack_48d8;
      uStack_48d0 = auVar160._48_8_;
      uStack_45d0 = uStack_48d0;
      uStack_48c8 = auVar160._56_8_;
      uStack_45c8 = uStack_48c8;
      auVar159._16_8_ = local_4700._16_8_;
      auVar159._0_16_ = local_4700._0_16_;
      auVar159._24_8_ = local_4700._24_8_;
      auVar159._32_8_ = local_4700._32_8_;
      auVar159._40_8_ = local_4700._40_8_;
      auVar159._48_8_ = local_4700._48_8_;
      auVar159._56_8_ = local_4700._56_8_;
      auVar159 = vaddps_avx512f(auVar159,auVar160);
      local_2280 = local_4800._0_8_;
      uStack_2278 = local_4800._8_8_;
      uStack_2270 = uStack_47f0;
      uStack_2268 = uStack_47e8;
      uStack_2260 = uStack_47e0;
      uStack_2258 = uStack_47d8;
      uStack_2250 = uStack_47d0;
      uStack_2248 = uStack_47c8;
      local_22c0[0] = 0.6933594;
      local_22c0[1] = 0.6933594;
      afStack_22b8[0] = 0.6933594;
      afStack_22b8[1] = 0.6933594;
      afStack_22b0[0] = 0.6933594;
      afStack_22b0[1] = 0.6933594;
      afStack_22a8[0] = 0.6933594;
      afStack_22a8[1] = 0.6933594;
      afStack_22a0[0] = 0.6933594;
      afStack_22a0[1] = 0.6933594;
      afStack_2298[0] = 0.6933594;
      afStack_2298[1] = 0.6933594;
      afStack_2290[0] = 0.6933594;
      afStack_2290[1] = 0.6933594;
      afStack_2288[0] = 0.6933594;
      afStack_2288[1] = 0.6933594;
      local_4700._0_8_ = auVar159._0_8_;
      local_2300 = local_4700._0_8_;
      local_4700._8_8_ = auVar159._8_8_;
      uStack_22f8 = local_4700._8_8_;
      local_4700._16_8_ = auVar159._16_8_;
      uStack_22f0 = local_4700._16_8_;
      local_4700._24_8_ = auVar159._24_8_;
      uStack_22e8 = local_4700._24_8_;
      local_4700._32_8_ = auVar159._32_8_;
      uStack_22e0 = local_4700._32_8_;
      local_4700._40_8_ = auVar159._40_8_;
      uStack_22d8 = local_4700._40_8_;
      local_4700._48_8_ = auVar159._48_8_;
      uStack_22d0 = local_4700._48_8_;
      local_4700._56_8_ = auVar159._56_8_;
      uStack_22c8 = local_4700._56_8_;
      auVar66._16_8_ = uStack_47f0;
      auVar66._0_16_ = local_4800;
      auVar66._24_8_ = uStack_47e8;
      auVar66._32_8_ = uStack_47e0;
      auVar66._40_8_ = uStack_47d8;
      auVar66._48_8_ = uStack_47d0;
      auVar66._56_8_ = uStack_47c8;
      auVar65._8_4_ = 0.6933594;
      auVar65._12_4_ = 0.6933594;
      auVar65._0_4_ = 0.6933594;
      auVar65._4_4_ = 0.6933594;
      auVar65._16_4_ = 0.6933594;
      auVar65._20_4_ = 0.6933594;
      auVar65._24_4_ = 0.6933594;
      auVar65._28_4_ = 0.6933594;
      auVar65._32_4_ = 0.6933594;
      auVar65._36_4_ = 0.6933594;
      auVar65._40_4_ = 0.6933594;
      auVar65._44_4_ = 0.6933594;
      auVar65._48_4_ = 0.6933594;
      auVar65._52_4_ = 0.6933594;
      auVar65._56_4_ = 0.6933594;
      auVar65._60_4_ = 0.6933594;
      local_4700 = vfmadd213ps_avx512f(auVar65,auVar66,auVar159);
      local_2f40 = local_4700._0_8_;
      uStack_2f38 = local_4700._8_8_;
      uStack_2f30 = local_4700._16_8_;
      uStack_2f28 = local_4700._24_8_;
      uStack_2f20 = local_4700._32_8_;
      uStack_2f18 = local_4700._40_8_;
      uStack_2f10 = local_4700._48_8_;
      uStack_2f08 = local_4700._56_8_;
      auVar159 = vpmovm2d_avx512dq(uVar25 & 0xffff);
      local_4680 = vmovdqa64_avx512f(auVar159);
      auVar159 = vmovdqa64_avx512f(local_4680);
      local_2f80 = vmovdqa64_avx512f(auVar159);
      auVar159 = vmovdqa64_avx512f(local_4700);
      auVar160 = vmovdqa64_avx512f(local_2f80);
      auVar159 = vpord_avx512f(auVar159,auVar160);
      _local_4900 = vmovdqa64_avx512f(auVar159);
      local_3ec0 = local_4900;
      uStack_3eb8 = uStack_48f8;
      uStack_3eb0 = uStack_48f0;
      uStack_3ea8 = uStack_48e8;
      uStack_3ea0 = uStack_48e0;
      uStack_3e98 = uStack_48d8;
      uStack_3e90 = uStack_48d0;
      uStack_3e88 = uStack_48c8;
      local_3dc0 = local_4900;
      uStack_3db8 = uStack_48f8;
      uStack_3db0 = uStack_48f0;
      uStack_3da8 = uStack_48e8;
      uStack_3da0 = uStack_48e0;
      uStack_3d98 = uStack_48d8;
      uStack_3d90 = uStack_48d0;
      uStack_3d88 = uStack_48c8;
      local_3e40._0_4_ = local_4900._0_4_;
      local_3e40._4_4_ = local_4900._4_4_;
      uStack_3e38._0_4_ = local_4900._8_4_;
      uStack_3e38._4_4_ = local_4900._12_4_;
      uStack_3e30._0_4_ = local_4900._16_4_;
      uStack_3e30._4_4_ = local_4900._20_4_;
      uStack_3e28._0_4_ = local_4900._24_4_;
      uStack_3e28._4_4_ = local_4900._28_4_;
      uStack_3e20._0_4_ = local_4900._32_4_;
      uStack_3e20._4_4_ = local_4900._36_4_;
      uStack_3e18._0_4_ = local_4900._40_4_;
      uStack_3e18._4_4_ = local_4900._44_4_;
      uStack_3e10._0_4_ = local_4900._48_4_;
      uStack_3e10._4_4_ = local_4900._52_4_;
      uStack_3e08._0_4_ = local_4900._56_4_;
      uStack_3e08._4_4_ = local_4900._60_4_;
      auVar159 = vaddps_avx512f(_local_4900,*local_4bf8);
      bVar1 = (bool)((byte)uVar23 & 1);
      bVar2 = (bool)((byte)(local_3e42 >> 1) & 1);
      bVar3 = (bool)((byte)(local_3e42 >> 2) & 1);
      bVar4 = (bool)((byte)(local_3e42 >> 3) & 1);
      bVar5 = (bool)((byte)(local_3e42 >> 4) & 1);
      bVar6 = (bool)((byte)(local_3e42 >> 5) & 1);
      bVar7 = (bool)((byte)(local_3e42 >> 6) & 1);
      bVar8 = (bool)((byte)(local_3e42 >> 7) & 1);
      bVar9 = (byte)((ulong)uVar23 >> 8);
      bVar10 = (bool)(bVar9 >> 1 & 1);
      bVar11 = (bool)(bVar9 >> 2 & 1);
      bVar12 = (bool)(bVar9 >> 3 & 1);
      bVar13 = (bool)(bVar9 >> 4 & 1);
      bVar14 = (bool)(bVar9 >> 5 & 1);
      bVar15 = (bool)(bVar9 >> 6 & 1);
      local_3d10 = local_4bf8;
      local_3d80 = CONCAT44((uint)bVar2 * auVar159._4_4_ | (uint)!bVar2 * local_3e40._4_4_,
                            (uint)bVar1 * auVar159._0_4_ | (uint)!bVar1 * (int)local_3e40);
      uStack_3d78 = CONCAT44((uint)bVar4 * auVar159._12_4_ | (uint)!bVar4 * uStack_3e38._4_4_,
                             (uint)bVar3 * auVar159._8_4_ | (uint)!bVar3 * (int)uStack_3e38);
      uStack_3d70 = CONCAT44((uint)bVar6 * auVar159._20_4_ | (uint)!bVar6 * uStack_3e30._4_4_,
                             (uint)bVar5 * auVar159._16_4_ | (uint)!bVar5 * (int)uStack_3e30);
      uStack_3d68 = CONCAT44((uint)bVar8 * auVar159._28_4_ | (uint)!bVar8 * uStack_3e28._4_4_,
                             (uint)bVar7 * auVar159._24_4_ | (uint)!bVar7 * (int)uStack_3e28);
      uStack_3d60 = CONCAT44((uint)bVar10 * auVar159._36_4_ | (uint)!bVar10 * uStack_3e20._4_4_,
                             (uint)(bVar9 & 1) * auVar159._32_4_ |
                             (uint)!(bool)(bVar9 & 1) * (int)uStack_3e20);
      uStack_3d58 = CONCAT44((uint)bVar12 * auVar159._44_4_ | (uint)!bVar12 * uStack_3e18._4_4_,
                             (uint)bVar11 * auVar159._40_4_ | (uint)!bVar11 * (int)uStack_3e18);
      uStack_3d50 = CONCAT44((uint)bVar14 * auVar159._52_4_ | (uint)!bVar14 * uStack_3e10._4_4_,
                             (uint)bVar13 * auVar159._48_4_ | (uint)!bVar13 * (int)uStack_3e10);
      uStack_3d48 = CONCAT44((uint)(bVar9 >> 7) * auVar159._60_4_ |
                             (uint)!(bool)(bVar9 >> 7) * uStack_3e08._4_4_,
                             (uint)bVar15 * auVar159._56_4_ | (uint)!bVar15 * (int)uStack_3e08);
      *(undefined8 *)*local_4bf8 = local_3d80;
      *(undefined8 *)(*local_4bf8 + 8) = uStack_3d78;
      *(undefined8 *)(*local_4bf8 + 0x10) = uStack_3d70;
      *(undefined8 *)(*local_4bf8 + 0x18) = uStack_3d68;
      *(undefined8 *)(*local_4bf8 + 0x20) = uStack_3d60;
      *(undefined8 *)(*local_4bf8 + 0x28) = uStack_3d58;
      *(undefined8 *)(*local_4bf8 + 0x30) = uStack_3d50;
      *(undefined8 *)(*local_4bf8 + 0x38) = uStack_3d48;
      local_4bf8 = local_4bf8 + 1;
      local_49c0 = local_4a00;
      uStack_49b8 = uStack_49f8;
      uStack_49b0 = uStack_49f0;
      uStack_49a8 = uStack_49e8;
      uStack_49a0 = uStack_49e0;
      uStack_4998 = uStack_49d8;
      uStack_4990 = uStack_49d0;
      uStack_4988 = uStack_49c8;
      _local_4800 = auVar158;
      _local_4340 = auVar48;
      local_3fc2 = local_4802;
      local_3fc0 = local_4040;
      uStack_3fb8 = uStack_4038;
      uStack_3fb0 = uStack_4030;
      uStack_3fa8 = uStack_4028;
      uStack_3fa0 = uStack_4020;
      uStack_3f98 = uStack_4018;
      uStack_3f90 = uStack_4010;
      uStack_3f88 = uStack_4008;
      local_3f00 = local_4a00;
      uStack_3ef8 = uStack_49f8;
      uStack_3ef0 = uStack_49f0;
      uStack_3ee8 = uStack_49e8;
      uStack_3ee0 = uStack_49e0;
      uStack_3ed8 = uStack_49d8;
      uStack_3ed0 = uStack_49d0;
      uStack_3ec8 = uStack_49c8;
      local_3e40 = local_3ec0;
      uStack_3e38 = uStack_3eb8;
      uStack_3e30 = uStack_3eb0;
      uStack_3e28 = uStack_3ea8;
      uStack_3e20 = uStack_3ea0;
      uStack_3e18 = uStack_3e98;
      uStack_3e10 = uStack_3e90;
      uStack_3e08 = uStack_3e88;
      local_3e00 = local_4a00;
      uStack_3df8 = uStack_49f8;
      uStack_3df0 = uStack_49f0;
      uStack_3de8 = uStack_49e8;
      uStack_3de0 = uStack_49e0;
      uStack_3dd8 = uStack_49d8;
      uStack_3dd0 = uStack_49d0;
      uStack_3dc8 = uStack_49c8;
      local_2d02 = local_43c2;
      local_2d00 = local_2d80;
      uStack_2cf8 = uStack_2d78;
      uStack_2cf0 = uStack_2d70;
      uStack_2ce8 = uStack_2d68;
      uStack_2ce0 = uStack_2d60;
      uStack_2cd8 = uStack_2d58;
      uStack_2cd0 = uStack_2d50;
      uStack_2cc8 = uStack_2d48;
      local_2b82 = local_4802;
      local_2b80 = local_2c00;
      uStack_2b78 = uStack_2bf8;
      uStack_2b70 = uStack_2bf0;
      uStack_2b68 = uStack_2be8;
      uStack_2b60 = uStack_2be0;
      uStack_2b58 = uStack_2bd8;
      uStack_2b50 = uStack_2bd0;
      uStack_2b48 = uStack_2bc8;
      local_2a00 = local_2a40;
      uStack_29f8 = uStack_2a38;
      uStack_29f0 = uStack_2a30;
      uStack_29e8 = uStack_2a28;
      uStack_29e0 = uStack_2a20;
      uStack_29d8 = uStack_2a18;
      uStack_29d0 = uStack_2a10;
      uStack_29c8 = uStack_2a08;
      local_2880 = local_28c0;
      uStack_2878 = uStack_28b8;
      uStack_2870 = uStack_28b0;
      uStack_2868 = uStack_28a8;
      uStack_2860 = uStack_28a0;
      uStack_2858 = uStack_2898;
      uStack_2850 = uStack_2890;
      uStack_2848 = uStack_2888;
      local_1902 = local_4782;
    }
    local_3d04 = 0x3f800000;
    local_16a4 = 0x3f800000;
    local_16a8 = 0x3f800000;
    local_16ac = 0x3f800000;
    local_16b0 = 0x3f800000;
    local_16b4 = 0x3f800000;
    local_16b8 = 0x3f800000;
    local_16bc = 0x3f800000;
    local_16c0 = 0x3f800000;
    auVar18 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar18 = vinsertps_avx(auVar18,ZEXT416(0x3f800000),0x20);
    local_16e0 = vinsertps_avx(auVar18,ZEXT416(0x3f800000),0x30);
    auVar18 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
    auVar18 = vinsertps_avx(auVar18,ZEXT416(0x3f800000),0x20);
    auStack_16d0 = vinsertps_avx(auVar18,ZEXT416(0x3f800000),0x30);
    local_3ce0 = 0;
    uStack_3cd8 = 0;
    uStack_3cd0 = 0;
    uStack_3cc8 = 0;
    for (; local_4c50 + 7 < local_4be8; local_4c50 = local_4c50 + 8) {
      local_3ca8 = local_4bf8;
      local_3c80 = *(undefined8 *)*local_4bf8;
      uStack_3c78 = *(undefined8 *)(*local_4bf8 + 8);
      uStack_3c70 = *(undefined8 *)(*local_4bf8 + 0x10);
      uStack_3c68 = *(undefined8 *)(*local_4bf8 + 0x18);
      uStack_4e54 = (undefined4)((ulong)uStack_3c78 >> 0x20);
      uStack_4e50 = (undefined4)uStack_3c70;
      uStack_4e4c = (undefined4)((ulong)uStack_3c70 >> 0x20);
      uStack_4e48 = (undefined4)uStack_3c68;
      uStack_4e44 = (undefined4)((ulong)uStack_3c68 >> 0x20);
      auVar16._12_4_ = uStack_4e54;
      auVar16._0_12_ = *(undefined1 (*) [12])*local_4bf8;
      auVar16._16_4_ = uStack_4e50;
      auVar16._20_4_ = uStack_4e4c;
      auVar16._24_4_ = uStack_4e48;
      auVar16._28_4_ = uStack_4e44;
      local_3d00 = 0;
      uStack_3cf8 = 0;
      uStack_3cf0 = 0;
      uStack_3ce8 = 0;
      auVar16 = vcmpps_avx(ZEXT1632(ZEXT816(0)),auVar16,1);
      local_3c60[0] = 0x7fffffff;
      local_3c60[1] = 0x7fffffff;
      aiStack_3c58[0] = 0x7fffffff;
      aiStack_3c58[1] = 0x7fffffff;
      aiStack_3c50[0] = 0x7fffffff;
      aiStack_3c50[1] = 0x7fffffff;
      aiStack_3c48[0] = 0x7fffffff;
      aiStack_3c48[1] = 0x7fffffff;
      auVar22._8_4_ = 0x7fffffff;
      auVar22._12_4_ = 0x7fffffff;
      auVar22._0_4_ = 0x7fffffff;
      auVar22._4_4_ = 0x7fffffff;
      auVar22._16_4_ = 0x7fffffff;
      auVar22._20_4_ = 0x7fffffff;
      auVar22._24_4_ = 0x7fffffff;
      auVar22._28_4_ = 0x7fffffff;
      auVar22 = vpand_avx2(*(undefined1 (*) [32])*local_4bf8,auVar22);
      local_3660 = 0;
      uStack_3658 = 0;
      uStack_3650 = 0;
      uStack_3648 = 0;
      local_4ea0 = auVar22._0_8_;
      local_3680 = local_4ea0;
      uStack_4e98 = auVar22._8_8_;
      uStack_3678 = uStack_4e98;
      uStack_4e90 = auVar22._16_8_;
      uStack_3670 = uStack_4e90;
      uStack_4e88 = auVar22._24_8_;
      uStack_3668 = uStack_4e88;
      auVar22 = vsubps_avx(ZEXT1632(ZEXT816(0)),auVar22);
      local_37e0 = 0;
      uStack_37d8 = 0;
      uStack_37d0 = 0;
      uStack_37c8 = 0;
      local_3880 = 0x3f800000;
      uStack_387c = 0x3f800000;
      uStack_3878 = 0x3f800000;
      uStack_3874 = 0x3f800000;
      uStack_3870 = 0x3f800000;
      uStack_386c = 0x3f800000;
      uStack_3868 = 0x3f800000;
      uStack_3864 = 0x3f800000;
      local_3800._0_8_ = auVar22._0_8_;
      local_9a0 = local_3800._0_8_;
      local_3800._8_8_ = auVar22._8_8_;
      uStack_998 = local_3800._8_8_;
      local_3800._16_8_ = auVar22._16_8_;
      uStack_990 = local_3800._16_8_;
      local_3800._24_8_ = auVar22._24_8_;
      uStack_988 = local_3800._24_8_;
      local_9c0 = 0x42b0c0a5;
      uStack_9bc = 0x42b0c0a5;
      uStack_9b8 = 0x42b0c0a5;
      uStack_9b4 = 0x42b0c0a5;
      uStack_9b0 = 0x42b0c0a5;
      uStack_9ac = 0x42b0c0a5;
      uStack_9a8 = 0x42b0c0a5;
      uStack_9a4 = 0x42b0c0a5;
      auVar117._8_4_ = 0x42b0c0a5;
      auVar117._0_8_ = 0x42b0c0a542b0c0a5;
      auVar117._12_4_ = 0x42b0c0a5;
      auVar117._16_4_ = 0x42b0c0a5;
      auVar117._20_4_ = 0x42b0c0a5;
      auVar117._24_4_ = 0x42b0c0a5;
      auVar117._28_4_ = 0x42b0c0a5;
      auVar22 = vminps_avx(auVar22,auVar117);
      local_3800._0_8_ = auVar22._0_8_;
      local_1680 = local_3800._0_8_;
      local_3800._8_8_ = auVar22._8_8_;
      uStack_1678 = local_3800._8_8_;
      local_3800._16_8_ = auVar22._16_8_;
      uStack_1670 = local_3800._16_8_;
      local_3800._24_8_ = auVar22._24_8_;
      uStack_1668 = local_3800._24_8_;
      local_16a0 = 0xc2b0c0a5;
      uStack_169c = 0xc2b0c0a5;
      uStack_1698 = 0xc2b0c0a5;
      uStack_1694 = 0xc2b0c0a5;
      uStack_1690 = 0xc2b0c0a5;
      uStack_168c = 0xc2b0c0a5;
      uStack_1688 = 0xc2b0c0a5;
      uStack_1684 = 0xc2b0c0a5;
      auVar93._8_4_ = 0xc2b0c0a5;
      auVar93._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar93._12_4_ = 0xc2b0c0a5;
      auVar93._16_4_ = 0xc2b0c0a5;
      auVar93._20_4_ = 0xc2b0c0a5;
      auVar93._24_4_ = 0xc2b0c0a5;
      auVar93._28_4_ = 0xc2b0c0a5;
      auVar20 = vmaxps_avx(auVar22,auVar93);
      local_1388 = local_3800;
      local_12f0 = ::_ps256_cephes_LOG2EF;
      local_12f8 = ::_ps256_0p5;
      local_3800._0_8_ = auVar20._0_8_;
      local_d40 = local_3800._0_8_;
      local_3800._8_8_ = auVar20._8_8_;
      uStack_d38 = local_3800._8_8_;
      local_3800._16_8_ = auVar20._16_8_;
      uStack_d30 = local_3800._16_8_;
      local_3800._24_8_ = auVar20._24_8_;
      uStack_d28 = local_3800._24_8_;
      local_d60[0] = 1.442695;
      local_d60[1] = 1.442695;
      afStack_d58[0] = 1.442695;
      afStack_d58[1] = 1.442695;
      afStack_d50[0] = 1.442695;
      afStack_d50[1] = 1.442695;
      afStack_d48[0] = 1.442695;
      afStack_d48[1] = 1.442695;
      local_d80[0] = 0.5;
      local_d80[1] = 0.5;
      afStack_d78[0] = 0.5;
      afStack_d78[1] = 0.5;
      afStack_d70[0] = 0.5;
      afStack_d70[1] = 0.5;
      afStack_d68[0] = 0.5;
      afStack_d68[1] = 0.5;
      auVar108._8_4_ = 1.442695;
      auVar108._12_4_ = 1.442695;
      auVar108._0_4_ = 1.442695;
      auVar108._4_4_ = 1.442695;
      auVar108._16_4_ = 1.442695;
      auVar108._20_4_ = 1.442695;
      auVar108._24_4_ = 1.442695;
      auVar108._28_4_ = 1.442695;
      auVar161._8_4_ = 0.5;
      auVar161._12_4_ = 0.5;
      auVar161._0_4_ = 0.5;
      auVar161._4_4_ = 0.5;
      auVar161._16_4_ = 0.5;
      auVar161._20_4_ = 0.5;
      auVar161._24_4_ = 0.5;
      auVar161._28_4_ = 0.5;
      auVar18 = vfmadd213ps_fma(auVar108,auVar20,auVar161);
      auVar21 = vroundps_avx(ZEXT1632(auVar18),1);
      auVar22 = vcmpps_avx(ZEXT1632(auVar18),auVar21,1);
      local_38a0._0_8_ = auVar22._0_8_;
      local_37a0 = local_38a0._0_8_;
      local_38a0._8_8_ = auVar22._8_8_;
      uStack_3798 = local_38a0._8_8_;
      local_38a0._16_8_ = auVar22._16_8_;
      uStack_3790 = local_38a0._16_8_;
      local_38a0._24_8_ = auVar22._24_8_;
      uStack_3788 = local_38a0._24_8_;
      local_37c0 = 0x3f8000003f800000;
      uStack_37b8 = 0x3f8000003f800000;
      uStack_37b0 = 0x3f8000003f800000;
      uStack_37a8 = 0x3f8000003f800000;
      auVar41._8_8_ = 0x3f8000003f800000;
      auVar41._0_8_ = 0x3f8000003f800000;
      auVar41._16_8_ = 0x3f8000003f800000;
      auVar41._24_8_ = 0x3f8000003f800000;
      local_38a0 = vpand_avx2(auVar22,auVar41);
      local_3820 = auVar21._0_8_;
      local_3720 = local_3820;
      uStack_3818 = auVar21._8_8_;
      uStack_3718 = uStack_3818;
      uStack_3810 = auVar21._16_8_;
      uStack_3710 = uStack_3810;
      uStack_3808 = auVar21._24_8_;
      uStack_3708 = uStack_3808;
      local_3740 = local_38a0._0_8_;
      uStack_3738 = local_38a0._8_8_;
      uStack_3730 = local_38a0._16_8_;
      uStack_3728 = local_38a0._24_8_;
      local_3840 = vsubps_avx(auVar21,local_38a0);
      local_11e0 = local_3840;
      local_11d0 = ::_ps256_cephes_exp_C1;
      local_a40 = local_3840._0_8_;
      uStack_a38 = local_3840._8_8_;
      uStack_a30 = local_3840._16_8_;
      uStack_a28 = local_3840._24_8_;
      local_a60[0] = 0.6933594;
      local_a60[1] = 0.6933594;
      afStack_a58[0] = 0.6933594;
      afStack_a58[1] = 0.6933594;
      afStack_a50[0] = 0.6933594;
      afStack_a50[1] = 0.6933594;
      afStack_a48[0] = 0.6933594;
      afStack_a48[1] = 0.6933594;
      local_a80 = local_3800._0_8_;
      uStack_a78 = local_3800._8_8_;
      uStack_a70 = local_3800._16_8_;
      uStack_a68 = local_3800._24_8_;
      auVar115._8_4_ = 0.6933594;
      auVar115._12_4_ = 0.6933594;
      auVar115._0_4_ = 0.6933594;
      auVar115._4_4_ = 0.6933594;
      auVar115._16_4_ = 0.6933594;
      auVar115._20_4_ = 0.6933594;
      auVar115._24_4_ = 0.6933594;
      auVar115._28_4_ = 0.6933594;
      auVar18 = vfnmadd213ps_fma(auVar115,local_3840,auVar20);
      local_11e8 = ::_ps256_cephes_exp_C2;
      local_9e0 = local_3840._0_8_;
      uStack_9d8 = local_3840._8_8_;
      uStack_9d0 = local_3840._16_8_;
      uStack_9c8 = local_3840._24_8_;
      local_a00[0] = -0.00021219444;
      local_a00[1] = -0.00021219444;
      afStack_9f8[0] = -0.00021219444;
      afStack_9f8[1] = -0.00021219444;
      afStack_9f0[0] = -0.00021219444;
      afStack_9f0[1] = -0.00021219444;
      afStack_9e8[0] = -0.00021219444;
      afStack_9e8[1] = -0.00021219444;
      local_3800._0_8_ = auVar18._0_8_;
      local_a20 = local_3800._0_8_;
      local_3800._8_8_ = auVar18._8_8_;
      uStack_a18 = local_3800._8_8_;
      uStack_a10 = 0;
      uStack_a08 = 0;
      auVar116._8_4_ = -0.00021219444;
      auVar116._12_4_ = -0.00021219444;
      auVar116._0_4_ = -0.00021219444;
      auVar116._4_4_ = -0.00021219444;
      auVar116._16_4_ = -0.00021219444;
      auVar116._20_4_ = -0.00021219444;
      auVar116._24_4_ = -0.00021219444;
      auVar116._28_4_ = -0.00021219444;
      auVar18 = vfnmadd213ps_fma(auVar116,local_3840,ZEXT1632(auVar18));
      auVar161 = ZEXT1632(auVar18);
      local_3800._0_8_ = auVar18._0_8_;
      local_14a0 = local_3800._0_8_;
      local_3800._8_8_ = auVar18._8_8_;
      uStack_1498 = local_3800._8_8_;
      uStack_1490 = 0;
      uStack_1488 = 0;
      local_1480._0_4_ = auVar18._0_4_;
      local_1480._4_4_ = auVar18._4_4_;
      uStack_1478._0_4_ = auVar18._8_4_;
      uStack_1478._4_4_ = auVar18._12_4_;
      local_3820._4_4_ = local_1480._4_4_ * local_1480._4_4_;
      local_3820._0_4_ = (float)local_1480 * (float)local_1480;
      local_b20 = local_3820;
      uStack_3818._0_4_ = (float)uStack_1478 * (float)uStack_1478;
      uStack_3818._4_4_ = uStack_1478._4_4_ * uStack_1478._4_4_;
      auVar165 = _local_3820;
      _local_3820 = ZEXT1632(_local_3820);
      auVar93 = _local_3820;
      uStack_38b8._0_4_ = 0x39506967;
      local_38c0 = (undefined1  [8])0x3950696739506967;
      uStack_38b8._4_4_ = 0x39506967;
      uStack_38b0._0_4_ = 0x39506967;
      uStack_38b0._4_4_ = 0x39506967;
      auVar166 = _local_38c0;
      uStack_38a8._0_4_ = 0x39506967;
      uStack_38a8._4_4_ = 0x39506967;
      auVar22 = _local_38c0;
      local_1378 = local_38c0;
      local_1310 = ::_ps256_cephes_exp_p1;
      local_ce0 = 0x3950696739506967;
      uStack_cd8 = uStack_38b8;
      uStack_38b0 = auVar166._16_8_;
      uStack_cd0 = uStack_38b0;
      uStack_38a8 = auVar22._24_8_;
      uStack_cc8 = uStack_38a8;
      local_d00 = local_3800._0_8_;
      uStack_cf8 = local_3800._8_8_;
      uStack_cf0 = 0;
      uStack_ce8 = 0;
      local_d20[0] = 0.0013981999;
      local_d20[1] = 0.0013981999;
      afStack_d18[0] = 0.0013981999;
      afStack_d18[1] = 0.0013981999;
      afStack_d10[0] = 0.0013981999;
      afStack_d10[1] = 0.0013981999;
      afStack_d08[0] = 0.0013981999;
      afStack_d08[1] = 0.0013981999;
      auVar109._8_4_ = 0.0013981999;
      auVar109._12_4_ = 0.0013981999;
      auVar109._0_4_ = 0.0013981999;
      auVar109._4_4_ = 0.0013981999;
      auVar109._16_4_ = 0.0013981999;
      auVar109._20_4_ = 0.0013981999;
      auVar109._24_4_ = 0.0013981999;
      auVar109._28_4_ = 0.0013981999;
      auVar18 = vfmadd213ps_fma(auVar161,auVar22,auVar109);
      local_1328 = ::_ps256_cephes_exp_p2;
      local_38c0 = auVar18._0_8_;
      local_c80 = local_38c0;
      uStack_38b8 = auVar18._8_8_;
      uStack_c78 = uStack_38b8;
      uStack_c70 = 0;
      uStack_c68 = 0;
      local_ca0 = local_3800._0_8_;
      uStack_c98 = local_3800._8_8_;
      uStack_c90 = 0;
      uStack_c88 = 0;
      local_cc0[0] = 0.008333452;
      local_cc0[1] = 0.008333452;
      afStack_cb8[0] = 0.008333452;
      afStack_cb8[1] = 0.008333452;
      afStack_cb0[0] = 0.008333452;
      afStack_cb0[1] = 0.008333452;
      afStack_ca8[0] = 0.008333452;
      afStack_ca8[1] = 0.008333452;
      auVar110._8_4_ = 0.008333452;
      auVar110._12_4_ = 0.008333452;
      auVar110._0_4_ = 0.008333452;
      auVar110._4_4_ = 0.008333452;
      auVar110._16_4_ = 0.008333452;
      auVar110._20_4_ = 0.008333452;
      auVar110._24_4_ = 0.008333452;
      auVar110._28_4_ = 0.008333452;
      auVar18 = vfmadd213ps_fma(auVar161,ZEXT1632(auVar18),auVar110);
      local_1340 = ::_ps256_cephes_exp_p3;
      local_38c0 = auVar18._0_8_;
      local_c20 = local_38c0;
      uStack_38b8 = auVar18._8_8_;
      uStack_c18 = uStack_38b8;
      uStack_c10 = 0;
      uStack_c08 = 0;
      local_c40 = local_3800._0_8_;
      uStack_c38 = local_3800._8_8_;
      uStack_c30 = 0;
      uStack_c28 = 0;
      local_c60[0] = 0.041665796;
      local_c60[1] = 0.041665796;
      afStack_c58[0] = 0.041665796;
      afStack_c58[1] = 0.041665796;
      afStack_c50[0] = 0.041665796;
      afStack_c50[1] = 0.041665796;
      afStack_c48[0] = 0.041665796;
      afStack_c48[1] = 0.041665796;
      auVar111._8_4_ = 0.041665796;
      auVar111._12_4_ = 0.041665796;
      auVar111._0_4_ = 0.041665796;
      auVar111._4_4_ = 0.041665796;
      auVar111._16_4_ = 0.041665796;
      auVar111._20_4_ = 0.041665796;
      auVar111._24_4_ = 0.041665796;
      auVar111._28_4_ = 0.041665796;
      auVar18 = vfmadd213ps_fma(auVar161,ZEXT1632(auVar18),auVar111);
      local_1358 = ::_ps256_cephes_exp_p4;
      local_38c0 = auVar18._0_8_;
      local_bc0 = local_38c0;
      uStack_38b8 = auVar18._8_8_;
      uStack_bb8 = uStack_38b8;
      uStack_bb0 = 0;
      uStack_ba8 = 0;
      local_be0 = local_3800._0_8_;
      uStack_bd8 = local_3800._8_8_;
      uStack_bd0 = 0;
      uStack_bc8 = 0;
      local_c00[0] = 0.16666666;
      local_c00[1] = 0.16666666;
      afStack_bf8[0] = 0.16666666;
      afStack_bf8[1] = 0.16666666;
      afStack_bf0[0] = 0.16666666;
      afStack_bf0[1] = 0.16666666;
      afStack_be8[0] = 0.16666666;
      afStack_be8[1] = 0.16666666;
      auVar112._8_4_ = 0.16666666;
      auVar112._12_4_ = 0.16666666;
      auVar112._0_4_ = 0.16666666;
      auVar112._4_4_ = 0.16666666;
      auVar112._16_4_ = 0.16666666;
      auVar112._20_4_ = 0.16666666;
      auVar112._24_4_ = 0.16666666;
      auVar112._28_4_ = 0.16666666;
      auVar18 = vfmadd213ps_fma(auVar161,ZEXT1632(auVar18),auVar112);
      local_1370 = ::_ps256_cephes_exp_p5;
      local_38c0 = auVar18._0_8_;
      local_b60 = local_38c0;
      uStack_38b8 = auVar18._8_8_;
      uStack_b58 = uStack_38b8;
      uStack_b50 = 0;
      uStack_b48 = 0;
      local_b80 = local_3800._0_8_;
      uStack_b78 = local_3800._8_8_;
      uStack_b70 = 0;
      uStack_b68 = 0;
      local_ba0[0] = 0.5;
      local_ba0[1] = 0.5;
      afStack_b98[0] = 0.5;
      afStack_b98[1] = 0.5;
      afStack_b90[0] = 0.5;
      afStack_b90[1] = 0.5;
      afStack_b88[0] = 0.5;
      afStack_b88[1] = 0.5;
      auVar113._8_4_ = 0.5;
      auVar113._12_4_ = 0.5;
      auVar113._0_4_ = 0.5;
      auVar113._4_4_ = 0.5;
      auVar113._16_4_ = 0.5;
      auVar113._20_4_ = 0.5;
      auVar113._24_4_ = 0.5;
      auVar113._28_4_ = 0.5;
      auVar18 = vfmadd213ps_fma(auVar161,ZEXT1632(auVar18),auVar113);
      local_1380 = local_3820;
      local_38c0 = auVar18._0_8_;
      local_b00 = local_38c0;
      uStack_38b8 = auVar18._8_8_;
      uStack_af8 = uStack_38b8;
      uStack_af0 = 0;
      uStack_ae8 = 0;
      uStack_3818 = auVar165._8_8_;
      uStack_b18 = uStack_3818;
      uStack_b10 = 0;
      uStack_b08 = 0;
      local_b40 = local_3800._0_8_;
      uStack_b38 = local_3800._8_8_;
      uStack_b30 = 0;
      uStack_b28 = 0;
      auVar18 = vfmadd213ps_fma(auVar93,ZEXT1632(auVar18),auVar161);
      local_38c0 = auVar18._0_8_;
      uVar23 = local_38c0;
      uStack_38b8 = auVar18._8_8_;
      uVar24 = uStack_38b8;
      uStack_3750 = 0;
      uStack_3748 = 0;
      local_3780 = 0x3f8000003f800000;
      uStack_3778 = 0x3f8000003f800000;
      uStack_3770 = 0x3f8000003f800000;
      uStack_3768 = 0x3f8000003f800000;
      local_3760._0_4_ = auVar18._0_4_;
      local_3760._4_4_ = auVar18._4_4_;
      uStack_3758._0_4_ = auVar18._8_4_;
      uStack_3758._4_4_ = auVar18._12_4_;
      local_38c0._4_4_ = local_3760._4_4_ + 1.0;
      local_38c0._0_4_ = (float)local_3760 + 1.0;
      uStack_38b8._0_4_ = (float)uStack_3758 + 1.0;
      uStack_38b8._4_4_ = uStack_3758._4_4_ + 1.0;
      uStack_38b0._0_4_ = 0x3f800000;
      uStack_38b0._4_4_ = 0x3f800000;
      auVar166 = _local_38c0;
      uStack_38a8._0_4_ = 0x3f800000;
      uStack_38a8._4_4_ = 0x3f800000;
      auVar20 = _local_38c0;
      local_980._0_4_ = local_3840._0_4_;
      local_980._4_4_ = local_3840._4_4_;
      uStack_978._0_4_ = local_3840._8_4_;
      uStack_978._4_4_ = local_3840._12_4_;
      uStack_970._0_4_ = local_3840._16_4_;
      uStack_970._4_4_ = local_3840._20_4_;
      uStack_968._0_4_ = local_3840._24_4_;
      uStack_968._4_4_ = local_3840._28_4_;
      local_3860._4_4_ = (int)local_980._4_4_;
      local_3860._0_4_ = (int)(float)local_980;
      local_3860._8_4_ = (int)(float)uStack_978;
      local_3860._12_4_ = (int)uStack_978._4_4_;
      local_3860._16_4_ = (int)(float)uStack_970;
      local_3860._20_4_ = (int)uStack_970._4_4_;
      auVar154 = local_3860._0_24_;
      local_3860._24_4_ = (int)(float)uStack_968;
      local_3860._28_4_ = (int)uStack_968._4_4_;
      auVar22 = local_3860;
      local_940 = local_3860._0_8_;
      uStack_938 = local_3860._8_8_;
      local_3860._16_8_ = auVar154._16_8_;
      uStack_930 = local_3860._16_8_;
      local_3860._24_8_ = auVar22._24_8_;
      uStack_928 = local_3860._24_8_;
      local_960 = 0x7f0000007f;
      uStack_958 = 0x7f0000007f;
      uStack_950 = 0x7f0000007f;
      uStack_948 = 0x7f0000007f;
      local_8a0 = local_3860._0_8_;
      uStack_898 = local_3860._8_8_;
      uStack_890 = local_3860._16_8_;
      uStack_888 = local_3860._24_8_;
      local_8c0 = 0x7f0000007f;
      uStack_8b8 = 0x7f0000007f;
      uStack_8b0 = 0x7f0000007f;
      uStack_8a8 = 0x7f0000007f;
      auVar119._16_8_ = local_3860._16_8_;
      auVar119._0_16_ = local_3860._0_16_;
      auVar119._24_8_ = local_3860._24_8_;
      auVar118._8_8_ = 0x7f0000007f;
      auVar118._0_8_ = 0x7f0000007f;
      auVar118._16_8_ = 0x7f0000007f;
      auVar118._24_8_ = 0x7f0000007f;
      auVar22 = vpaddd_avx2(auVar119,auVar118);
      local_3860._0_8_ = auVar22._0_8_;
      local_900 = local_3860._0_8_;
      local_3860._8_8_ = auVar22._8_8_;
      uStack_8f8 = local_3860._8_8_;
      local_3860._16_8_ = auVar22._16_8_;
      uStack_8f0 = local_3860._16_8_;
      local_3860._24_8_ = auVar22._24_8_;
      uStack_8e8 = local_3860._24_8_;
      local_904 = 0x17;
      local_860 = local_3860._0_8_;
      uStack_858 = local_3860._8_8_;
      uStack_850 = local_3860._16_8_;
      uStack_848 = local_3860._24_8_;
      local_864 = 0x17;
      local_3860 = vpslld_avx2(auVar22,ZEXT416(0x17));
      local_8e0 = local_3860._0_8_;
      uStack_8d8 = local_3860._8_8_;
      uStack_8d0 = local_3860._16_8_;
      uStack_8c8 = local_3860._24_8_;
      local_38e0 = local_3860._0_8_;
      uStack_38d8 = local_3860._8_8_;
      uStack_38d0 = local_3860._16_8_;
      uStack_38c8 = local_3860._24_8_;
      local_14c0 = local_38c0;
      uStack_14b8 = uStack_38b8;
      uStack_38b0 = auVar166._16_8_;
      uStack_14b0 = uStack_38b0;
      uStack_38a8 = auVar20._24_8_;
      uStack_14a8 = uStack_38a8;
      local_14e0 = local_3860._0_8_;
      uStack_14d8 = local_3860._8_8_;
      uStack_14d0 = local_3860._16_8_;
      uStack_14c8 = local_3860._24_8_;
      local_38c0._0_4_ = ((float)local_3760 + 1.0) * local_3860._0_4_;
      local_38c0._4_4_ = (local_3760._4_4_ + 1.0) * local_3860._4_4_;
      fVar168 = ((float)uStack_3758 + 1.0) * local_3860._8_4_;
      fVar169 = (uStack_3758._4_4_ + 1.0) * local_3860._12_4_;
      fVar170 = local_3860._16_4_ * 1.0;
      fVar171 = local_3860._20_4_ * 1.0;
      fVar172 = local_3860._24_4_ * 1.0;
      uStack_38b8._0_4_ = fVar168;
      uStack_38b8._4_4_ = fVar169;
      uStack_38b0._0_4_ = fVar170;
      uStack_38b0._4_4_ = fVar171;
      auVar166 = _local_38c0;
      uStack_38a8._0_4_ = fVar172;
      uStack_38a8._4_4_ = 0x3f800000;
      auVar41 = _local_38c0;
      local_3920 = local_38c0;
      uStack_3918 = uStack_38b8;
      uStack_38b0 = auVar166._16_8_;
      uStack_3910 = uStack_38b0;
      uStack_38a8 = auVar41._24_8_;
      uStack_3908 = uStack_38a8;
      local_3900._0_4_ = local_16e0._0_4_;
      local_3900._4_4_ = local_16e0._4_4_;
      uStack_38f8._0_4_ = local_16e0._8_4_;
      uStack_38f8._4_4_ = local_16e0._12_4_;
      uStack_38f0._0_4_ = auStack_16d0._0_4_;
      uStack_38f0._4_4_ = auStack_16d0._4_4_;
      uStack_38e8._0_4_ = auStack_16d0._8_4_;
      uStack_38e8._4_4_ = auStack_16d0._12_4_;
      auVar165._0_8_ =
           CONCAT44(local_3900._4_4_ + (float)local_38c0._4_4_,
                    (float)local_3900 + (float)local_38c0._0_4_);
      auVar165._8_4_ = (float)uStack_38f8 + fVar168;
      auVar165._12_4_ = uStack_38f8._4_4_ + fVar169;
      auVar166._16_4_ = (float)uStack_38f0 + fVar170;
      auVar166._0_16_ = auVar165;
      auVar166._20_4_ = uStack_38f0._4_4_ + fVar171;
      auVar167._24_4_ = (float)uStack_38e8 + fVar172;
      auVar167._0_24_ = auVar166;
      auVar167._28_4_ = uStack_38e8._4_4_ + 1.0;
      local_3b60 = 0x3f800000;
      uStack_3b5c = 0x3f800000;
      uStack_3b58 = 0x3f800000;
      uStack_3b54 = 0x3f800000;
      uStack_3b50 = 0x3f800000;
      uStack_3b4c = 0x3f800000;
      uStack_3b48 = 0x3f800000;
      uStack_3b44 = 0x3f800000;
      local_3b00 = 0;
      uStack_3af8 = 0;
      uStack_3af0 = 0;
      uStack_3ae8 = 0;
      local_3b80 = vcmpps_avx(auVar167,ZEXT1632(ZEXT816(0)),2);
      uStack_3b18 = auVar165._8_8_;
      uStack_1638 = uStack_3b18;
      uStack_3b10 = auVar166._16_8_;
      uStack_1630 = uStack_3b10;
      uStack_3b08 = auVar167._24_8_;
      uStack_1628 = uStack_3b08;
      local_1660 = 0x800000;
      uStack_165c = 0x800000;
      uStack_1658 = 0x800000;
      uStack_1654 = 0x800000;
      uStack_1650 = 0x800000;
      uStack_164c = 0x800000;
      uStack_1648 = 0x800000;
      uStack_1644 = 0x800000;
      auVar95._16_8_ = uStack_3b10;
      auVar95._0_16_ = auVar165;
      auVar95._24_8_ = uStack_3b08;
      auVar94._8_4_ = 0x800000;
      auVar94._0_8_ = 0x80000000800000;
      auVar94._12_4_ = 0x800000;
      auVar94._16_4_ = 0x800000;
      auVar94._20_4_ = 0x800000;
      auVar94._24_4_ = 0x800000;
      auVar94._28_4_ = 0x800000;
      auVar22 = vmaxps_avx(auVar95,auVar94);
      local_3b20 = auVar22._0_8_;
      local_15e0 = local_3b20;
      uStack_3b18 = auVar22._8_8_;
      uStack_15d8 = uStack_3b18;
      uStack_3b10 = auVar22._16_8_;
      uStack_15d0 = uStack_3b10;
      uStack_3b08 = auVar22._24_8_;
      uStack_15c8 = uStack_3b08;
      local_1600 = local_3b20;
      uStack_15f8 = uStack_3b18;
      uStack_15f0 = uStack_3b10;
      uStack_15e8 = uStack_3b08;
      local_1604 = 0x17;
      local_11a0 = local_3b20;
      uStack_1198 = uStack_3b18;
      uStack_1190 = uStack_3b10;
      uStack_1188 = uStack_3b08;
      local_11a4 = 0x17;
      auVar21 = vpsrld_avx2(auVar22,ZEXT416(0x17));
      local_3a40 = local_3b20;
      uStack_3a38 = uStack_3b18;
      uStack_3a30 = uStack_3b10;
      uStack_3a28 = uStack_3b08;
      local_3a60 = 0x807fffff;
      uStack_3a5c = 0x807fffff;
      uStack_3a58 = 0x807fffff;
      uStack_3a54 = 0x807fffff;
      uStack_3a50 = 0x807fffff;
      uStack_3a4c = 0x807fffff;
      uStack_3a48 = 0x807fffff;
      uStack_3a44 = 0x807fffff;
      auVar40._8_4_ = 0x807fffff;
      auVar40._0_8_ = 0x807fffff807fffff;
      auVar40._12_4_ = 0x807fffff;
      auVar40._16_4_ = 0x807fffff;
      auVar40._20_4_ = 0x807fffff;
      auVar40._24_4_ = 0x807fffff;
      auVar40._28_4_ = 0x807fffff;
      auVar22 = vpand_avx2(auVar22,auVar40);
      local_3b20 = auVar22._0_8_;
      local_1560 = local_3b20;
      uStack_3b18 = auVar22._8_8_;
      uStack_1558 = uStack_3b18;
      uStack_3b10 = auVar22._16_8_;
      uStack_1550 = uStack_3b10;
      uStack_3b08 = auVar22._24_8_;
      uStack_1548 = uStack_3b08;
      local_1580 = 0x3f000000;
      uStack_157c = 0x3f000000;
      uStack_1578 = 0x3f000000;
      uStack_1574 = 0x3f000000;
      uStack_1570 = 0x3f000000;
      uStack_156c = 0x3f000000;
      uStack_1568 = 0x3f000000;
      uStack_1564 = 0x3f000000;
      auVar96._8_4_ = 0x3f000000;
      auVar96._0_8_ = 0x3f0000003f000000;
      auVar96._12_4_ = 0x3f000000;
      auVar96._16_4_ = 0x3f000000;
      auVar96._20_4_ = 0x3f000000;
      auVar96._24_4_ = 0x3f000000;
      auVar96._28_4_ = 0x3f000000;
      auVar20 = vpor_avx2(auVar22,auVar96);
      local_3b40._0_8_ = auVar21._0_8_;
      local_1520 = local_3b40._0_8_;
      local_3b40._8_8_ = auVar21._8_8_;
      uStack_1518 = local_3b40._8_8_;
      local_3b40._16_8_ = auVar21._16_8_;
      uStack_1510 = local_3b40._16_8_;
      local_3b40._24_8_ = auVar21._24_8_;
      uStack_1508 = local_3b40._24_8_;
      local_1540 = 0x7f0000007f;
      uStack_1538 = 0x7f0000007f;
      uStack_1530 = 0x7f0000007f;
      uStack_1528 = 0x7f0000007f;
      local_1160 = local_3b40._0_8_;
      uStack_1158 = local_3b40._8_8_;
      uStack_1150 = local_3b40._16_8_;
      uStack_1148 = local_3b40._24_8_;
      local_1180 = 0x7f0000007f;
      uStack_1178 = 0x7f0000007f;
      uStack_1170 = 0x7f0000007f;
      uStack_1168 = 0x7f0000007f;
      auVar97._8_8_ = 0x7f0000007f;
      auVar97._0_8_ = 0x7f0000007f;
      auVar97._16_8_ = 0x7f0000007f;
      auVar97._24_8_ = 0x7f0000007f;
      local_3b40 = vpsubd_avx2(auVar21,auVar97);
      local_1500 = local_3b40._0_8_;
      uStack_14f8 = local_3b40._8_8_;
      uStack_14f0 = local_3b40._16_8_;
      uStack_14e8 = local_3b40._24_8_;
      auVar22 = vcvtdq2ps_avx(local_3b40);
      local_3ba0 = auVar22._0_8_;
      uVar26 = local_3ba0;
      uStack_3b98 = auVar22._8_8_;
      uVar27 = uStack_3b98;
      uStack_3b90 = auVar22._16_8_;
      uVar28 = uStack_3b90;
      uStack_3b88 = auVar22._24_8_;
      uVar29 = uStack_3b88;
      local_39a0 = 0x3f8000003f800000;
      uStack_3998 = 0x3f8000003f800000;
      uStack_3990 = 0x3f8000003f800000;
      uStack_3988 = 0x3f8000003f800000;
      local_3980._0_4_ = auVar22._0_4_;
      local_3980._4_4_ = auVar22._4_4_;
      uStack_3978._0_4_ = auVar22._8_4_;
      uStack_3978._4_4_ = auVar22._12_4_;
      uStack_3970._0_4_ = auVar22._16_4_;
      uStack_3970._4_4_ = auVar22._20_4_;
      uStack_3968._0_4_ = auVar22._24_4_;
      uStack_3968._4_4_ = auVar22._28_4_;
      local_3ba0._4_4_ = local_3980._4_4_ + 1.0;
      local_3ba0._0_4_ = (float)local_3980 + 1.0;
      uStack_3b98._0_4_ = (float)uStack_3978 + 1.0;
      uStack_3b98._4_4_ = uStack_3978._4_4_ + 1.0;
      uStack_3b90._0_4_ = (float)uStack_3970 + 1.0;
      uStack_3b90._4_4_ = uStack_3970._4_4_ + 1.0;
      auVar166 = _local_3ba0;
      uStack_3b88._0_4_ = (float)uStack_3968 + 1.0;
      uStack_3b88._4_4_ = uStack_3968._4_4_ + 1.0;
      auVar21 = _local_3ba0;
      auVar163._8_4_ = 0x3f3504f3;
      auVar163._0_8_ = 0x3f3504f33f3504f3;
      auVar163._12_4_ = 0x3f3504f3;
      auVar163._16_4_ = 0x3f3504f3;
      auVar163._20_4_ = 0x3f3504f3;
      auVar163._24_4_ = 0x3f3504f3;
      auVar163._28_4_ = 0x3f3504f3;
      local_3bc0 = vcmpps_avx(auVar20,auVar163,1);
      local_3b20 = auVar20._0_8_;
      local_3a80 = local_3b20;
      uStack_3b18 = auVar20._8_8_;
      uStack_3a78 = uStack_3b18;
      uStack_3b10 = auVar20._16_8_;
      uStack_3a70 = uStack_3b10;
      uStack_3b08 = auVar20._24_8_;
      uStack_3a68 = uStack_3b08;
      local_3aa0 = local_3bc0._0_8_;
      uStack_3a98 = local_3bc0._8_8_;
      uStack_3a90 = local_3bc0._16_8_;
      uStack_3a88 = local_3bc0._24_8_;
      local_3be0 = vpand_avx2(auVar20,local_3bc0);
      local_36a0 = local_3b20;
      uStack_3698 = uStack_3b18;
      uStack_3690 = uStack_3b10;
      uStack_3688 = uStack_3b08;
      local_36c0 = 0x3f8000003f800000;
      uStack_36b8 = 0x3f8000003f800000;
      uStack_36b0 = 0x3f8000003f800000;
      uStack_36a8 = 0x3f8000003f800000;
      auVar42._8_8_ = 0x3f8000003f800000;
      auVar42._0_8_ = 0x3f8000003f800000;
      auVar42._16_8_ = 0x3f8000003f800000;
      auVar42._24_8_ = 0x3f8000003f800000;
      auVar22 = vsubps_avx(auVar20,auVar42);
      local_36e0 = local_3ba0;
      uStack_36d8 = uStack_3b98;
      uStack_3b90 = auVar166._16_8_;
      uStack_36d0 = uStack_3b90;
      uStack_3b88 = auVar21._24_8_;
      uStack_36c8 = uStack_3b88;
      local_3ac0 = 0x3f8000003f800000;
      uStack_3ab8 = 0x3f8000003f800000;
      uStack_3ab0 = 0x3f8000003f800000;
      uStack_3aa8 = 0x3f8000003f800000;
      local_3ae0 = local_3bc0._0_8_;
      uStack_3ad8 = local_3bc0._8_8_;
      uStack_3ad0 = local_3bc0._16_8_;
      uStack_3ac8 = local_3bc0._24_8_;
      auVar20._8_8_ = 0x3f8000003f800000;
      auVar20._0_8_ = 0x3f8000003f800000;
      auVar20._16_8_ = 0x3f8000003f800000;
      auVar20._24_8_ = 0x3f8000003f800000;
      local_3700 = vpand_avx2(auVar20,local_3bc0);
      auVar21._16_8_ = uStack_3b90;
      auVar21._0_16_ = _local_3ba0;
      auVar21._24_8_ = uStack_3b88;
      _local_3ba0 = vsubps_avx(auVar21,local_3700);
      local_3b20 = auVar22._0_8_;
      uVar30 = local_3b20;
      uStack_3b18 = auVar22._8_8_;
      uVar31 = uStack_3b18;
      uStack_3b10 = auVar22._16_8_;
      uVar32 = uStack_3b10;
      uStack_3b08 = auVar22._24_8_;
      uVar33 = uStack_3b08;
      local_39c0._0_4_ = auVar22._0_4_;
      local_39c0._4_4_ = auVar22._4_4_;
      uStack_39b8._0_4_ = auVar22._8_4_;
      uStack_39b8._4_4_ = auVar22._12_4_;
      uStack_39b0._0_4_ = auVar22._16_4_;
      uStack_39b0._4_4_ = auVar22._20_4_;
      uStack_39a8._0_4_ = auVar22._24_4_;
      uStack_39a8._4_4_ = auVar22._28_4_;
      local_39e0._0_4_ = local_3be0._0_4_;
      local_39e0._4_4_ = local_3be0._4_4_;
      uStack_39d8._0_4_ = local_3be0._8_4_;
      uStack_39d8._4_4_ = local_3be0._12_4_;
      uStack_39d0._0_4_ = local_3be0._16_4_;
      uStack_39d0._4_4_ = local_3be0._20_4_;
      uStack_39c8._0_4_ = local_3be0._24_4_;
      uStack_39c8._4_4_ = local_3be0._28_4_;
      local_3b20._0_4_ = (float)local_39c0 + (float)local_39e0;
      local_3b20._4_4_ = local_39c0._4_4_ + local_39e0._4_4_;
      uStack_39b8._0_4_ = (float)uStack_39b8 + (float)uStack_39d8;
      uStack_39b8._4_4_ = uStack_39b8._4_4_ + uStack_39d8._4_4_;
      uStack_39b0._0_4_ = (float)uStack_39b0 + (float)uStack_39d0;
      uStack_39b0._4_4_ = uStack_39b0._4_4_ + uStack_39d0._4_4_;
      uStack_39a8._0_4_ = (float)uStack_39a8 + (float)uStack_39c8;
      fStack_3be4 = uStack_39a8._4_4_ + uStack_39c8._4_4_;
      uStack_3b18._0_4_ = (float)uStack_39b8;
      uStack_3b18._4_4_ = uStack_39b8._4_4_;
      uStack_3b10._0_4_ = (float)uStack_39b0;
      uStack_3b10._4_4_ = uStack_39b0._4_4_;
      auVar166 = _local_3b20;
      uStack_3b08._0_4_ = (float)uStack_39a8;
      uStack_3b08._4_4_ = fStack_3be4;
      auVar20 = _local_3b20;
      local_13e0 = local_3b20;
      uStack_13d8 = uStack_3b18;
      uStack_3b10 = auVar166._16_8_;
      uStack_13d0 = uStack_3b10;
      uStack_3b08 = auVar20._24_8_;
      uStack_13c8 = uStack_3b08;
      local_3c00 = (float)local_3b20._0_4_ * (float)local_3b20._0_4_;
      fStack_3bfc = (float)local_3b20._4_4_ * (float)local_3b20._4_4_;
      fStack_3bf8 = (float)uStack_39b8 * (float)uStack_39b8;
      fStack_3bf4 = uStack_39b8._4_4_ * uStack_39b8._4_4_;
      fStack_3bf0 = (float)uStack_39b0 * (float)uStack_39b0;
      fStack_3bec = uStack_39b0._4_4_ * uStack_39b0._4_4_;
      fStack_3be8 = (float)uStack_39a8 * (float)uStack_39a8;
      uStack_3c18._0_4_ = 0x3d9021bb;
      local_3c20 = (undefined1  [8])0x3d9021bb3d9021bb;
      uStack_3c18._4_4_ = 0x3d9021bb;
      uStack_3c10._0_4_ = 0x3d9021bb;
      uStack_3c10._4_4_ = 0x3d9021bb;
      auVar166 = _local_3c20;
      uStack_3c08._0_4_ = 0.070376836;
      uStack_3c08._4_4_ = 0x3d9021bb;
      auVar22 = _local_3c20;
      local_12c8 = local_3c20;
      local_12a8 = local_3b20;
      local_1208 = ::_ps256_cephes_log_p1;
      local_1100 = 0x3d9021bb3d9021bb;
      uStack_10f8 = uStack_3c18;
      uStack_3c10 = auVar166._16_8_;
      uStack_10f0 = uStack_3c10;
      uStack_3c08 = auVar22._24_8_;
      uStack_10e8 = uStack_3c08;
      local_1120 = local_3b20;
      uStack_1118 = uStack_3b18;
      uStack_1110 = uStack_3b10;
      uStack_1108 = uStack_3b08;
      local_1140[0] = -0.1151461;
      local_1140[1] = -0.1151461;
      afStack_1138[0] = -0.1151461;
      afStack_1138[1] = -0.1151461;
      afStack_1130[0] = -0.1151461;
      afStack_1130[1] = -0.1151461;
      afStack_1128[0] = -0.1151461;
      afStack_1128[1] = -0.1151461;
      auVar98._8_4_ = -0.1151461;
      auVar98._12_4_ = -0.1151461;
      auVar98._0_4_ = -0.1151461;
      auVar98._4_4_ = -0.1151461;
      auVar98._16_4_ = -0.1151461;
      auVar98._20_4_ = -0.1151461;
      auVar98._24_4_ = -0.1151461;
      auVar98._28_4_ = -0.1151461;
      auVar18 = vfmadd213ps_fma(auVar20,auVar22,auVar98);
      local_1220 = ::_ps256_cephes_log_p2;
      local_3c20 = auVar18._0_8_;
      local_10a0 = local_3c20;
      uStack_3c18 = auVar18._8_8_;
      uStack_1098 = uStack_3c18;
      uStack_1090 = 0;
      uStack_1088 = 0;
      local_10c0 = local_3b20;
      uStack_10b8 = uStack_3b18;
      uStack_10b0 = uStack_3b10;
      uStack_10a8 = uStack_3b08;
      local_10e0[0] = 0.116769984;
      local_10e0[1] = 0.116769984;
      afStack_10d8[0] = 0.116769984;
      afStack_10d8[1] = 0.116769984;
      afStack_10d0[0] = 0.116769984;
      afStack_10d0[1] = 0.116769984;
      afStack_10c8[0] = 0.116769984;
      afStack_10c8[1] = 0.116769984;
      auVar99._8_4_ = 0.116769984;
      auVar99._12_4_ = 0.116769984;
      auVar99._0_4_ = 0.116769984;
      auVar99._4_4_ = 0.116769984;
      auVar99._16_4_ = 0.116769984;
      auVar99._20_4_ = 0.116769984;
      auVar99._24_4_ = 0.116769984;
      auVar99._28_4_ = 0.116769984;
      auVar18 = vfmadd213ps_fma(auVar20,ZEXT1632(auVar18),auVar99);
      local_1238 = ::_ps256_cephes_log_p3;
      local_3c20 = auVar18._0_8_;
      local_1040 = local_3c20;
      uStack_3c18 = auVar18._8_8_;
      uStack_1038 = uStack_3c18;
      uStack_1030 = 0;
      uStack_1028 = 0;
      local_1060 = local_3b20;
      uStack_1058 = uStack_3b18;
      uStack_1050 = uStack_3b10;
      uStack_1048 = uStack_3b08;
      local_1080[0] = -0.12420141;
      local_1080[1] = -0.12420141;
      afStack_1078[0] = -0.12420141;
      afStack_1078[1] = -0.12420141;
      afStack_1070[0] = -0.12420141;
      afStack_1070[1] = -0.12420141;
      afStack_1068[0] = -0.12420141;
      afStack_1068[1] = -0.12420141;
      auVar100._8_4_ = -0.12420141;
      auVar100._12_4_ = -0.12420141;
      auVar100._0_4_ = -0.12420141;
      auVar100._4_4_ = -0.12420141;
      auVar100._16_4_ = -0.12420141;
      auVar100._20_4_ = -0.12420141;
      auVar100._24_4_ = -0.12420141;
      auVar100._28_4_ = -0.12420141;
      auVar18 = vfmadd213ps_fma(auVar20,ZEXT1632(auVar18),auVar100);
      local_1250 = ::_ps256_cephes_log_p4;
      local_3c20 = auVar18._0_8_;
      local_fe0 = local_3c20;
      uStack_3c18 = auVar18._8_8_;
      uStack_fd8 = uStack_3c18;
      uStack_fd0 = 0;
      uStack_fc8 = 0;
      local_1000 = local_3b20;
      uStack_ff8 = uStack_3b18;
      uStack_ff0 = uStack_3b10;
      uStack_fe8 = uStack_3b08;
      local_1020[0] = 0.14249323;
      local_1020[1] = 0.14249323;
      afStack_1018[0] = 0.14249323;
      afStack_1018[1] = 0.14249323;
      afStack_1010[0] = 0.14249323;
      afStack_1010[1] = 0.14249323;
      afStack_1008[0] = 0.14249323;
      afStack_1008[1] = 0.14249323;
      auVar101._8_4_ = 0.14249323;
      auVar101._12_4_ = 0.14249323;
      auVar101._0_4_ = 0.14249323;
      auVar101._4_4_ = 0.14249323;
      auVar101._16_4_ = 0.14249323;
      auVar101._20_4_ = 0.14249323;
      auVar101._24_4_ = 0.14249323;
      auVar101._28_4_ = 0.14249323;
      auVar18 = vfmadd213ps_fma(auVar20,ZEXT1632(auVar18),auVar101);
      local_1268 = ::_ps256_cephes_log_p5;
      local_3c20 = auVar18._0_8_;
      local_f80 = local_3c20;
      uStack_3c18 = auVar18._8_8_;
      uStack_f78 = uStack_3c18;
      uStack_f70 = 0;
      uStack_f68 = 0;
      local_fa0 = local_3b20;
      uStack_f98 = uStack_3b18;
      uStack_f90 = uStack_3b10;
      uStack_f88 = uStack_3b08;
      local_fc0[0] = -0.16668057;
      local_fc0[1] = -0.16668057;
      afStack_fb8[0] = -0.16668057;
      afStack_fb8[1] = -0.16668057;
      afStack_fb0[0] = -0.16668057;
      afStack_fb0[1] = -0.16668057;
      afStack_fa8[0] = -0.16668057;
      afStack_fa8[1] = -0.16668057;
      auVar102._8_4_ = -0.16668057;
      auVar102._12_4_ = -0.16668057;
      auVar102._0_4_ = -0.16668057;
      auVar102._4_4_ = -0.16668057;
      auVar102._16_4_ = -0.16668057;
      auVar102._20_4_ = -0.16668057;
      auVar102._24_4_ = -0.16668057;
      auVar102._28_4_ = -0.16668057;
      auVar18 = vfmadd213ps_fma(auVar20,ZEXT1632(auVar18),auVar102);
      local_1280 = ::_ps256_cephes_log_p6;
      local_3c20 = auVar18._0_8_;
      local_f20 = local_3c20;
      uStack_3c18 = auVar18._8_8_;
      uStack_f18 = uStack_3c18;
      uStack_f10 = 0;
      uStack_f08 = 0;
      local_f40 = local_3b20;
      uStack_f38 = uStack_3b18;
      uStack_f30 = uStack_3b10;
      uStack_f28 = uStack_3b08;
      local_f60[0] = 0.20000714;
      local_f60[1] = 0.20000714;
      afStack_f58[0] = 0.20000714;
      afStack_f58[1] = 0.20000714;
      afStack_f50[0] = 0.20000714;
      afStack_f50[1] = 0.20000714;
      afStack_f48[0] = 0.20000714;
      afStack_f48[1] = 0.20000714;
      auVar103._8_4_ = 0.20000714;
      auVar103._12_4_ = 0.20000714;
      auVar103._0_4_ = 0.20000714;
      auVar103._4_4_ = 0.20000714;
      auVar103._16_4_ = 0.20000714;
      auVar103._20_4_ = 0.20000714;
      auVar103._24_4_ = 0.20000714;
      auVar103._28_4_ = 0.20000714;
      auVar18 = vfmadd213ps_fma(auVar20,ZEXT1632(auVar18),auVar103);
      local_1298 = ::_ps256_cephes_log_p7;
      local_3c20 = auVar18._0_8_;
      local_ec0 = local_3c20;
      uStack_3c18 = auVar18._8_8_;
      uStack_eb8 = uStack_3c18;
      uStack_eb0 = 0;
      uStack_ea8 = 0;
      local_ee0 = local_3b20;
      uStack_ed8 = uStack_3b18;
      uStack_ed0 = uStack_3b10;
      uStack_ec8 = uStack_3b08;
      local_f00[0] = -0.24999994;
      local_f00[1] = -0.24999994;
      afStack_ef8[0] = -0.24999994;
      afStack_ef8[1] = -0.24999994;
      afStack_ef0[0] = -0.24999994;
      afStack_ef0[1] = -0.24999994;
      afStack_ee8[0] = -0.24999994;
      afStack_ee8[1] = -0.24999994;
      auVar104._8_4_ = -0.24999994;
      auVar104._12_4_ = -0.24999994;
      auVar104._0_4_ = -0.24999994;
      auVar104._4_4_ = -0.24999994;
      auVar104._16_4_ = -0.24999994;
      auVar104._20_4_ = -0.24999994;
      auVar104._24_4_ = -0.24999994;
      auVar104._28_4_ = -0.24999994;
      auVar18 = vfmadd213ps_fma(auVar20,ZEXT1632(auVar18),auVar104);
      local_12b0 = ::_ps256_cephes_log_p8;
      local_3c20 = auVar18._0_8_;
      local_e60 = local_3c20;
      uStack_3c18 = auVar18._8_8_;
      uStack_e58 = uStack_3c18;
      uStack_e50 = 0;
      uStack_e48 = 0;
      local_e80 = local_3b20;
      uStack_e78 = uStack_3b18;
      uStack_e70 = uStack_3b10;
      uStack_e68 = uStack_3b08;
      local_ea0[0] = 0.3333333;
      local_ea0[1] = 0.3333333;
      afStack_e98[0] = 0.3333333;
      afStack_e98[1] = 0.3333333;
      afStack_e90[0] = 0.3333333;
      afStack_e90[1] = 0.3333333;
      afStack_e88[0] = 0.3333333;
      afStack_e88[1] = 0.3333333;
      auVar105._8_4_ = 0.3333333;
      auVar105._12_4_ = 0.3333333;
      auVar105._0_4_ = 0.3333333;
      auVar105._4_4_ = 0.3333333;
      auVar105._16_4_ = 0.3333333;
      auVar105._20_4_ = 0.3333333;
      auVar105._24_4_ = 0.3333333;
      auVar105._28_4_ = 0.3333333;
      auVar18 = vfmadd213ps_fma(auVar20,ZEXT1632(auVar18),auVar105);
      local_3c20 = auVar18._0_8_;
      uVar34 = local_3c20;
      uStack_3c18 = auVar18._8_8_;
      uVar35 = uStack_3c18;
      uStack_13f0 = 0;
      uStack_13e8 = 0;
      local_1420 = local_3b20;
      uStack_1418 = uStack_3b18;
      uStack_1410 = uStack_3b10;
      uStack_1408 = uStack_3b08;
      local_1400._0_4_ = auVar18._0_4_;
      local_1400._4_4_ = auVar18._4_4_;
      uStack_13f8._0_4_ = auVar18._8_4_;
      uStack_13f8._4_4_ = auVar18._12_4_;
      local_3c20._4_4_ = local_1400._4_4_ * (float)local_3b20._4_4_;
      local_3c20._0_4_ = (float)local_1400 * (float)local_3b20._0_4_;
      uStack_3c18._0_4_ = (float)uStack_13f8 * (float)uStack_39b8;
      uStack_3c18._4_4_ = uStack_13f8._4_4_ * uStack_39b8._4_4_;
      uStack_3c10._0_4_ = (float)uStack_39b0 * 0.0;
      uStack_3c10._4_4_ = uStack_39b0._4_4_ * 0.0;
      auVar166 = _local_3c20;
      local_1440 = local_3c20;
      uStack_1438 = uStack_3c18;
      uStack_3c10 = auVar166._16_8_;
      uStack_1430 = uStack_3c10;
      uStack_3c08 = (ulong)(uint)((float)uStack_39a8 * 0.0);
      uStack_1428 = uStack_3c08;
      local_1460 = CONCAT44(fStack_3bfc,local_3c00);
      uStack_1458 = CONCAT44(fStack_3bf4,fStack_3bf8);
      uStack_1450 = CONCAT44(fStack_3bec,fStack_3bf0);
      uStack_1448 = CONCAT44(fStack_3be4,fStack_3be8);
      uStack_3c08._0_4_ = (float)uStack_39a8 * 0.0 * fStack_3be8;
      local_3c20._4_4_ = local_1400._4_4_ * (float)local_3b20._4_4_ * fStack_3bfc;
      local_3c20._0_4_ = (float)local_1400 * (float)local_3b20._0_4_ * local_3c00;
      uStack_3c18._0_4_ = (float)uStack_13f8 * (float)uStack_39b8 * fStack_3bf8;
      uStack_3c18._4_4_ = uStack_13f8._4_4_ * uStack_39b8._4_4_ * fStack_3bf4;
      uStack_3c10._0_4_ = (float)uStack_39b0 * 0.0 * fStack_3bf0;
      uStack_3c10._4_4_ = uStack_39b0._4_4_ * 0.0 * fStack_3bec;
      auVar166 = _local_3c20;
      uStack_3c08._4_4_ = 0;
      auVar22 = _local_3c20;
      local_12b8 = local_3ba0;
      local_12c0 = ::_ps256_cephes_log_q1;
      local_e00 = local_3ba0;
      uStack_df8 = uStack_3b98;
      uStack_df0 = uStack_3b90;
      uStack_de8 = uStack_3b88;
      local_e20[0] = -0.00021219444;
      local_e20[1] = -0.00021219444;
      afStack_e18[0] = -0.00021219444;
      afStack_e18[1] = -0.00021219444;
      afStack_e10[0] = -0.00021219444;
      afStack_e10[1] = -0.00021219444;
      afStack_e08[0] = -0.00021219444;
      afStack_e08[1] = -0.00021219444;
      local_e40 = local_3c20;
      uStack_e38 = uStack_3c18;
      uStack_3c10 = auVar166._16_8_;
      uStack_e30 = uStack_3c10;
      uStack_3c08 = (ulong)(uint)(float)uStack_3c08;
      uStack_e28 = uStack_3c08;
      auVar106._8_4_ = -0.00021219444;
      auVar106._12_4_ = -0.00021219444;
      auVar106._0_4_ = -0.00021219444;
      auVar106._4_4_ = -0.00021219444;
      auVar106._16_4_ = -0.00021219444;
      auVar106._20_4_ = -0.00021219444;
      auVar106._24_4_ = -0.00021219444;
      auVar106._28_4_ = -0.00021219444;
      auVar18 = vfmadd213ps_fma(auVar106,_local_3ba0,auVar22);
      local_11b0 = &local_3c00;
      local_11b8 = ::_ps256_0p5;
      local_aa0 = CONCAT44(fStack_3bfc,local_3c00);
      uStack_a98 = CONCAT44(fStack_3bf4,fStack_3bf8);
      uStack_a90 = CONCAT44(fStack_3bec,fStack_3bf0);
      uStack_a88 = CONCAT44(fStack_3be4,fStack_3be8);
      auVar149._4_4_ = fStack_3bfc;
      auVar149._0_4_ = local_3c00;
      auVar149._8_4_ = fStack_3bf8;
      auVar149._12_4_ = fStack_3bf4;
      auVar149._16_4_ = fStack_3bf0;
      auVar149._20_4_ = fStack_3bec;
      auVar149._24_4_ = fStack_3be8;
      auVar149._28_4_ = fStack_3be4;
      local_ac0[0] = 0.5;
      local_ac0[1] = 0.5;
      afStack_ab8[0] = 0.5;
      afStack_ab8[1] = 0.5;
      afStack_ab0[0] = 0.5;
      afStack_ab0[1] = 0.5;
      afStack_aa8[0] = 0.5;
      afStack_aa8[1] = 0.5;
      local_3c20 = auVar18._0_8_;
      local_ae0 = local_3c20;
      uStack_3c18 = auVar18._8_8_;
      uStack_ad8 = uStack_3c18;
      uStack_ad0 = 0;
      uStack_ac8 = 0;
      auVar164._8_4_ = 0x80000000;
      auVar164._0_8_ = 0x8000000080000000;
      auVar164._12_4_ = 0x80000000;
      auVar164._16_4_ = 0x80000000;
      auVar164._20_4_ = 0x80000000;
      auVar164._24_4_ = 0x80000000;
      auVar164._28_4_ = 0x80000000;
      auVar114._8_4_ = 0.5;
      auVar114._12_4_ = 0.5;
      auVar114._0_4_ = 0.5;
      auVar114._4_4_ = 0.5;
      auVar114._16_4_ = 0.5;
      auVar114._20_4_ = 0.5;
      auVar114._24_4_ = 0.5;
      auVar114._28_4_ = 0.5;
      auVar18 = vfmadd213ps_fma(auVar114,auVar149 ^ auVar164,ZEXT1632(auVar18));
      local_3a00 = local_3b20;
      uStack_39f8 = uStack_3b18;
      uStack_39f0 = uStack_3b10;
      uStack_39e8 = uStack_3b08;
      local_3c20 = auVar18._0_8_;
      uVar36 = local_3c20;
      uStack_3c18 = auVar18._8_8_;
      uVar37 = uStack_3c18;
      uStack_3a10 = 0;
      uStack_3a08 = 0;
      local_3a20._0_4_ = auVar18._0_4_;
      local_3a20._4_4_ = auVar18._4_4_;
      uStack_3a18._0_4_ = auVar18._8_4_;
      uStack_3a18._4_4_ = auVar18._12_4_;
      local_3b20._4_4_ = (float)local_3b20._4_4_ + local_3a20._4_4_;
      local_3b20._0_4_ = (float)local_3b20._0_4_ + (float)local_3a20;
      uStack_3b18._0_4_ = (float)uStack_39b8 + (float)uStack_3a18;
      uStack_3b18._4_4_ = uStack_39b8._4_4_ + uStack_3a18._4_4_;
      uStack_3b10._0_4_ = (float)uStack_39b0 + 0.0;
      uStack_3b10._4_4_ = uStack_39b0._4_4_ + 0.0;
      auVar166 = _local_3b20;
      uStack_3b08._0_4_ = (float)uStack_39a8 + 0.0;
      uStack_3b08._4_4_ = fStack_3be4 + 0.0;
      auVar22 = _local_3b20;
      local_12d0 = local_3ba0;
      local_12d8 = ::_ps256_cephes_log_q2;
      local_12e0 = local_3b20;
      local_da0 = local_3ba0;
      uStack_d98 = uStack_3b98;
      uStack_d90 = uStack_3b90;
      uStack_d88 = uStack_3b88;
      local_dc0[0] = 0.6933594;
      local_dc0[1] = 0.6933594;
      afStack_db8[0] = 0.6933594;
      afStack_db8[1] = 0.6933594;
      afStack_db0[0] = 0.6933594;
      afStack_db0[1] = 0.6933594;
      afStack_da8[0] = 0.6933594;
      afStack_da8[1] = 0.6933594;
      local_de0 = local_3b20;
      uStack_dd8 = uStack_3b18;
      uStack_3b10 = auVar166._16_8_;
      uStack_dd0 = uStack_3b10;
      uStack_3b08 = auVar22._24_8_;
      uStack_dc8 = uStack_3b08;
      auVar107._8_4_ = 0.6933594;
      auVar107._12_4_ = 0.6933594;
      auVar107._0_4_ = 0.6933594;
      auVar107._4_4_ = 0.6933594;
      auVar107._16_4_ = 0.6933594;
      auVar107._20_4_ = 0.6933594;
      auVar107._24_4_ = 0.6933594;
      auVar107._28_4_ = 0.6933594;
      auVar18 = vfmadd213ps_fma(auVar107,_local_3ba0,auVar22);
      local_3b20 = auVar18._0_8_;
      local_15a0 = local_3b20;
      uStack_3b18 = auVar18._8_8_;
      uStack_1598 = uStack_3b18;
      uStack_1590 = 0;
      uStack_1588 = 0;
      local_15c0 = local_3b80._0_8_;
      uStack_15b8 = local_3b80._8_8_;
      uStack_15b0 = local_3b80._16_8_;
      uStack_15a8 = local_3b80._24_8_;
      _local_3c20 = vpor_avx2(ZEXT1632(auVar18),local_3b80);
      local_4e80 = auVar16._0_8_;
      local_3ca0 = local_4e80;
      uStack_4e78 = auVar16._8_8_;
      uStack_3c98 = uStack_4e78;
      uStack_4e70 = auVar16._16_8_;
      uStack_3c90 = uStack_4e70;
      uStack_4e68 = auVar16._24_8_;
      uStack_3c88 = uStack_4e68;
      auVar16 = vpand_avx2(*(undefined1 (*) [32])*local_4bf8,auVar16);
      local_4ee0 = auVar16._0_8_;
      uStack_4ed8 = auVar16._8_8_;
      uStack_4ed0 = auVar16._16_8_;
      uStack_4ec8 = auVar16._24_8_;
      local_3940._0_4_ = auVar16._0_4_;
      local_3940._4_4_ = auVar16._4_4_;
      uStack_3938._0_4_ = auVar16._8_4_;
      uStack_3938._4_4_ = auVar16._12_4_;
      uStack_3930._0_4_ = auVar16._16_4_;
      uStack_3930._4_4_ = auVar16._20_4_;
      uStack_3928._0_4_ = auVar16._24_4_;
      uStack_3928._4_4_ = auVar16._28_4_;
      local_3960._0_4_ = local_3c20._0_4_;
      local_3960._4_4_ = local_3c20._4_4_;
      uStack_3958._0_4_ = local_3c20._8_4_;
      uStack_3958._4_4_ = local_3c20._12_4_;
      uStack_3950._0_4_ = local_3c20._16_4_;
      uStack_3950._4_4_ = local_3c20._20_4_;
      uStack_3948._0_4_ = local_3c20._24_4_;
      uStack_3948._4_4_ = local_3c20._28_4_;
      local_3608 = local_4bf8;
      local_3640 = CONCAT44(local_3940._4_4_ + local_3960._4_4_,
                            (float)local_3940 + (float)local_3960);
      uStack_3638 = CONCAT44(uStack_3938._4_4_ + uStack_3958._4_4_,
                             (float)uStack_3938 + (float)uStack_3958);
      uStack_3630 = CONCAT44(uStack_3930._4_4_ + uStack_3950._4_4_,
                             (float)uStack_3930 + (float)uStack_3950);
      uStack_3628 = CONCAT44(uStack_3928._4_4_ + uStack_3948._4_4_,
                             (float)uStack_3928 + (float)uStack_3948);
      *(undefined8 *)*local_4bf8 = local_3640;
      *(undefined8 *)(*local_4bf8 + 8) = uStack_3638;
      *(undefined8 *)(*local_4bf8 + 0x10) = uStack_3630;
      *(undefined8 *)(*local_4bf8 + 0x18) = uStack_3628;
      local_4bf8 = (undefined1 (*) [64])(*local_4bf8 + 0x20);
      local_3c40 = local_3c80;
      uStack_3c38 = uStack_3c78;
      uStack_3c30 = uStack_3c70;
      uStack_3c28 = uStack_3c68;
      _local_3b20 = ZEXT1632(auVar18);
      local_3a20 = uVar36;
      uStack_3a18 = uVar37;
      local_39e0 = local_3be0._0_8_;
      uStack_39d8 = local_3be0._8_8_;
      uStack_39d0 = local_3be0._16_8_;
      uStack_39c8 = local_3be0._24_8_;
      local_39c0 = uVar30;
      uStack_39b8 = uVar31;
      uStack_39b0 = uVar32;
      uStack_39a8 = uVar33;
      local_3980 = uVar26;
      uStack_3978 = uVar27;
      uStack_3970 = uVar28;
      uStack_3968 = uVar29;
      local_3960 = local_3c20;
      uStack_3958 = uStack_3c18;
      uStack_3950 = uStack_3c10;
      uStack_3948 = uStack_3c08;
      local_3940 = local_4ee0;
      uStack_3938 = uStack_4ed8;
      uStack_3930 = uStack_4ed0;
      uStack_3928 = uStack_4ec8;
      local_3900 = local_16e0._0_8_;
      uStack_38f8 = local_16e0._8_8_;
      uStack_38f0 = auStack_16d0._0_8_;
      uStack_38e8 = auStack_16d0._8_8_;
      _local_38c0 = auVar41;
      _local_3820 = auVar93;
      local_3800 = auVar161;
      local_3760 = uVar23;
      uStack_3758 = uVar24;
      local_1640 = auVar165._0_8_;
      local_1480 = local_14a0;
      uStack_1478 = uStack_1498;
      uStack_1470 = uStack_1490;
      uStack_1468 = uStack_1488;
      local_1400 = uVar34;
      uStack_13f8 = uVar35;
      local_13c0 = local_13e0;
      uStack_13b8 = uStack_13d8;
      uStack_13b0 = uStack_13d0;
      uStack_13a8 = uStack_13c8;
      local_1368 = local_1388;
      local_1360 = local_1378;
      local_1350 = local_1388;
      local_1348 = local_1378;
      local_1338 = local_1388;
      local_1330 = local_1378;
      local_1320 = local_1388;
      local_1318 = local_1378;
      local_1308 = local_1388;
      local_1300 = local_1378;
      local_12e8 = local_1388;
      local_12a0 = local_12c8;
      local_1290 = local_12a8;
      local_1288 = local_12c8;
      local_1278 = local_12a8;
      local_1270 = local_12c8;
      local_1260 = local_12a8;
      local_1258 = local_12c8;
      local_1248 = local_12a8;
      local_1240 = local_12c8;
      local_1230 = local_12a8;
      local_1228 = local_12c8;
      local_1218 = local_12a8;
      local_1210 = local_12c8;
      local_1200 = local_12a8;
      local_11f8 = local_12c8;
      local_11f0 = local_1388;
      local_11d8 = local_1388;
      local_11c8 = local_11e0;
      local_11c0 = local_12c8;
      local_980 = local_3840._0_8_;
      uStack_978 = local_3840._8_8_;
      uStack_970 = local_3840._16_8_;
      uStack_968 = local_3840._24_8_;
    }
    local_35e4 = 0x3f800000;
    local_3600 = 0x3f800000;
    uStack_35fc = 0x3f800000;
    uStack_35f8 = 0x3f800000;
    uStack_35f4 = 0x3f800000;
    local_35e0 = (undefined1  [16])0x0;
    for (; local_31b0 = local_4b90, local_4c20 = local_3210, local_4c50 + 3 < local_4be8;
        local_4c50 = local_4c50 + 4) {
      local_35c8 = local_4bf8;
      local_35b0 = *(undefined8 *)*local_4bf8;
      uStack_35a8 = *(undefined8 *)(*local_4bf8 + 8);
      local_35c0 = 0;
      uStack_35b8 = 0;
      auVar18 = vcmpps_avx(ZEXT816(0),*(undefined1 (*) [16])*local_4bf8,1);
      local_3580[0] = 0x7fffffff;
      local_3580[1] = 0x7fffffff;
      aiStack_3578[0] = 0x7fffffff;
      aiStack_3578[1] = 0x7fffffff;
      auVar17._8_4_ = 0x7fffffff;
      auVar17._12_4_ = 0x7fffffff;
      auVar17._0_4_ = 0x7fffffff;
      auVar17._4_4_ = 0x7fffffff;
      auVar165 = vpand_avx(*(undefined1 (*) [16])*local_4bf8,auVar17);
      local_3240 = 0;
      uStack_3238 = 0;
      local_4f30 = auVar165._0_8_;
      local_3250 = local_4f30;
      uStack_4f28 = auVar165._8_8_;
      uStack_3248 = uStack_4f28;
      auVar165 = vsubps_avx(ZEXT816(0),auVar165);
      local_3340 = (undefined1  [16])0x0;
      local_3390 = 0x3f800000;
      uStack_338c = 0x3f800000;
      uStack_3388 = 0x3f800000;
      uStack_3384 = 0x3f800000;
      local_3350._0_8_ = auVar165._0_8_;
      local_d0 = local_3350._0_8_;
      local_3350._8_8_ = auVar165._8_8_;
      uStack_c8 = local_3350._8_8_;
      local_e0 = 0x42b0c0a5;
      uStack_dc = 0x42b0c0a5;
      uStack_d8 = 0x42b0c0a5;
      uStack_d4 = 0x42b0c0a5;
      auVar146._8_4_ = 0x42b0c0a5;
      auVar146._0_8_ = 0x42b0c0a542b0c0a5;
      auVar146._12_4_ = 0x42b0c0a5;
      auVar165 = vminps_avx(auVar165,auVar146);
      local_3350._0_8_ = auVar165._0_8_;
      local_800 = local_3350._0_8_;
      local_3350._8_8_ = auVar165._8_8_;
      uStack_7f8 = local_3350._8_8_;
      local_810 = 0xc2b0c0a5;
      uStack_80c = 0xc2b0c0a5;
      uStack_808 = 0xc2b0c0a5;
      uStack_804 = 0xc2b0c0a5;
      auVar121._8_4_ = 0xc2b0c0a5;
      auVar121._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar121._12_4_ = 0xc2b0c0a5;
      auVar19 = vmaxps_avx(auVar165,auVar121);
      local_3350._0_8_ = auVar19._0_8_;
      uVar23 = local_3350._0_8_;
      local_3350._8_8_ = auVar19._8_8_;
      uVar24 = local_3350._8_8_;
      local_6c0 = 0x3fb8aa3b;
      uStack_6bc = 0x3fb8aa3b;
      uStack_6b8 = 0x3fb8aa3b;
      uStack_6b4 = 0x3fb8aa3b;
      local_6b0._0_4_ = auVar19._0_4_;
      local_6b0._4_4_ = auVar19._4_4_;
      uStack_6a8._0_4_ = auVar19._8_4_;
      uStack_6a8._4_4_ = auVar19._12_4_;
      local_3370._4_4_ = local_6b0._4_4_ * 1.442695;
      local_3370._0_4_ = (float)local_6b0 * 1.442695;
      uStack_3368._0_4_ = (float)uStack_6a8 * 1.442695;
      uStack_3368._4_4_ = uStack_6a8._4_4_ * 1.442695;
      local_32c0 = local_3370;
      uStack_32b8 = uStack_3368;
      local_32d0 = 0x3f000000;
      uStack_32cc = 0x3f000000;
      uStack_32c8 = 0x3f000000;
      uStack_32c4 = 0x3f000000;
      local_3370._0_4_ = (float)local_6b0 * 1.442695 + 0.5;
      local_3370._4_4_ = local_6b0._4_4_ * 1.442695 + 0.5;
      fVar168 = (float)uStack_6a8 * 1.442695 + 0.5;
      fVar169 = uStack_6a8._4_4_ * 1.442695 + 0.5;
      uStack_3368._0_4_ = fVar168;
      uStack_3368._4_4_ = fVar169;
      local_b0 = local_3370;
      uStack_a8 = uStack_3368;
      local_3380._4_4_ = (int)(float)local_3370._4_4_;
      local_3380._0_4_ = (int)(float)local_3370._0_4_;
      local_3380._8_4_ = (int)fVar168;
      local_3380._12_4_ = (int)fVar169;
      local_740 = local_3380._0_8_;
      uStack_738 = local_3380._8_8_;
      auVar126._8_8_ = local_3380._8_8_;
      auVar126._0_8_ = local_3380._0_8_;
      auVar17 = vcvtdq2ps_avx(auVar126);
      local_3360 = auVar17._0_8_;
      local_3320 = local_3360;
      uStack_3358 = auVar17._8_8_;
      uStack_3318 = uStack_3358;
      local_3330 = local_3370;
      uStack_3328 = uStack_3368;
      auVar44._8_8_ = uStack_3368;
      auVar44._0_8_ = local_3370;
      auVar165 = vcmpps_avx(auVar44,auVar17,1);
      local_33a0._0_8_ = auVar165._0_8_;
      local_3300 = local_33a0._0_8_;
      local_33a0._8_8_ = auVar165._8_8_;
      uStack_32f8 = local_33a0._8_8_;
      local_3310 = 0x3f8000003f800000;
      uStack_3308 = 0x3f8000003f800000;
      auVar45._8_8_ = 0x3f8000003f800000;
      auVar45._0_8_ = 0x3f8000003f800000;
      local_33a0 = vpand_avx(auVar165,auVar45);
      local_32a0 = local_3360;
      uStack_3298 = uStack_3358;
      local_32b0 = local_33a0._0_8_;
      uStack_32a8 = local_33a0._8_8_;
      _local_3370 = vsubps_avx(auVar17,local_33a0);
      local_4a8 = local_3370;
      local_498 = ::_ps_cephes_exp_C1;
      local_638 = local_3350;
      local_120 = local_3370;
      uStack_118 = uStack_3368;
      local_130[0] = 0.6933594;
      local_130[1] = 0.6933594;
      afStack_128[0] = 0.6933594;
      afStack_128[1] = 0.6933594;
      local_140 = local_3350._0_8_;
      uStack_138 = local_3350._8_8_;
      auVar144._8_4_ = 0.6933594;
      auVar144._12_4_ = 0.6933594;
      auVar144._0_4_ = 0.6933594;
      auVar144._4_4_ = 0.6933594;
      auVar165 = vfnmadd213ps_fma(auVar144,_local_3370,auVar19);
      local_4b0 = ::_ps_cephes_exp_C2;
      local_f0 = local_3370;
      uStack_e8 = uStack_3368;
      local_100[0] = -0.00021219444;
      local_100[1] = -0.00021219444;
      afStack_f8[0] = -0.00021219444;
      afStack_f8[1] = -0.00021219444;
      local_3350._0_8_ = auVar165._0_8_;
      local_110 = local_3350._0_8_;
      local_3350._8_8_ = auVar165._8_8_;
      uStack_108 = local_3350._8_8_;
      auVar145._8_4_ = -0.00021219444;
      auVar145._12_4_ = -0.00021219444;
      auVar145._0_4_ = -0.00021219444;
      auVar145._4_4_ = -0.00021219444;
      local_3350 = vfnmadd213ps_fma(auVar145,_local_3370,auVar165);
      local_6e0 = local_3350._0_8_;
      uStack_6d8 = local_3350._8_8_;
      local_6d0._0_4_ = local_3350._0_4_;
      local_6d0._4_4_ = local_3350._4_4_;
      uStack_6c8._0_4_ = local_3350._8_4_;
      uStack_6c8._4_4_ = local_3350._12_4_;
      local_3360._4_4_ = local_6d0._4_4_ * local_6d0._4_4_;
      local_3360._0_4_ = (float)local_6d0 * (float)local_6d0;
      uStack_3358._0_4_ = (float)uStack_6c8 * (float)uStack_6c8;
      uStack_3358._4_4_ = uStack_6c8._4_4_ * uStack_6c8._4_4_;
      uStack_33a8._0_4_ = 0x39506967;
      local_33b0 = (undefined1  [8])0x3950696739506967;
      uStack_33a8._4_4_ = 0x39506967;
      local_628 = local_33b0;
      local_5c0 = ::_ps_cephes_exp_p1;
      local_270 = 0x3950696739506967;
      uStack_268 = uStack_33a8;
      local_280 = local_3350._0_8_;
      uStack_278 = local_3350._8_8_;
      local_290[0] = 0.0013981999;
      local_290[1] = 0.0013981999;
      afStack_288[0] = 0.0013981999;
      afStack_288[1] = 0.0013981999;
      auVar138._8_4_ = 0.0013981999;
      auVar138._12_4_ = 0.0013981999;
      auVar138._0_4_ = 0.0013981999;
      auVar138._4_4_ = 0.0013981999;
      auVar165 = vfmadd213ps_fma(local_3350,_local_33b0,auVar138);
      local_5d8 = ::_ps_cephes_exp_p2;
      local_33b0 = auVar165._0_8_;
      local_240 = local_33b0;
      uStack_33a8 = auVar165._8_8_;
      uStack_238 = uStack_33a8;
      local_250 = local_3350._0_8_;
      uStack_248 = local_3350._8_8_;
      local_260[0] = 0.008333452;
      local_260[1] = 0.008333452;
      afStack_258[0] = 0.008333452;
      afStack_258[1] = 0.008333452;
      auVar139._8_4_ = 0.008333452;
      auVar139._12_4_ = 0.008333452;
      auVar139._0_4_ = 0.008333452;
      auVar139._4_4_ = 0.008333452;
      auVar165 = vfmadd213ps_fma(local_3350,auVar165,auVar139);
      local_5f0 = ::_ps_cephes_exp_p3;
      local_33b0 = auVar165._0_8_;
      local_210 = local_33b0;
      uStack_33a8 = auVar165._8_8_;
      uStack_208 = uStack_33a8;
      local_220 = local_3350._0_8_;
      uStack_218 = local_3350._8_8_;
      local_230[0] = 0.041665796;
      local_230[1] = 0.041665796;
      afStack_228[0] = 0.041665796;
      afStack_228[1] = 0.041665796;
      auVar140._8_4_ = 0.041665796;
      auVar140._12_4_ = 0.041665796;
      auVar140._0_4_ = 0.041665796;
      auVar140._4_4_ = 0.041665796;
      auVar165 = vfmadd213ps_fma(local_3350,auVar165,auVar140);
      local_608 = ::_ps_cephes_exp_p4;
      local_33b0 = auVar165._0_8_;
      local_1e0 = local_33b0;
      uStack_33a8 = auVar165._8_8_;
      uStack_1d8 = uStack_33a8;
      local_1f0 = local_3350._0_8_;
      uStack_1e8 = local_3350._8_8_;
      local_200[0] = 0.16666666;
      local_200[1] = 0.16666666;
      afStack_1f8[0] = 0.16666666;
      afStack_1f8[1] = 0.16666666;
      auVar141._8_4_ = 0.16666666;
      auVar141._12_4_ = 0.16666666;
      auVar141._0_4_ = 0.16666666;
      auVar141._4_4_ = 0.16666666;
      auVar165 = vfmadd213ps_fma(local_3350,auVar165,auVar141);
      local_620 = ::_ps_cephes_exp_p5;
      local_33b0 = auVar165._0_8_;
      local_1b0 = local_33b0;
      uStack_33a8 = auVar165._8_8_;
      uStack_1a8 = uStack_33a8;
      local_1c0 = local_3350._0_8_;
      uStack_1b8 = local_3350._8_8_;
      local_1d0[0] = 0.5;
      local_1d0[1] = 0.5;
      afStack_1c8[0] = 0.5;
      afStack_1c8[1] = 0.5;
      auVar142._8_4_ = 0.5;
      auVar142._12_4_ = 0.5;
      auVar142._0_4_ = 0.5;
      auVar142._4_4_ = 0.5;
      auVar165 = vfmadd213ps_fma(local_3350,auVar165,auVar142);
      local_630 = local_3360;
      local_33b0 = auVar165._0_8_;
      local_180 = local_33b0;
      uStack_33a8 = auVar165._8_8_;
      uStack_178 = uStack_33a8;
      local_190 = local_3360;
      uStack_188 = uStack_3358;
      local_1a0 = local_3350._0_8_;
      uStack_198 = local_3350._8_8_;
      auVar165 = vfmadd213ps_fma(_local_3360,auVar165,local_3350);
      local_33b0 = auVar165._0_8_;
      uVar26 = local_33b0;
      uStack_33a8 = auVar165._8_8_;
      uVar27 = uStack_33a8;
      local_32f0 = 0x3f8000003f800000;
      uStack_32e8 = 0x3f8000003f800000;
      local_32e0._0_4_ = auVar165._0_4_;
      local_32e0._4_4_ = auVar165._4_4_;
      uStack_32d8._0_4_ = auVar165._8_4_;
      uStack_32d8._4_4_ = auVar165._12_4_;
      local_33b0._4_4_ = local_32e0._4_4_ + 1.0;
      local_33b0._0_4_ = (float)local_32e0 + 1.0;
      uStack_33a8._0_4_ = (float)uStack_32d8 + 1.0;
      uStack_33a8._4_4_ = uStack_32d8._4_4_ + 1.0;
      local_c0._0_4_ = local_3370._0_4_;
      local_c0._4_4_ = local_3370._4_4_;
      uStack_b8._0_4_ = local_3370._8_4_;
      uStack_b8._4_4_ = local_3370._12_4_;
      local_3380._4_4_ = (int)local_c0._4_4_;
      local_3380._0_4_ = (int)(float)local_c0;
      local_3380._8_4_ = (int)(float)uStack_b8;
      local_3380._12_4_ = (int)uStack_b8._4_4_;
      local_90 = local_3380._0_8_;
      uStack_88 = local_3380._8_8_;
      local_a0 = 0x7f0000007f;
      uStack_98 = 0x7f0000007f;
      auVar148._8_8_ = local_3380._8_8_;
      auVar148._0_8_ = local_3380._0_8_;
      auVar147._8_8_ = 0x7f0000007f;
      auVar147._0_8_ = 0x7f0000007f;
      auVar165 = vpaddd_avx(auVar148,auVar147);
      local_3380._0_8_ = auVar165._0_8_;
      local_70 = local_3380._0_8_;
      local_3380._8_8_ = auVar165._8_8_;
      uStack_68 = local_3380._8_8_;
      local_74 = 0x17;
      local_3380 = vpslld_avx(auVar165,ZEXT416(0x17));
      local_60 = local_3380._0_8_;
      uStack_58 = local_3380._8_8_;
      local_33c0 = local_3380._0_8_;
      uStack_33b8 = local_3380._8_8_;
      local_6f0 = local_33b0;
      uStack_6e8 = uStack_33a8;
      local_700 = local_3380._0_8_;
      uStack_6f8 = local_3380._8_8_;
      local_33b0._0_4_ = ((float)local_32e0 + 1.0) * local_3380._0_4_;
      local_33b0._4_4_ = (local_32e0._4_4_ + 1.0) * local_3380._4_4_;
      fVar168 = ((float)uStack_32d8 + 1.0) * local_3380._8_4_;
      fVar169 = (uStack_32d8._4_4_ + 1.0) * local_3380._12_4_;
      uStack_33a8._0_4_ = fVar168;
      uStack_33a8._4_4_ = fVar169;
      local_33e0 = local_33b0;
      uStack_33d8 = uStack_33a8;
      auVar173._0_8_ = CONCAT44((float)local_33b0._4_4_ + 1.0,(float)local_33b0._0_4_ + 1.0);
      auVar173._8_4_ = fVar168 + 1.0;
      auVar173._12_4_ = fVar169 + 1.0;
      local_3500 = 0x3f800000;
      uStack_34fc = 0x3f800000;
      uStack_34f8 = 0x3f800000;
      uStack_34f4 = 0x3f800000;
      uStack_34d8 = auVar173._8_8_;
      uStack_818 = uStack_34d8;
      local_34d0 = (undefined1  [16])0x0;
      local_830 = 0;
      uStack_828 = 0;
      auVar120._8_8_ = uStack_34d8;
      auVar120._0_8_ = auVar173._0_8_;
      local_3510 = vcmpps_avx(auVar120,ZEXT816(0),2);
      uStack_7d8 = uStack_34d8;
      local_7f0 = 0x800000;
      uStack_7ec = 0x800000;
      uStack_7e8 = 0x800000;
      uStack_7e4 = 0x800000;
      auVar123._8_8_ = uStack_34d8;
      auVar123._0_8_ = auVar173._0_8_;
      auVar122._8_4_ = 0x800000;
      auVar122._0_8_ = 0x80000000800000;
      auVar122._12_4_ = 0x800000;
      auVar165 = vmaxps_avx(auVar123,auVar122);
      local_34e0 = auVar165._0_8_;
      local_7b0 = local_34e0;
      uStack_34d8 = auVar165._8_8_;
      uStack_7a8 = uStack_34d8;
      local_7c0 = local_34e0;
      uStack_7b8 = uStack_34d8;
      local_7c4 = 0x17;
      auVar19 = vpsrld_avx(auVar165,ZEXT416(0x17));
      local_3470 = local_34e0;
      uStack_3468 = uStack_34d8;
      local_3480 = 0x807fffff;
      uStack_347c = 0x807fffff;
      uStack_3478 = 0x807fffff;
      uStack_3474 = 0x807fffff;
      auVar43._8_4_ = 0x807fffff;
      auVar43._0_8_ = 0x807fffff807fffff;
      auVar43._12_4_ = 0x807fffff;
      auVar165 = vpand_avx(auVar165,auVar43);
      local_34e0 = auVar165._0_8_;
      local_770 = local_34e0;
      uStack_34d8 = auVar165._8_8_;
      uStack_768 = uStack_34d8;
      local_780 = 0x3f000000;
      uStack_77c = 0x3f000000;
      uStack_778 = 0x3f000000;
      uStack_774 = 0x3f000000;
      auVar124._8_4_ = 0x3f000000;
      auVar124._0_8_ = 0x3f0000003f000000;
      auVar124._12_4_ = 0x3f000000;
      auVar17 = vpor_avx(auVar165,auVar124);
      local_34f0._0_8_ = auVar19._0_8_;
      local_750 = local_34f0._0_8_;
      local_34f0._8_8_ = auVar19._8_8_;
      uStack_748 = local_34f0._8_8_;
      local_760 = 0x7f0000007f;
      uStack_758 = 0x7f0000007f;
      auVar125._8_8_ = 0x7f0000007f;
      auVar125._0_8_ = 0x7f0000007f;
      local_34f0 = vpsubd_avx(auVar19,auVar125);
      local_730 = local_34f0._0_8_;
      uStack_728 = local_34f0._8_8_;
      auVar165 = vcvtdq2ps_avx(local_34f0);
      local_3520 = auVar165._0_8_;
      uVar28 = local_3520;
      uStack_3518 = auVar165._8_8_;
      uVar29 = uStack_3518;
      local_3420 = 0x3f8000003f800000;
      uStack_3418 = 0x3f8000003f800000;
      local_3410._0_4_ = auVar165._0_4_;
      local_3410._4_4_ = auVar165._4_4_;
      uStack_3408._0_4_ = auVar165._8_4_;
      uStack_3408._4_4_ = auVar165._12_4_;
      local_3520._4_4_ = local_3410._4_4_ + 1.0;
      local_3520._0_4_ = (float)local_3410 + 1.0;
      uStack_3518._0_4_ = (float)uStack_3408 + 1.0;
      uStack_3518._4_4_ = uStack_3408._4_4_ + 1.0;
      local_34e0 = auVar17._0_8_;
      local_710 = local_34e0;
      uStack_34d8 = auVar17._8_8_;
      uStack_708 = uStack_34d8;
      local_720 = 0x3f3504f3;
      uStack_71c = 0x3f3504f3;
      uStack_718 = 0x3f3504f3;
      uStack_714 = 0x3f3504f3;
      auVar127._8_4_ = 0x3f3504f3;
      auVar127._0_8_ = 0x3f3504f33f3504f3;
      auVar127._12_4_ = 0x3f3504f3;
      local_3530 = vcmpps_avx(auVar17,auVar127,1);
      local_3490 = local_34e0;
      uStack_3488 = uStack_34d8;
      local_34a0 = local_3530._0_8_;
      uStack_3498 = local_3530._8_8_;
      local_3540 = vpand_avx(auVar17,local_3530);
      local_3260 = local_34e0;
      uStack_3258 = uStack_34d8;
      local_3270 = 0x3f8000003f800000;
      uStack_3268 = 0x3f8000003f800000;
      auVar47._8_8_ = 0x3f8000003f800000;
      auVar47._0_8_ = 0x3f8000003f800000;
      auVar165 = vsubps_avx(auVar17,auVar47);
      local_3280 = local_3520;
      uStack_3278 = uStack_3518;
      local_34b0 = 0x3f8000003f800000;
      uStack_34a8 = 0x3f8000003f800000;
      local_34c0 = local_3530._0_8_;
      uStack_34b8 = local_3530._8_8_;
      auVar19._8_8_ = 0x3f8000003f800000;
      auVar19._0_8_ = 0x3f8000003f800000;
      local_3290 = vpand_avx(auVar19,local_3530);
      auVar46._8_8_ = uStack_3518;
      auVar46._0_8_ = local_3520;
      _local_3520 = vsubps_avx(auVar46,local_3290);
      local_34e0 = auVar165._0_8_;
      uVar30 = local_34e0;
      uStack_34d8 = auVar165._8_8_;
      uVar31 = uStack_34d8;
      local_3430._0_4_ = auVar165._0_4_;
      local_3430._4_4_ = auVar165._4_4_;
      uStack_3428._0_4_ = auVar165._8_4_;
      uStack_3428._4_4_ = auVar165._12_4_;
      local_3440._0_4_ = local_3540._0_4_;
      local_3440._4_4_ = local_3540._4_4_;
      uStack_3438._0_4_ = local_3540._8_4_;
      uStack_3438._4_4_ = local_3540._12_4_;
      local_34e0._0_4_ = (float)local_3430 + (float)local_3440;
      local_34e0._4_4_ = local_3430._4_4_ + local_3440._4_4_;
      uStack_3428._0_4_ = (float)uStack_3428 + (float)uStack_3438;
      uStack_3428._4_4_ = uStack_3428._4_4_ + uStack_3438._4_4_;
      uStack_34d8._0_4_ = (float)uStack_3428;
      uStack_34d8._4_4_ = uStack_3428._4_4_;
      local_660 = local_34e0;
      uStack_658 = uStack_34d8;
      local_3550 = (float)local_34e0._0_4_ * (float)local_34e0._0_4_;
      fStack_354c = (float)local_34e0._4_4_ * (float)local_34e0._4_4_;
      fStack_3548 = (float)uStack_3428 * (float)uStack_3428;
      fStack_3544 = uStack_3428._4_4_ * uStack_3428._4_4_;
      uStack_3558._0_4_ = 0x3d9021bb;
      local_3560 = (undefined1  [8])0x3d9021bb3d9021bb;
      uStack_3558._4_4_ = 0x3d9021bb;
      local_590 = local_3560;
      local_570 = local_34e0;
      local_4d0 = ::_ps_cephes_log_p1;
      local_450 = 0x3d9021bb3d9021bb;
      uStack_448 = uStack_3558;
      local_460 = local_34e0;
      uStack_458 = uStack_34d8;
      local_470[0] = -0.1151461;
      local_470[1] = -0.1151461;
      afStack_468[0] = -0.1151461;
      afStack_468[1] = -0.1151461;
      auVar128._8_4_ = -0.1151461;
      auVar128._12_4_ = -0.1151461;
      auVar128._0_4_ = -0.1151461;
      auVar128._4_4_ = -0.1151461;
      auVar165 = vfmadd213ps_fma(_local_34e0,_local_3560,auVar128);
      local_4e8 = ::_ps_cephes_log_p2;
      local_3560 = auVar165._0_8_;
      local_420 = local_3560;
      uStack_3558 = auVar165._8_8_;
      uStack_418 = uStack_3558;
      local_430 = local_34e0;
      uStack_428 = uStack_34d8;
      local_440[0] = 0.116769984;
      local_440[1] = 0.116769984;
      afStack_438[0] = 0.116769984;
      afStack_438[1] = 0.116769984;
      auVar129._8_4_ = 0.116769984;
      auVar129._12_4_ = 0.116769984;
      auVar129._0_4_ = 0.116769984;
      auVar129._4_4_ = 0.116769984;
      auVar165 = vfmadd213ps_fma(_local_34e0,auVar165,auVar129);
      local_500 = ::_ps_cephes_log_p3;
      local_3560 = auVar165._0_8_;
      local_3f0 = local_3560;
      uStack_3558 = auVar165._8_8_;
      uStack_3e8 = uStack_3558;
      local_400 = local_34e0;
      uStack_3f8 = uStack_34d8;
      local_410[0] = -0.12420141;
      local_410[1] = -0.12420141;
      afStack_408[0] = -0.12420141;
      afStack_408[1] = -0.12420141;
      auVar130._8_4_ = -0.12420141;
      auVar130._12_4_ = -0.12420141;
      auVar130._0_4_ = -0.12420141;
      auVar130._4_4_ = -0.12420141;
      auVar165 = vfmadd213ps_fma(_local_34e0,auVar165,auVar130);
      local_518 = ::_ps_cephes_log_p4;
      local_3560 = auVar165._0_8_;
      local_3c0 = local_3560;
      uStack_3558 = auVar165._8_8_;
      uStack_3b8 = uStack_3558;
      local_3d0 = local_34e0;
      uStack_3c8 = uStack_34d8;
      local_3e0[0] = 0.14249323;
      local_3e0[1] = 0.14249323;
      afStack_3d8[0] = 0.14249323;
      afStack_3d8[1] = 0.14249323;
      auVar131._8_4_ = 0.14249323;
      auVar131._12_4_ = 0.14249323;
      auVar131._0_4_ = 0.14249323;
      auVar131._4_4_ = 0.14249323;
      auVar165 = vfmadd213ps_fma(_local_34e0,auVar165,auVar131);
      local_530 = ::_ps_cephes_log_p5;
      local_3560 = auVar165._0_8_;
      local_390 = local_3560;
      uStack_3558 = auVar165._8_8_;
      uStack_388 = uStack_3558;
      local_3a0 = local_34e0;
      uStack_398 = uStack_34d8;
      local_3b0[0] = -0.16668057;
      local_3b0[1] = -0.16668057;
      afStack_3a8[0] = -0.16668057;
      afStack_3a8[1] = -0.16668057;
      auVar132._8_4_ = -0.16668057;
      auVar132._12_4_ = -0.16668057;
      auVar132._0_4_ = -0.16668057;
      auVar132._4_4_ = -0.16668057;
      auVar165 = vfmadd213ps_fma(_local_34e0,auVar165,auVar132);
      local_548 = ::_ps_cephes_log_p6;
      local_3560 = auVar165._0_8_;
      local_360 = local_3560;
      uStack_3558 = auVar165._8_8_;
      uStack_358 = uStack_3558;
      local_370 = local_34e0;
      uStack_368 = uStack_34d8;
      local_380[0] = 0.20000714;
      local_380[1] = 0.20000714;
      afStack_378[0] = 0.20000714;
      afStack_378[1] = 0.20000714;
      auVar133._8_4_ = 0.20000714;
      auVar133._12_4_ = 0.20000714;
      auVar133._0_4_ = 0.20000714;
      auVar133._4_4_ = 0.20000714;
      auVar165 = vfmadd213ps_fma(_local_34e0,auVar165,auVar133);
      local_560 = ::_ps_cephes_log_p7;
      local_3560 = auVar165._0_8_;
      local_330 = local_3560;
      uStack_3558 = auVar165._8_8_;
      uStack_328 = uStack_3558;
      local_340 = local_34e0;
      uStack_338 = uStack_34d8;
      local_350[0] = -0.24999994;
      local_350[1] = -0.24999994;
      afStack_348[0] = -0.24999994;
      afStack_348[1] = -0.24999994;
      auVar134._8_4_ = -0.24999994;
      auVar134._12_4_ = -0.24999994;
      auVar134._0_4_ = -0.24999994;
      auVar134._4_4_ = -0.24999994;
      auVar165 = vfmadd213ps_fma(_local_34e0,auVar165,auVar134);
      local_578 = ::_ps_cephes_log_p8;
      local_3560 = auVar165._0_8_;
      local_300 = local_3560;
      uStack_3558 = auVar165._8_8_;
      uStack_2f8 = uStack_3558;
      local_310 = local_34e0;
      uStack_308 = uStack_34d8;
      local_320[0] = 0.3333333;
      local_320[1] = 0.3333333;
      afStack_318[0] = 0.3333333;
      afStack_318[1] = 0.3333333;
      auVar135._8_4_ = 0.3333333;
      auVar135._12_4_ = 0.3333333;
      auVar135._0_4_ = 0.3333333;
      auVar135._4_4_ = 0.3333333;
      auVar165 = vfmadd213ps_fma(_local_34e0,auVar165,auVar135);
      local_3560 = auVar165._0_8_;
      uVar32 = local_3560;
      uStack_3558 = auVar165._8_8_;
      uVar33 = uStack_3558;
      local_680 = local_34e0;
      uStack_678 = uStack_34d8;
      local_670._0_4_ = auVar165._0_4_;
      local_670._4_4_ = auVar165._4_4_;
      uStack_668._0_4_ = auVar165._8_4_;
      uStack_668._4_4_ = auVar165._12_4_;
      local_3560._4_4_ = local_670._4_4_ * (float)local_34e0._4_4_;
      local_3560._0_4_ = (float)local_670 * (float)local_34e0._0_4_;
      uStack_3558._0_4_ = (float)uStack_668 * (float)uStack_3428;
      uStack_3558._4_4_ = uStack_668._4_4_ * uStack_3428._4_4_;
      local_690 = local_3560;
      uStack_688 = uStack_3558;
      local_6a0 = CONCAT44(fStack_354c,local_3550);
      uStack_698 = CONCAT44(fStack_3544,fStack_3548);
      local_3560._4_4_ = local_670._4_4_ * (float)local_34e0._4_4_ * fStack_354c;
      local_3560._0_4_ = (float)local_670 * (float)local_34e0._0_4_ * local_3550;
      uStack_3558._0_4_ = (float)uStack_668 * (float)uStack_3428 * fStack_3548;
      uStack_3558._4_4_ = uStack_668._4_4_ * uStack_3428._4_4_ * fStack_3544;
      local_580 = local_3520;
      local_588 = ::_ps_cephes_log_q1;
      local_2d0 = local_3520;
      uStack_2c8 = uStack_3518;
      local_2e0[0] = -0.00021219444;
      local_2e0[1] = -0.00021219444;
      afStack_2d8[0] = -0.00021219444;
      afStack_2d8[1] = -0.00021219444;
      local_2f0 = local_3560;
      uStack_2e8 = uStack_3558;
      auVar136._8_4_ = -0.00021219444;
      auVar136._12_4_ = -0.00021219444;
      auVar136._0_4_ = -0.00021219444;
      auVar136._4_4_ = -0.00021219444;
      auVar165 = vfmadd213ps_fma(auVar136,_local_3520,_local_3560);
      local_478 = &local_3550;
      local_480 = ::_ps_0p5;
      local_150 = CONCAT44(fStack_354c,local_3550);
      uStack_148 = CONCAT44(fStack_3544,fStack_3548);
      auVar150._4_4_ = fStack_354c;
      auVar150._0_4_ = local_3550;
      auVar150._8_4_ = fStack_3548;
      auVar150._12_4_ = fStack_3544;
      local_160[0] = 0.5;
      local_160[1] = 0.5;
      afStack_158[0] = 0.5;
      afStack_158[1] = 0.5;
      local_3560 = auVar165._0_8_;
      local_170 = local_3560;
      uStack_3558 = auVar165._8_8_;
      uStack_168 = uStack_3558;
      auVar162._8_4_ = 0x80000000;
      auVar162._0_8_ = 0x8000000080000000;
      auVar162._12_4_ = 0x80000000;
      auVar143._8_4_ = 0.5;
      auVar143._12_4_ = 0.5;
      auVar143._0_4_ = 0.5;
      auVar143._4_4_ = 0.5;
      _local_3560 = vfmadd213ps_fma(auVar143,auVar150 ^ auVar162,auVar165);
      local_3450 = local_34e0;
      uStack_3448 = uStack_34d8;
      local_3460._0_4_ = local_3560._0_4_;
      local_3460._4_4_ = local_3560._4_4_;
      uStack_3458._0_4_ = local_3560._8_4_;
      uStack_3458._4_4_ = local_3560._12_4_;
      local_34e0._4_4_ = (float)local_34e0._4_4_ + local_3460._4_4_;
      local_34e0._0_4_ = (float)local_34e0._0_4_ + (float)local_3460;
      uStack_34d8._0_4_ = (float)uStack_3428 + (float)uStack_3458;
      uStack_34d8._4_4_ = uStack_3428._4_4_ + uStack_3458._4_4_;
      local_598 = local_3520;
      local_5a0 = ::_ps_cephes_log_q2;
      local_5a8 = local_34e0;
      local_2a0 = local_3520;
      uStack_298 = uStack_3518;
      local_2b0[0] = 0.6933594;
      local_2b0[1] = 0.6933594;
      afStack_2a8[0] = 0.6933594;
      afStack_2a8[1] = 0.6933594;
      local_2c0 = local_34e0;
      uStack_2b8 = uStack_34d8;
      auVar137._8_4_ = 0.6933594;
      auVar137._12_4_ = 0.6933594;
      auVar137._0_4_ = 0.6933594;
      auVar137._4_4_ = 0.6933594;
      auVar165 = vfmadd213ps_fma(auVar137,_local_3520,_local_34e0);
      local_34e0 = auVar165._0_8_;
      local_790 = local_34e0;
      uStack_34d8 = auVar165._8_8_;
      uStack_788 = uStack_34d8;
      local_7a0 = local_3510._0_8_;
      uStack_798 = local_3510._8_8_;
      _local_34e0 = vpor_avx(auVar165,local_3510);
      local_4f20 = auVar18._0_8_;
      local_35a0 = local_4f20;
      uStack_4f18 = auVar18._8_8_;
      uStack_3598 = uStack_4f18;
      auVar18 = vpand_avx(*(undefined1 (*) [16])*local_4bf8,auVar18);
      local_4f50 = auVar18._0_8_;
      uStack_4f48 = auVar18._8_8_;
      local_33f0._0_4_ = auVar18._0_4_;
      local_33f0._4_4_ = auVar18._4_4_;
      uStack_33e8._0_4_ = auVar18._8_4_;
      uStack_33e8._4_4_ = auVar18._12_4_;
      local_3400._0_4_ = local_34e0._0_4_;
      local_3400._4_4_ = local_34e0._4_4_;
      uStack_33f8._0_4_ = local_34e0._8_4_;
      uStack_33f8._4_4_ = local_34e0._12_4_;
      local_4f10 = CONCAT44(local_33f0._4_4_ + local_3400._4_4_,
                            (float)local_33f0 + (float)local_3400);
      uStack_4f08 = CONCAT44(uStack_33e8._4_4_ + uStack_33f8._4_4_,
                             (float)uStack_33e8 + (float)uStack_33f8);
      local_3218 = local_4bf8;
      local_3230 = local_4f10;
      uStack_3228 = uStack_4f08;
      *(undefined8 *)*local_4bf8 = local_4f10;
      *(undefined8 *)(*local_4bf8 + 8) = uStack_4f08;
      local_4bf8 = (undefined1 (*) [64])(*local_4bf8 + 0x10);
      local_3590 = local_35b0;
      uStack_3588 = uStack_35a8;
      local_3570 = local_35b0;
      uStack_3568 = uStack_35a8;
      local_3460 = local_3560;
      uStack_3458 = uStack_3558;
      local_3440 = local_3540._0_8_;
      uStack_3438 = local_3540._8_8_;
      local_3430 = uVar30;
      uStack_3428 = uVar31;
      local_3410 = uVar28;
      uStack_3408 = uVar29;
      local_3400 = local_34e0;
      uStack_33f8 = uStack_34d8;
      local_33f0 = local_4f50;
      uStack_33e8 = uStack_4f48;
      local_33d0 = 0x3f8000003f800000;
      uStack_33c8 = 0x3f8000003f800000;
      local_32e0 = uVar26;
      uStack_32d8 = uVar27;
      local_820 = auVar173._0_8_;
      local_7e0 = auVar173._0_8_;
      local_6d0 = local_6e0;
      uStack_6c8 = uStack_6d8;
      local_6b0 = uVar23;
      uStack_6a8 = uVar24;
      local_670 = uVar32;
      uStack_668 = uVar33;
      local_650 = local_660;
      uStack_648 = uStack_658;
      local_618 = local_638;
      local_610 = local_628;
      local_600 = local_638;
      local_5f8 = local_628;
      local_5e8 = local_638;
      local_5e0 = local_628;
      local_5d0 = local_638;
      local_5c8 = local_628;
      local_5b8 = local_638;
      local_5b0 = local_628;
      local_568 = local_590;
      local_558 = local_570;
      local_550 = local_590;
      local_540 = local_570;
      local_538 = local_590;
      local_528 = local_570;
      local_520 = local_590;
      local_510 = local_570;
      local_508 = local_590;
      local_4f8 = local_570;
      local_4f0 = local_590;
      local_4e0 = local_570;
      local_4d8 = local_590;
      local_4c8 = local_570;
      local_4c0 = local_590;
      local_4b8 = local_638;
      local_4a0 = local_638;
      local_490 = local_4a8;
      local_488 = local_590;
      local_c0 = local_3370;
      uStack_b8 = uStack_3368;
    }
    for (; local_4c50 < local_4be8; local_4c50 = local_4c50 + 1) {
      if (*(float *)*local_4bf8 <= 0.0) {
        fVar168 = expf(*(float *)*local_4bf8);
        fVar168 = logf(fVar168 + 1.0);
        *(float *)*local_4bf8 = fVar168;
      }
      else {
        fVar168 = *(float *)*local_4bf8;
        fVar169 = expf(-*(float *)*local_4bf8);
        fVar169 = logf(fVar169 + 1.0);
        *(float *)*local_4bf8 = fVar168 + fVar169;
      }
      local_4bf8 = (undefined1 (*) [64])(*local_4bf8 + 4);
    }
  }
  return 0;
}

Assistant:

int BNLL_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);
        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        __m512 _zero_avx512 = _mm512_setzero_ps();
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __mmask16 mask = _mm512_cmp_ps_mask(_p, _zero_avx512, _CMP_GT_OQ);
            __m512 _abs_p = _mm512_castsi512_ps(_mm512_and_epi32(_mm512_castps_si512(_p), _mm512_set1_epi32(0x7fffffff)));
            __m512 _tmp = log512_ps(_mm512_add_ps(_one_avx512, exp512_ps(_mm512_sub_ps(_zero_avx512, _abs_p))));
            _p = _mm512_mask_add_ps(_tmp, mask, _tmp, _p);
            _mm512_storeu_ps(ptr, _p);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _one_avx = _mm256_set1_ps(1.f);
        __m256 _zero_avx = _mm256_setzero_ps();
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 mask = _mm256_cmp_ps(_p, _mm256_setzero_ps(), _CMP_GT_OQ);
            __m256 _abs_p = _mm256_and_ps(_p, *(__m256*)_ps256_inv_sign_mask);
            __m256 _tmp = log256_ps(_mm256_add_ps(_one_avx, exp256_ps(_mm256_sub_ps(_zero_avx, _abs_p))));
            __m256 _x = _mm256_and_ps(_p, mask);
            _p = _mm256_add_ps(_x, _tmp);
            _mm256_storeu_ps(ptr, _p);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _one = _mm_set1_ps(1.f);
        __m128 _zero = _mm_setzero_ps();
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 mask = _mm_cmpgt_ps(_p, _zero);
            __m128 _abs_p = _mm_and_ps(_p, *(__m128*)_ps_inv_sign_mask);
            __m128 _tmp = log_ps(_mm_add_ps(_one, exp_ps(_mm_sub_ps(_zero, _abs_p))));
            __m128 _x = _mm_and_ps(_p, mask);
            _p = _mm_add_ps(_x, _tmp);
            _mm_store_ps(ptr, _p);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr > 0)
                *ptr = *ptr + logf(1.f + expf(-(*ptr)));
            else
                *ptr = logf(1.f + expf(*ptr));
            ptr++;
        }
    }
    return 0;
}